

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

int opengv::absolute_pose::modules::gpnp5::init(EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_R8;
  double *in_R9;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar971 [16];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar974 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar978 [16];
  undefined1 auVar979 [16];
  undefined1 auVar980 [16];
  undefined1 auVar981 [16];
  undefined1 auVar982 [16];
  undefined1 auVar983 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar986 [16];
  undefined1 auVar987 [16];
  undefined1 auVar988 [16];
  undefined1 auVar989 [16];
  undefined1 auVar990 [16];
  undefined1 auVar991 [16];
  undefined1 auVar992 [16];
  undefined1 auVar993 [16];
  undefined1 auVar994 [16];
  undefined1 auVar995 [16];
  undefined1 auVar996 [16];
  undefined1 auVar997 [16];
  undefined1 auVar998 [16];
  undefined1 auVar999 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar1001 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1005 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar1016 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar1047 [16];
  undefined1 auVar1048 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1056 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1058 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1060 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1070 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar1075 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1099 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1103 [16];
  undefined1 auVar1104 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1110 [16];
  undefined1 auVar1111 [16];
  undefined1 auVar1112 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1114 [16];
  undefined1 auVar1115 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1117 [16];
  undefined1 auVar1118 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar1121 [16];
  undefined1 auVar1122 [16];
  undefined1 auVar1123 [16];
  undefined1 auVar1124 [16];
  undefined1 auVar1125 [16];
  undefined1 auVar1126 [16];
  undefined1 auVar1127 [16];
  undefined1 auVar1128 [16];
  undefined1 auVar1129 [16];
  undefined1 auVar1130 [16];
  undefined1 auVar1131 [16];
  undefined1 auVar1132 [16];
  undefined1 auVar1133 [16];
  undefined1 auVar1134 [16];
  undefined1 auVar1135 [16];
  undefined1 auVar1136 [16];
  undefined1 auVar1137 [16];
  undefined1 auVar1138 [16];
  undefined1 auVar1139 [16];
  undefined1 auVar1140 [16];
  undefined1 auVar1141 [16];
  undefined1 auVar1142 [16];
  undefined1 auVar1143 [16];
  undefined1 auVar1144 [16];
  undefined1 auVar1145 [16];
  undefined1 auVar1146 [16];
  undefined1 auVar1147 [16];
  undefined1 auVar1148 [16];
  undefined1 auVar1149 [16];
  undefined1 auVar1150 [16];
  undefined1 auVar1151 [16];
  undefined1 auVar1152 [16];
  undefined1 auVar1153 [16];
  undefined1 auVar1154 [16];
  undefined1 auVar1155 [16];
  undefined1 auVar1156 [16];
  undefined1 auVar1157 [16];
  undefined1 auVar1158 [16];
  undefined1 auVar1159 [16];
  undefined1 auVar1160 [16];
  undefined1 auVar1161 [16];
  undefined1 auVar1162 [16];
  undefined1 auVar1163 [16];
  undefined1 auVar1164 [16];
  undefined1 auVar1165 [16];
  undefined1 auVar1166 [16];
  undefined1 auVar1167 [16];
  undefined1 auVar1168 [16];
  undefined1 auVar1169 [16];
  undefined1 auVar1170 [16];
  undefined1 auVar1171 [16];
  undefined1 auVar1172 [16];
  undefined1 auVar1173 [16];
  undefined1 auVar1174 [16];
  undefined1 auVar1175 [16];
  undefined1 auVar1176 [16];
  undefined1 auVar1177 [16];
  undefined1 auVar1178 [16];
  undefined1 auVar1179 [16];
  undefined1 auVar1180 [16];
  undefined1 auVar1181 [16];
  undefined1 auVar1182 [16];
  undefined1 auVar1183 [16];
  undefined1 auVar1184 [16];
  undefined1 auVar1185 [16];
  undefined1 auVar1186 [16];
  undefined1 auVar1187 [16];
  undefined1 auVar1188 [16];
  undefined1 auVar1189 [16];
  undefined1 auVar1190 [16];
  undefined1 auVar1191 [16];
  undefined1 auVar1192 [16];
  undefined1 auVar1193 [16];
  undefined1 auVar1194 [16];
  undefined1 auVar1195 [16];
  undefined1 auVar1196 [16];
  undefined1 auVar1197 [16];
  undefined1 auVar1198 [16];
  undefined1 auVar1199 [16];
  undefined1 auVar1200 [16];
  undefined1 auVar1201 [16];
  undefined1 auVar1202 [16];
  undefined1 auVar1203 [16];
  undefined1 auVar1204 [16];
  undefined1 auVar1205 [16];
  undefined1 auVar1206 [16];
  undefined1 auVar1207 [16];
  undefined1 auVar1208 [16];
  undefined1 auVar1209 [16];
  undefined1 auVar1210 [16];
  undefined1 auVar1211 [16];
  undefined1 auVar1212 [16];
  undefined1 auVar1213 [16];
  undefined1 auVar1214 [16];
  undefined1 auVar1215 [16];
  undefined1 auVar1216 [16];
  undefined1 auVar1217 [16];
  undefined1 auVar1218 [16];
  undefined1 auVar1219 [16];
  undefined1 auVar1220 [16];
  undefined1 auVar1221 [16];
  undefined1 auVar1222 [16];
  undefined1 auVar1223 [16];
  undefined1 auVar1224 [16];
  undefined1 auVar1225 [16];
  undefined1 auVar1226 [16];
  undefined1 auVar1227 [16];
  undefined1 auVar1228 [16];
  undefined1 auVar1229 [16];
  undefined1 auVar1230 [16];
  undefined1 auVar1231 [16];
  undefined1 auVar1232 [16];
  undefined1 auVar1233 [16];
  undefined1 auVar1234 [16];
  undefined1 auVar1235 [16];
  undefined1 auVar1236 [16];
  undefined1 auVar1237 [16];
  undefined1 auVar1238 [16];
  undefined1 auVar1239 [16];
  undefined1 auVar1240 [16];
  undefined1 auVar1241 [16];
  undefined1 auVar1242 [16];
  undefined1 auVar1243 [16];
  undefined1 auVar1244 [16];
  undefined1 auVar1245 [16];
  undefined1 auVar1246 [16];
  undefined1 auVar1247 [16];
  undefined1 auVar1248 [16];
  undefined1 auVar1249 [16];
  undefined1 auVar1250 [16];
  undefined1 auVar1251 [16];
  undefined1 auVar1252 [16];
  undefined1 auVar1253 [16];
  undefined1 auVar1254 [16];
  undefined1 auVar1255 [16];
  undefined1 auVar1256 [16];
  undefined1 auVar1257 [16];
  undefined1 auVar1258 [16];
  undefined1 auVar1259 [16];
  undefined1 auVar1260 [16];
  undefined1 auVar1261 [16];
  undefined1 auVar1262 [16];
  undefined1 auVar1263 [16];
  undefined1 auVar1264 [16];
  undefined1 auVar1265 [16];
  undefined1 auVar1266 [16];
  undefined1 auVar1267 [16];
  undefined1 auVar1268 [16];
  undefined1 auVar1269 [16];
  undefined1 auVar1270 [16];
  undefined1 auVar1271 [16];
  undefined1 auVar1272 [16];
  undefined1 auVar1273 [16];
  undefined1 auVar1274 [16];
  undefined1 auVar1275 [16];
  undefined1 auVar1276 [16];
  undefined1 auVar1277 [16];
  undefined1 auVar1278 [16];
  undefined1 auVar1279 [16];
  undefined1 auVar1280 [16];
  undefined1 auVar1281 [16];
  undefined1 auVar1282 [16];
  undefined1 auVar1283 [16];
  undefined1 auVar1284 [16];
  undefined1 auVar1285 [16];
  undefined1 auVar1286 [16];
  undefined1 auVar1287 [16];
  undefined1 auVar1288 [16];
  undefined1 auVar1289 [16];
  undefined1 auVar1290 [16];
  undefined1 auVar1291 [16];
  undefined1 auVar1292 [16];
  undefined1 auVar1293 [16];
  undefined1 auVar1294 [16];
  undefined1 auVar1295 [16];
  undefined1 auVar1296 [16];
  undefined1 auVar1297 [16];
  undefined1 auVar1298 [16];
  undefined1 auVar1299 [16];
  undefined1 auVar1300 [16];
  undefined1 auVar1301 [16];
  undefined1 auVar1302 [16];
  undefined1 auVar1303 [16];
  undefined1 auVar1304 [16];
  undefined1 auVar1305 [16];
  undefined1 auVar1306 [16];
  undefined1 auVar1307 [16];
  undefined1 auVar1308 [16];
  undefined1 auVar1309 [16];
  undefined1 auVar1310 [16];
  undefined1 auVar1311 [16];
  undefined1 auVar1312 [16];
  undefined1 auVar1313 [16];
  undefined1 auVar1314 [16];
  undefined1 auVar1315 [16];
  undefined1 auVar1316 [16];
  undefined1 auVar1317 [16];
  undefined1 auVar1318 [16];
  undefined1 auVar1319 [16];
  undefined1 auVar1320 [16];
  undefined1 auVar1321 [16];
  undefined1 auVar1322 [16];
  undefined1 auVar1323 [16];
  undefined1 auVar1324 [16];
  undefined1 auVar1325 [16];
  undefined1 auVar1326 [16];
  undefined1 auVar1327 [16];
  undefined1 auVar1328 [16];
  undefined1 auVar1329 [16];
  undefined1 auVar1330 [16];
  undefined1 auVar1331 [16];
  undefined1 auVar1332 [16];
  undefined1 auVar1333 [16];
  undefined1 auVar1334 [16];
  undefined1 auVar1335 [16];
  undefined1 auVar1336 [16];
  undefined1 auVar1337 [16];
  undefined1 auVar1338 [16];
  undefined1 auVar1339 [16];
  undefined1 auVar1340 [16];
  undefined1 auVar1341 [16];
  undefined1 auVar1342 [16];
  undefined1 auVar1343 [16];
  undefined1 auVar1344 [16];
  undefined1 auVar1345 [16];
  undefined1 auVar1346 [16];
  undefined1 auVar1347 [16];
  undefined1 auVar1348 [16];
  undefined1 auVar1349 [16];
  undefined1 auVar1350 [16];
  undefined1 auVar1351 [16];
  undefined1 auVar1352 [16];
  undefined1 auVar1353 [16];
  undefined1 auVar1354 [16];
  undefined1 auVar1355 [16];
  undefined1 auVar1356 [16];
  undefined1 auVar1357 [16];
  undefined1 auVar1358 [16];
  undefined1 auVar1359 [16];
  undefined1 auVar1360 [16];
  undefined1 auVar1361 [16];
  undefined1 auVar1362 [16];
  undefined1 auVar1363 [16];
  undefined1 auVar1364 [16];
  undefined1 auVar1365 [16];
  undefined1 auVar1366 [16];
  undefined1 auVar1367 [16];
  undefined1 auVar1368 [16];
  undefined1 auVar1369 [16];
  undefined1 auVar1370 [16];
  undefined1 auVar1371 [16];
  undefined1 auVar1372 [16];
  undefined1 auVar1373 [16];
  undefined1 auVar1374 [16];
  undefined1 auVar1375 [16];
  undefined1 auVar1376 [16];
  undefined1 auVar1377 [16];
  undefined1 auVar1378 [16];
  undefined1 auVar1379 [16];
  undefined1 auVar1380 [16];
  undefined1 auVar1381 [16];
  undefined1 auVar1382 [16];
  undefined1 auVar1383 [16];
  undefined1 auVar1384 [16];
  undefined1 auVar1385 [16];
  undefined1 auVar1386 [16];
  undefined1 auVar1387 [16];
  undefined1 auVar1388 [16];
  undefined1 auVar1389 [16];
  undefined1 auVar1390 [16];
  undefined1 auVar1391 [16];
  undefined1 auVar1392 [16];
  undefined1 auVar1393 [16];
  undefined1 auVar1394 [16];
  undefined1 auVar1395 [16];
  undefined1 auVar1396 [16];
  undefined1 auVar1397 [16];
  undefined1 auVar1398 [16];
  undefined1 auVar1399 [16];
  undefined1 auVar1400 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1403 [16];
  undefined1 auVar1404 [16];
  undefined1 auVar1405 [16];
  undefined1 auVar1406 [16];
  undefined1 auVar1407 [16];
  undefined1 auVar1408 [16];
  undefined1 auVar1409 [16];
  undefined1 auVar1410 [16];
  undefined1 auVar1411 [16];
  undefined1 auVar1412 [16];
  undefined1 auVar1413 [16];
  undefined1 auVar1414 [16];
  undefined1 auVar1415 [16];
  undefined1 auVar1416 [16];
  undefined1 auVar1417 [16];
  undefined1 auVar1418 [16];
  undefined1 auVar1419 [16];
  undefined1 auVar1420 [16];
  undefined1 auVar1421 [16];
  undefined1 auVar1422 [16];
  undefined1 auVar1423 [16];
  undefined1 auVar1424 [16];
  undefined1 auVar1425 [16];
  undefined1 auVar1426 [16];
  undefined1 auVar1427 [16];
  undefined1 auVar1428 [16];
  undefined1 auVar1429 [16];
  undefined1 auVar1430 [16];
  undefined1 auVar1431 [16];
  undefined1 auVar1432 [16];
  undefined1 auVar1433 [16];
  undefined1 auVar1434 [16];
  undefined1 auVar1435 [16];
  undefined1 auVar1436 [16];
  undefined1 auVar1437 [16];
  undefined1 auVar1438 [16];
  undefined1 auVar1439 [16];
  undefined1 auVar1440 [16];
  undefined1 auVar1441 [16];
  undefined1 auVar1442 [16];
  undefined1 auVar1443 [16];
  undefined1 auVar1444 [16];
  undefined1 auVar1445 [16];
  undefined1 auVar1446 [16];
  undefined1 auVar1447 [16];
  undefined1 auVar1448 [16];
  undefined1 auVar1449 [16];
  undefined1 auVar1450 [16];
  undefined1 auVar1451 [16];
  undefined1 auVar1452 [16];
  undefined1 auVar1453 [16];
  undefined1 auVar1454 [16];
  undefined1 auVar1455 [16];
  undefined1 auVar1456 [16];
  undefined1 auVar1457 [16];
  undefined1 auVar1458 [16];
  undefined1 auVar1459 [16];
  undefined1 auVar1460 [16];
  undefined1 auVar1461 [16];
  undefined1 auVar1462 [16];
  undefined1 auVar1463 [16];
  undefined1 auVar1464 [16];
  undefined1 auVar1465 [16];
  undefined1 auVar1466 [16];
  undefined1 auVar1467 [16];
  undefined1 auVar1468 [16];
  undefined1 auVar1469 [16];
  undefined1 auVar1470 [16];
  undefined1 auVar1471 [16];
  undefined1 auVar1472 [16];
  undefined1 auVar1473 [16];
  undefined1 auVar1474 [16];
  undefined1 auVar1475 [16];
  undefined1 auVar1476 [16];
  undefined1 auVar1477 [16];
  undefined1 auVar1478 [16];
  undefined1 auVar1479 [16];
  undefined1 auVar1480 [16];
  undefined1 auVar1481 [16];
  undefined1 auVar1482 [16];
  undefined1 auVar1483 [16];
  undefined1 auVar1484 [16];
  undefined1 auVar1485 [16];
  undefined1 auVar1486 [16];
  undefined1 auVar1487 [16];
  undefined1 auVar1488 [16];
  undefined1 auVar1489 [16];
  undefined1 auVar1490 [16];
  undefined1 auVar1491 [16];
  undefined1 auVar1492 [16];
  undefined1 auVar1493 [16];
  undefined1 auVar1494 [16];
  undefined1 auVar1495 [16];
  undefined1 auVar1496 [16];
  undefined1 auVar1497 [16];
  undefined1 auVar1498 [16];
  undefined1 auVar1499 [16];
  undefined1 auVar1500 [16];
  undefined1 auVar1501 [16];
  undefined1 auVar1502 [16];
  undefined1 auVar1503 [16];
  undefined1 auVar1504 [16];
  undefined1 auVar1505 [16];
  undefined1 auVar1506 [16];
  undefined1 auVar1507 [16];
  undefined1 auVar1508 [16];
  undefined1 auVar1509 [16];
  undefined1 auVar1510 [16];
  undefined1 auVar1511 [16];
  undefined1 auVar1512 [16];
  undefined1 auVar1513 [16];
  undefined1 auVar1514 [16];
  undefined1 auVar1515 [16];
  undefined1 auVar1516 [16];
  undefined1 auVar1517 [16];
  undefined1 auVar1518 [16];
  undefined1 auVar1519 [16];
  undefined1 auVar1520 [16];
  undefined1 auVar1521 [16];
  undefined1 auVar1522 [16];
  undefined1 auVar1523 [16];
  undefined1 auVar1524 [16];
  undefined1 auVar1525 [16];
  undefined1 auVar1526 [16];
  undefined1 auVar1527 [16];
  undefined1 auVar1528 [16];
  undefined1 auVar1529 [16];
  undefined1 auVar1530 [16];
  undefined1 auVar1531 [16];
  undefined1 auVar1532 [16];
  undefined1 auVar1533 [16];
  undefined1 auVar1534 [16];
  undefined1 auVar1535 [16];
  undefined1 auVar1536 [16];
  undefined1 auVar1537 [16];
  undefined1 auVar1538 [16];
  undefined1 auVar1539 [16];
  undefined1 auVar1540 [16];
  undefined1 auVar1541 [16];
  undefined1 auVar1542 [16];
  undefined1 auVar1543 [16];
  undefined1 auVar1544 [16];
  undefined1 auVar1545 [16];
  undefined1 auVar1546 [16];
  undefined1 auVar1547 [16];
  undefined1 auVar1548 [16];
  undefined1 auVar1549 [16];
  undefined1 auVar1550 [16];
  undefined1 auVar1551 [16];
  undefined1 auVar1552 [16];
  undefined1 auVar1553 [16];
  undefined1 auVar1554 [16];
  undefined1 auVar1555 [16];
  undefined1 auVar1556 [16];
  undefined1 auVar1557 [16];
  undefined1 auVar1558 [16];
  undefined1 auVar1559 [16];
  undefined1 auVar1560 [16];
  undefined1 auVar1561 [16];
  undefined1 auVar1562 [16];
  undefined1 auVar1563 [16];
  undefined1 auVar1564 [16];
  undefined1 auVar1565 [16];
  undefined1 auVar1566 [16];
  undefined1 auVar1567 [16];
  undefined1 auVar1568 [16];
  undefined1 auVar1569 [16];
  undefined1 auVar1570 [16];
  undefined1 auVar1571 [16];
  undefined1 auVar1572 [16];
  undefined1 auVar1573 [16];
  undefined1 auVar1574 [16];
  undefined1 auVar1575 [16];
  undefined1 auVar1576 [16];
  undefined1 auVar1577 [16];
  undefined1 auVar1578 [16];
  undefined1 auVar1579 [16];
  undefined1 auVar1580 [16];
  undefined1 auVar1581 [16];
  undefined1 auVar1582 [16];
  undefined1 auVar1583 [16];
  undefined1 auVar1584 [16];
  undefined1 auVar1585 [16];
  undefined1 auVar1586 [16];
  undefined1 auVar1587 [16];
  undefined1 auVar1588 [16];
  undefined1 auVar1589 [16];
  undefined1 auVar1590 [16];
  undefined1 auVar1591 [16];
  undefined1 auVar1592 [16];
  undefined1 auVar1593 [16];
  undefined1 auVar1594 [16];
  undefined1 auVar1595 [16];
  undefined1 auVar1596 [16];
  undefined1 auVar1597 [16];
  undefined1 auVar1598 [16];
  undefined1 auVar1599 [16];
  undefined1 auVar1600 [16];
  undefined1 auVar1601 [16];
  undefined1 auVar1602 [16];
  undefined1 auVar1603 [16];
  undefined1 auVar1604 [16];
  undefined1 auVar1605 [16];
  undefined1 auVar1606 [16];
  undefined1 auVar1607 [16];
  undefined1 auVar1608 [16];
  undefined1 auVar1609 [16];
  undefined1 auVar1610 [16];
  undefined1 auVar1611 [16];
  undefined1 auVar1612 [16];
  undefined1 auVar1613 [16];
  undefined1 auVar1614 [16];
  undefined1 auVar1615 [16];
  undefined1 auVar1616 [16];
  undefined1 auVar1617 [16];
  undefined1 auVar1618 [16];
  undefined1 auVar1619 [16];
  undefined1 auVar1620 [16];
  undefined1 auVar1621 [16];
  undefined1 auVar1622 [16];
  undefined1 auVar1623 [16];
  undefined1 auVar1624 [16];
  undefined1 auVar1625 [16];
  undefined1 auVar1626 [16];
  undefined1 auVar1627 [16];
  undefined1 auVar1628 [16];
  undefined1 auVar1629 [16];
  undefined1 auVar1630 [16];
  undefined1 auVar1631 [16];
  undefined1 auVar1632 [16];
  undefined1 auVar1633 [16];
  undefined1 auVar1634 [16];
  undefined1 auVar1635 [16];
  undefined1 auVar1636 [16];
  undefined1 auVar1637 [16];
  undefined1 auVar1638 [16];
  undefined1 auVar1639 [16];
  undefined1 auVar1640 [16];
  undefined1 auVar1641 [16];
  undefined1 auVar1642 [16];
  undefined1 auVar1643 [16];
  undefined1 auVar1644 [16];
  undefined1 auVar1645 [16];
  undefined1 auVar1646 [16];
  undefined1 auVar1647 [16];
  undefined1 auVar1648 [16];
  undefined1 auVar1649 [16];
  undefined1 auVar1650 [16];
  undefined1 auVar1651 [16];
  undefined1 auVar1652 [16];
  undefined1 auVar1653 [16];
  undefined1 auVar1654 [16];
  undefined1 auVar1655 [16];
  undefined1 auVar1656 [16];
  undefined1 auVar1657 [16];
  undefined1 auVar1658 [16];
  undefined1 auVar1659 [16];
  undefined1 auVar1660 [16];
  undefined1 auVar1661 [16];
  undefined1 auVar1662 [16];
  undefined1 auVar1663 [16];
  undefined1 auVar1664 [16];
  undefined1 auVar1665 [16];
  undefined1 auVar1666 [16];
  undefined1 auVar1667 [16];
  undefined1 auVar1668 [16];
  undefined1 auVar1669 [16];
  undefined1 auVar1670 [16];
  undefined1 auVar1671 [16];
  undefined1 auVar1672 [16];
  undefined1 auVar1673 [16];
  undefined1 auVar1674 [16];
  undefined1 auVar1675 [16];
  undefined1 auVar1676 [16];
  undefined1 auVar1677 [16];
  undefined1 auVar1678 [16];
  undefined1 auVar1679 [16];
  undefined1 auVar1680 [16];
  undefined1 auVar1681 [16];
  undefined1 auVar1682 [16];
  undefined1 auVar1683 [16];
  undefined1 auVar1684 [16];
  undefined1 auVar1685 [16];
  undefined1 auVar1686 [16];
  undefined1 auVar1687 [16];
  undefined1 auVar1688 [16];
  undefined1 auVar1689 [16];
  undefined1 auVar1690 [16];
  undefined1 auVar1691 [16];
  undefined1 auVar1692 [16];
  undefined1 auVar1693 [16];
  undefined1 auVar1694 [16];
  undefined1 auVar1695 [16];
  undefined1 auVar1696 [16];
  undefined1 auVar1697 [16];
  undefined1 auVar1698 [16];
  undefined1 auVar1699 [16];
  undefined1 auVar1700 [16];
  undefined1 auVar1701 [16];
  undefined1 auVar1702 [16];
  undefined1 auVar1703 [16];
  undefined1 auVar1704 [16];
  undefined1 auVar1705 [16];
  undefined1 auVar1706 [16];
  undefined1 auVar1707 [16];
  undefined1 auVar1708 [16];
  undefined1 auVar1709 [16];
  undefined1 auVar1710 [16];
  undefined1 auVar1711 [16];
  undefined1 auVar1712 [16];
  undefined1 auVar1713 [16];
  undefined1 auVar1714 [16];
  undefined1 auVar1715 [16];
  undefined1 auVar1716 [16];
  undefined1 auVar1717 [16];
  undefined1 auVar1718 [16];
  undefined1 auVar1719 [16];
  undefined1 auVar1720 [16];
  undefined1 auVar1721 [16];
  undefined1 auVar1722 [16];
  undefined1 auVar1723 [16];
  undefined1 auVar1724 [16];
  undefined1 auVar1725 [16];
  undefined1 auVar1726 [16];
  undefined1 auVar1727 [16];
  undefined1 auVar1728 [16];
  undefined1 auVar1729 [16];
  undefined1 auVar1730 [16];
  undefined1 auVar1731 [16];
  undefined1 auVar1732 [16];
  undefined1 auVar1733 [16];
  undefined1 auVar1734 [16];
  undefined1 auVar1735 [16];
  undefined1 auVar1736 [16];
  undefined1 auVar1737 [16];
  undefined1 auVar1738 [16];
  undefined1 auVar1739 [16];
  undefined1 auVar1740 [16];
  undefined1 auVar1741 [16];
  undefined1 auVar1742 [16];
  undefined1 auVar1743 [16];
  undefined1 auVar1744 [16];
  undefined1 auVar1745 [16];
  undefined1 auVar1746 [16];
  undefined1 auVar1747 [16];
  undefined1 auVar1748 [16];
  undefined1 auVar1749 [16];
  undefined1 auVar1750 [16];
  undefined1 auVar1751 [16];
  undefined1 auVar1752 [16];
  undefined1 auVar1753 [16];
  undefined1 auVar1754 [16];
  undefined1 auVar1755 [16];
  undefined1 auVar1756 [16];
  undefined1 auVar1757 [16];
  undefined1 auVar1758 [16];
  undefined1 auVar1759 [16];
  undefined1 auVar1760 [16];
  undefined1 auVar1761 [16];
  undefined1 auVar1762 [16];
  undefined1 auVar1763 [16];
  undefined1 auVar1764 [16];
  undefined1 auVar1765 [16];
  undefined1 auVar1766 [16];
  undefined1 auVar1767 [16];
  undefined1 auVar1768 [16];
  undefined1 auVar1769 [16];
  undefined1 auVar1770 [16];
  undefined1 auVar1771 [16];
  undefined1 auVar1772 [16];
  undefined1 auVar1773 [16];
  undefined1 auVar1774 [16];
  undefined1 auVar1775 [16];
  undefined1 auVar1776 [16];
  undefined1 auVar1777 [16];
  undefined1 auVar1778 [16];
  undefined1 auVar1779 [16];
  undefined1 auVar1780 [16];
  undefined1 auVar1781 [16];
  undefined1 auVar1782 [16];
  undefined1 auVar1783 [16];
  undefined1 auVar1784 [16];
  undefined1 auVar1785 [16];
  undefined1 auVar1786 [16];
  undefined1 auVar1787 [16];
  undefined1 auVar1788 [16];
  undefined1 auVar1789 [16];
  undefined1 auVar1790 [16];
  undefined1 auVar1791 [16];
  undefined1 auVar1792 [16];
  undefined1 auVar1793 [16];
  undefined1 auVar1794 [16];
  undefined1 auVar1795 [16];
  undefined1 auVar1796 [16];
  undefined1 auVar1797 [16];
  undefined1 auVar1798 [16];
  undefined1 auVar1799 [16];
  undefined1 auVar1800 [16];
  undefined1 auVar1801 [16];
  undefined1 auVar1802 [16];
  undefined1 auVar1803 [16];
  undefined1 auVar1804 [16];
  undefined1 auVar1805 [16];
  undefined1 auVar1806 [16];
  undefined1 auVar1807 [16];
  undefined1 auVar1808 [16];
  undefined1 auVar1809 [16];
  undefined1 auVar1810 [16];
  undefined1 auVar1811 [16];
  undefined1 auVar1812 [16];
  undefined1 auVar1813 [16];
  undefined1 auVar1814 [16];
  undefined1 auVar1815 [16];
  undefined1 auVar1816 [16];
  undefined1 auVar1817 [16];
  undefined1 auVar1818 [16];
  undefined1 auVar1819 [16];
  undefined1 auVar1820 [16];
  undefined1 auVar1821 [16];
  undefined1 auVar1822 [16];
  undefined1 auVar1823 [16];
  undefined1 auVar1824 [16];
  undefined1 auVar1825 [16];
  undefined1 auVar1826 [16];
  undefined1 auVar1827 [16];
  undefined1 auVar1828 [16];
  undefined1 auVar1829 [16];
  undefined1 auVar1830 [16];
  undefined1 auVar1831 [16];
  undefined1 auVar1832 [16];
  undefined1 auVar1833 [16];
  undefined1 auVar1834 [16];
  undefined1 auVar1835 [16];
  undefined1 auVar1836 [16];
  undefined1 auVar1837 [16];
  undefined1 auVar1838 [16];
  undefined1 auVar1839 [16];
  undefined1 auVar1840 [16];
  undefined1 auVar1841 [16];
  undefined1 auVar1842 [16];
  undefined1 auVar1843 [16];
  undefined1 auVar1844 [16];
  undefined1 auVar1845 [16];
  undefined1 auVar1846 [16];
  undefined1 auVar1847 [16];
  undefined1 auVar1848 [16];
  undefined1 auVar1849 [16];
  undefined1 auVar1850 [16];
  undefined1 auVar1851 [16];
  undefined1 auVar1852 [16];
  undefined1 auVar1853 [16];
  undefined1 auVar1854 [16];
  undefined1 auVar1855 [16];
  undefined1 auVar1856 [16];
  undefined1 auVar1857 [16];
  undefined1 auVar1858 [16];
  undefined1 auVar1859 [16];
  undefined1 auVar1860 [16];
  undefined1 auVar1861 [16];
  undefined1 auVar1862 [16];
  undefined1 auVar1863 [16];
  undefined1 auVar1864 [16];
  undefined1 auVar1865 [16];
  undefined1 auVar1866 [16];
  undefined1 auVar1867 [16];
  undefined1 auVar1868 [16];
  undefined1 auVar1869 [16];
  undefined1 auVar1870 [16];
  undefined1 auVar1871 [16];
  undefined1 auVar1872 [16];
  undefined1 auVar1873 [16];
  undefined1 auVar1874 [16];
  undefined1 auVar1875 [16];
  undefined1 auVar1876 [16];
  undefined1 auVar1877 [16];
  undefined1 auVar1878 [16];
  undefined1 auVar1879 [16];
  undefined1 auVar1880 [16];
  undefined1 auVar1881 [16];
  undefined1 auVar1882 [16];
  undefined1 auVar1883 [16];
  undefined1 auVar1884 [16];
  undefined1 auVar1885 [16];
  undefined1 auVar1886 [16];
  undefined1 auVar1887 [16];
  undefined1 auVar1888 [16];
  undefined1 auVar1889 [16];
  undefined1 auVar1890 [16];
  undefined1 auVar1891 [16];
  undefined1 auVar1892 [16];
  undefined1 auVar1893 [16];
  undefined1 auVar1894 [16];
  undefined1 auVar1895 [16];
  undefined1 auVar1896 [16];
  undefined1 auVar1897 [16];
  undefined1 auVar1898 [16];
  undefined1 auVar1899 [16];
  undefined1 auVar1900 [16];
  undefined1 auVar1901 [16];
  undefined1 auVar1902 [16];
  undefined1 auVar1903 [16];
  undefined1 auVar1904 [16];
  undefined1 auVar1905 [16];
  undefined1 auVar1906 [16];
  undefined1 auVar1907 [16];
  undefined1 auVar1908 [16];
  undefined1 auVar1909 [16];
  undefined1 auVar1910 [16];
  undefined1 auVar1911 [16];
  undefined1 auVar1912 [16];
  undefined1 auVar1913 [16];
  undefined1 auVar1914 [16];
  undefined1 auVar1915 [16];
  undefined1 auVar1916 [16];
  undefined1 auVar1917 [16];
  undefined1 auVar1918 [16];
  undefined1 auVar1919 [16];
  undefined1 auVar1920 [16];
  undefined1 auVar1921 [16];
  undefined1 auVar1922 [16];
  undefined1 auVar1923 [16];
  undefined1 auVar1924 [16];
  undefined1 auVar1925 [16];
  undefined1 auVar1926 [16];
  undefined1 auVar1927 [16];
  undefined1 auVar1928 [16];
  undefined1 auVar1929 [16];
  undefined1 auVar1930 [16];
  undefined1 auVar1931 [16];
  undefined1 auVar1932 [16];
  undefined1 auVar1933 [16];
  undefined1 auVar1934 [16];
  undefined1 auVar1935 [16];
  undefined1 auVar1936 [16];
  undefined1 auVar1937 [16];
  undefined1 auVar1938 [16];
  undefined1 auVar1939 [16];
  undefined1 auVar1940 [16];
  undefined1 auVar1941 [16];
  undefined1 auVar1942 [16];
  undefined1 auVar1943 [16];
  undefined1 auVar1944 [16];
  undefined1 auVar1945 [16];
  undefined1 auVar1946 [16];
  undefined1 auVar1947 [16];
  undefined1 auVar1948 [16];
  undefined1 auVar1949 [16];
  undefined1 auVar1950 [16];
  undefined1 auVar1951 [16];
  undefined1 auVar1952 [16];
  undefined1 auVar1953 [16];
  undefined1 auVar1954 [16];
  undefined1 auVar1955 [16];
  undefined1 auVar1956 [16];
  undefined1 auVar1957 [16];
  undefined1 auVar1958 [16];
  undefined1 auVar1959 [16];
  undefined1 auVar1960 [16];
  undefined1 auVar1961 [16];
  undefined1 auVar1962 [16];
  undefined1 auVar1963 [16];
  undefined1 auVar1964 [16];
  undefined1 auVar1965 [16];
  undefined1 auVar1966 [16];
  undefined1 auVar1967 [16];
  undefined1 auVar1968 [16];
  undefined1 auVar1969 [16];
  undefined1 auVar1970 [16];
  undefined1 auVar1971 [16];
  undefined1 auVar1972 [16];
  undefined1 auVar1973 [16];
  undefined1 auVar1974 [16];
  undefined1 auVar1975 [16];
  undefined1 auVar1976 [16];
  undefined1 auVar1977 [16];
  undefined1 auVar1978 [16];
  undefined1 auVar1979 [16];
  undefined1 auVar1980 [16];
  undefined1 auVar1981 [16];
  undefined1 auVar1982 [16];
  undefined1 auVar1983 [16];
  undefined1 auVar1984 [16];
  undefined1 auVar1985 [16];
  undefined1 auVar1986 [16];
  undefined1 auVar1987 [16];
  undefined1 auVar1988 [16];
  undefined1 auVar1989 [16];
  undefined1 auVar1990 [16];
  undefined1 auVar1991 [16];
  undefined1 auVar1992 [16];
  undefined1 auVar1993 [16];
  undefined1 auVar1994 [16];
  undefined1 auVar1995 [16];
  undefined1 auVar1996 [16];
  undefined1 auVar1997 [16];
  undefined1 auVar1998 [16];
  undefined1 auVar1999 [16];
  undefined1 auVar2000 [16];
  undefined1 auVar2001 [16];
  undefined1 auVar2002 [16];
  undefined1 auVar2003 [16];
  undefined1 auVar2004 [16];
  undefined1 auVar2005 [16];
  undefined1 auVar2006 [16];
  undefined1 auVar2007 [16];
  undefined1 auVar2008 [16];
  undefined1 auVar2009 [16];
  undefined1 auVar2010 [16];
  undefined1 auVar2011 [16];
  undefined1 auVar2012 [16];
  undefined1 auVar2013 [16];
  undefined1 auVar2014 [16];
  undefined1 auVar2015 [16];
  undefined1 auVar2016 [16];
  undefined1 auVar2017 [16];
  undefined1 auVar2018 [16];
  undefined1 auVar2019 [16];
  undefined1 auVar2020 [16];
  undefined1 auVar2021 [16];
  undefined1 auVar2022 [16];
  undefined1 auVar2023 [16];
  undefined1 auVar2024 [16];
  undefined1 auVar2025 [16];
  undefined1 auVar2026 [16];
  undefined1 auVar2027 [16];
  undefined1 auVar2028 [16];
  undefined1 auVar2029 [16];
  undefined1 auVar2030 [16];
  undefined1 auVar2031 [16];
  undefined1 auVar2032 [16];
  undefined1 auVar2033 [16];
  undefined1 auVar2034 [16];
  undefined1 auVar2035 [16];
  undefined1 auVar2036 [16];
  undefined1 auVar2037 [16];
  undefined1 auVar2038 [16];
  undefined1 auVar2039 [16];
  undefined1 auVar2040 [16];
  undefined1 auVar2041 [16];
  undefined1 auVar2042 [16];
  undefined1 auVar2043 [16];
  undefined1 auVar2044 [16];
  undefined1 auVar2045 [16];
  undefined1 auVar2046 [16];
  undefined1 auVar2047 [16];
  undefined1 auVar2048 [16];
  undefined1 auVar2049 [16];
  undefined1 auVar2050 [16];
  undefined1 auVar2051 [16];
  undefined1 auVar2052 [16];
  undefined1 auVar2053 [16];
  undefined1 auVar2054 [16];
  undefined1 auVar2055 [16];
  undefined1 auVar2056 [16];
  undefined1 auVar2057 [16];
  undefined1 auVar2058 [16];
  undefined1 auVar2059 [16];
  undefined1 auVar2060 [16];
  undefined1 auVar2061 [16];
  undefined1 auVar2062 [16];
  undefined1 auVar2063 [16];
  undefined1 auVar2064 [16];
  undefined1 auVar2065 [16];
  undefined1 auVar2066 [16];
  undefined1 auVar2067 [16];
  undefined1 auVar2068 [16];
  undefined1 auVar2069 [16];
  undefined1 auVar2070 [16];
  undefined1 auVar2071 [16];
  undefined1 auVar2072 [16];
  undefined1 auVar2073 [16];
  undefined1 auVar2074 [16];
  undefined1 auVar2075 [16];
  undefined1 auVar2076 [16];
  undefined1 auVar2077 [16];
  undefined1 auVar2078 [16];
  undefined1 auVar2079 [16];
  undefined1 auVar2080 [16];
  undefined1 auVar2081 [16];
  undefined1 auVar2082 [16];
  undefined1 auVar2083 [16];
  undefined1 auVar2084 [16];
  double *in_stack_00000008;
  undefined1 (*in_stack_00000010) [16];
  undefined1 (*in_stack_00000018) [16];
  undefined1 (*in_stack_00000020) [16];
  undefined1 (*in_stack_00000028) [16];
  
  auVar9 = *in_stack_00000010;
  auVar8 = *in_stack_00000018;
  dVar1 = *(double *)in_stack_00000010[1];
  dVar2 = *(double *)in_stack_00000018[1];
  auVar11 = *in_stack_00000020;
  dVar3 = *(double *)in_stack_00000020[1];
  auVar13 = *in_stack_00000028;
  dVar4 = *(double *)in_stack_00000028[1];
  auVar12 = vsubpd_avx(auVar9,auVar8);
  auVar10 = vsubpd_avx(auVar9,auVar11);
  auVar14 = vsubpd_avx(auVar9,auVar13);
  auVar15 = vsubpd_avx(auVar8,auVar11);
  auVar16 = vsubpd_avx(auVar8,auVar13);
  dVar5 = *in_stack_00000008;
  auVar17 = vsubpd_avx(auVar11,auVar13);
  dVar6 = in_stack_00000008[1];
  dVar7 = in_stack_00000008[3];
  auVar1324._8_8_ = 0;
  auVar1324._0_8_ = dVar7;
  auVar380._8_8_ = 0;
  auVar380._0_8_ =
       (dVar1 - dVar2) * (dVar1 - dVar2) +
       auVar12._0_8_ * auVar12._0_8_ + auVar12._8_8_ * auVar12._8_8_;
  auVar9 = vsqrtsd_avx(auVar380,auVar380);
  auVar224._8_8_ = 0;
  auVar224._0_8_ =
       (dVar1 - dVar3) * (dVar1 - dVar3) +
       auVar10._0_8_ * auVar10._0_8_ + auVar10._8_8_ * auVar10._8_8_;
  auVar8 = vsqrtsd_avx(auVar224,auVar224);
  auVar129._8_8_ = 0;
  auVar129._0_8_ =
       (dVar1 - dVar4) * (dVar1 - dVar4) +
       auVar14._0_8_ * auVar14._0_8_ + auVar14._8_8_ * auVar14._8_8_;
  auVar11 = vsqrtsd_avx(auVar129,auVar129);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (dVar2 - dVar3) * (dVar2 - dVar3) +
       auVar15._0_8_ * auVar15._0_8_ + auVar15._8_8_ * auVar15._8_8_;
  auVar13 = vsqrtsd_avx(auVar60,auVar60);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (dVar2 - dVar4) * (dVar2 - dVar4) +
       auVar16._0_8_ * auVar16._0_8_ + auVar16._8_8_ * auVar16._8_8_;
  auVar12 = vsqrtsd_avx(auVar12,auVar12);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (dVar3 - dVar4) * (dVar3 - dVar4) +
       auVar17._0_8_ * auVar17._0_8_ + auVar17._8_8_ * auVar17._8_8_;
  auVar10 = vsqrtsd_avx(auVar10,auVar10);
  auVar1079._8_8_ = 0;
  auVar1079._0_8_ = dVar5 * -2.0;
  auVar1525._8_8_ = 0;
  auVar1525._0_8_ = dVar6 * dVar6;
  auVar14 = vfmadd231sd_fma(auVar1525,auVar1324,auVar1079);
  dVar1 = in_stack_00000008[4];
  auVar1080._8_8_ = 0;
  auVar1080._0_8_ = dVar1;
  dVar2 = in_stack_00000008[2];
  dVar3 = in_stack_00000008[5];
  auVar1827._8_8_ = 0;
  auVar1827._0_8_ = dVar3;
  auVar569._8_8_ = 0;
  auVar569._0_8_ =
       dVar7 * dVar7 + auVar14._0_8_ + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar5 * dVar5
  ;
  auVar839._8_8_ = 0;
  auVar839._0_8_ = dVar6 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar839,auVar1080,auVar569);
  auVar570._8_8_ = 0;
  auVar570._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar570,auVar1827,auVar14);
  *(long *)(ctx + 0x5120) = auVar14._0_8_;
  dVar1 = in_R9[1];
  auVar1671._8_8_ = 0;
  auVar1671._0_8_ = in_stack_00000008[4];
  auVar1526._8_8_ = 0;
  auVar1526._0_8_ = in_stack_00000008[1];
  dVar2 = *in_R9;
  auVar1325._8_8_ = 0;
  auVar1325._0_8_ = *in_stack_00000008;
  auVar840._8_8_ = 0;
  auVar840._0_8_ = dVar1 * -2.0 * in_stack_00000008[4];
  auVar1081._8_8_ = 0;
  auVar1081._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar840,auVar1526,auVar1081);
  dVar1 = in_R9[4];
  auVar1082._8_8_ = 0;
  auVar1082._0_8_ = dVar1;
  auVar1527._8_8_ = 0;
  auVar1527._0_8_ = in_stack_00000008[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1527,auVar1082,auVar14);
  dVar3 = in_R9[2];
  auVar841._8_8_ = 0;
  auVar841._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar841,auVar1671,auVar14);
  auVar1672._8_8_ = 0;
  auVar1672._0_8_ = in_stack_00000008[2];
  auVar1528._8_8_ = 0;
  auVar1528._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1528,auVar1672,auVar14);
  auVar842._8_8_ = 0;
  auVar842._0_8_ = in_stack_00000008[5];
  auVar1083._8_8_ = 0;
  auVar1083._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1083,auVar842,auVar14);
  dVar1 = in_R9[5];
  auVar1529._8_8_ = 0;
  auVar1529._0_8_ = dVar1;
  auVar1673._8_8_ = 0;
  auVar1673._0_8_ = in_stack_00000008[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1673,auVar1529,auVar14);
  auVar1084._8_8_ = 0;
  auVar1084._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1084,auVar842,auVar14);
  auVar843._8_8_ = 0;
  auVar843._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar843,auVar1325,auVar14);
  auVar1085._8_8_ = 0;
  auVar1085._0_8_ = in_stack_00000008[3];
  auVar571._8_8_ = 0;
  auVar571._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar571,auVar1085,auVar14);
  dVar1 = in_R9[3];
  auVar844._8_8_ = 0;
  auVar844._0_8_ = dVar1;
  auVar1326._8_8_ = 0;
  auVar1326._0_8_ = *in_stack_00000008 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1326,auVar844,auVar14);
  auVar572._8_8_ = 0;
  auVar572._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar572,auVar1085,auVar14);
  *(long *)(ctx + 0x5280) = auVar14._0_8_;
  dVar1 = *in_R9;
  dVar2 = in_R9[1];
  dVar3 = in_R9[3];
  auVar1327._8_8_ = 0;
  auVar1327._0_8_ = dVar3;
  auVar1086._8_8_ = 0;
  auVar1086._0_8_ = dVar1 * -2.0;
  auVar1530._8_8_ = 0;
  auVar1530._0_8_ = dVar2 * dVar2;
  auVar14 = vfmadd231sd_fma(auVar1530,auVar1327,auVar1086);
  dVar4 = in_R9[4];
  auVar1087._8_8_ = 0;
  auVar1087._0_8_ = dVar4;
  dVar5 = in_R9[2];
  dVar6 = in_R9[5];
  auVar1828._8_8_ = 0;
  auVar1828._0_8_ = dVar6;
  auVar573._8_8_ = 0;
  auVar573._0_8_ =
       dVar3 * dVar3 + auVar14._0_8_ + dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6 + dVar1 * dVar1
  ;
  auVar845._8_8_ = 0;
  auVar845._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar845,auVar1087,auVar573);
  auVar574._8_8_ = 0;
  auVar574._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar574,auVar1828,auVar14);
  *(long *)(ctx + 0x53e0) = auVar14._0_8_;
  dVar1 = in_R8[1];
  auVar1674._8_8_ = 0;
  auVar1674._0_8_ = in_stack_00000008[4];
  auVar1531._8_8_ = 0;
  auVar1531._0_8_ = in_stack_00000008[1];
  dVar2 = *in_R8;
  auVar1328._8_8_ = 0;
  auVar1328._0_8_ = *in_stack_00000008;
  auVar846._8_8_ = 0;
  auVar846._0_8_ = dVar1 * -2.0 * in_stack_00000008[4];
  auVar1088._8_8_ = 0;
  auVar1088._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar846,auVar1531,auVar1088);
  dVar1 = in_R8[4];
  auVar1089._8_8_ = 0;
  auVar1089._0_8_ = dVar1;
  auVar1532._8_8_ = 0;
  auVar1532._0_8_ = in_stack_00000008[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1532,auVar1089,auVar14);
  dVar3 = in_R8[2];
  auVar847._8_8_ = 0;
  auVar847._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar847,auVar1674,auVar14);
  auVar1675._8_8_ = 0;
  auVar1675._0_8_ = in_stack_00000008[2];
  auVar1533._8_8_ = 0;
  auVar1533._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1533,auVar1675,auVar14);
  auVar848._8_8_ = 0;
  auVar848._0_8_ = in_stack_00000008[5];
  auVar1090._8_8_ = 0;
  auVar1090._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1090,auVar848,auVar14);
  dVar1 = in_R8[5];
  auVar1534._8_8_ = 0;
  auVar1534._0_8_ = dVar1;
  auVar1676._8_8_ = 0;
  auVar1676._0_8_ = in_stack_00000008[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1676,auVar1534,auVar14);
  auVar1091._8_8_ = 0;
  auVar1091._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1091,auVar848,auVar14);
  auVar849._8_8_ = 0;
  auVar849._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar849,auVar1328,auVar14);
  auVar1092._8_8_ = 0;
  auVar1092._0_8_ = in_stack_00000008[3];
  auVar575._8_8_ = 0;
  auVar575._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar575,auVar1092,auVar14);
  dVar1 = in_R8[3];
  auVar850._8_8_ = 0;
  auVar850._0_8_ = dVar1;
  auVar1329._8_8_ = 0;
  auVar1329._0_8_ = *in_stack_00000008 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1329,auVar850,auVar14);
  auVar576._8_8_ = 0;
  auVar576._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar576,auVar1092,auVar14);
  *(long *)(ctx + 0x5540) = auVar14._0_8_;
  dVar1 = in_R8[1];
  auVar1677._8_8_ = 0;
  auVar1677._0_8_ = in_R9[4];
  auVar1535._8_8_ = 0;
  auVar1535._0_8_ = in_R9[1];
  dVar2 = *in_R8;
  auVar1330._8_8_ = 0;
  auVar1330._0_8_ = *in_R9;
  auVar851._8_8_ = 0;
  auVar851._0_8_ = dVar1 * -2.0 * in_R9[4];
  auVar1093._8_8_ = 0;
  auVar1093._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar851,auVar1535,auVar1093);
  dVar1 = in_R8[4];
  auVar1094._8_8_ = 0;
  auVar1094._0_8_ = dVar1;
  auVar1536._8_8_ = 0;
  auVar1536._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1536,auVar1094,auVar14);
  dVar3 = in_R8[2];
  auVar852._8_8_ = 0;
  auVar852._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar852,auVar1677,auVar14);
  auVar1678._8_8_ = 0;
  auVar1678._0_8_ = in_R9[2];
  auVar1537._8_8_ = 0;
  auVar1537._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1537,auVar1678,auVar14);
  auVar853._8_8_ = 0;
  auVar853._0_8_ = in_R9[5];
  auVar1095._8_8_ = 0;
  auVar1095._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1095,auVar853,auVar14);
  dVar1 = in_R8[5];
  auVar1538._8_8_ = 0;
  auVar1538._0_8_ = dVar1;
  auVar1679._8_8_ = 0;
  auVar1679._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1679,auVar1538,auVar14);
  auVar1096._8_8_ = 0;
  auVar1096._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1096,auVar853,auVar14);
  auVar854._8_8_ = 0;
  auVar854._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar854,auVar1330,auVar14);
  auVar1097._8_8_ = 0;
  auVar1097._0_8_ = in_R9[3];
  auVar577._8_8_ = 0;
  auVar577._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar577,auVar1097,auVar14);
  dVar1 = in_R8[3];
  auVar855._8_8_ = 0;
  auVar855._0_8_ = dVar1;
  auVar1331._8_8_ = 0;
  auVar1331._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1331,auVar855,auVar14);
  auVar578._8_8_ = 0;
  auVar578._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar578,auVar1097,auVar14);
  *(long *)(ctx + 0x56a0) = auVar14._0_8_;
  dVar1 = *in_R8;
  dVar2 = in_R8[1];
  dVar3 = in_R8[3];
  auVar1332._8_8_ = 0;
  auVar1332._0_8_ = dVar3;
  auVar1098._8_8_ = 0;
  auVar1098._0_8_ = dVar1 * -2.0;
  auVar1539._8_8_ = 0;
  auVar1539._0_8_ = dVar2 * dVar2;
  auVar14 = vfmadd231sd_fma(auVar1539,auVar1332,auVar1098);
  dVar4 = in_R8[4];
  auVar1099._8_8_ = 0;
  auVar1099._0_8_ = dVar4;
  dVar5 = in_R8[2];
  dVar6 = in_R8[5];
  auVar1829._8_8_ = 0;
  auVar1829._0_8_ = dVar6;
  auVar579._8_8_ = 0;
  auVar579._0_8_ =
       dVar3 * dVar3 + auVar14._0_8_ + dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6 + dVar1 * dVar1
  ;
  auVar856._8_8_ = 0;
  auVar856._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar856,auVar1099,auVar579);
  auVar580._8_8_ = 0;
  auVar580._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar580,auVar1829,auVar14);
  *(long *)(ctx + 0x5800) = auVar14._0_8_;
  dVar1 = in_RCX[1];
  auVar1680._8_8_ = 0;
  auVar1680._0_8_ = in_stack_00000008[4];
  auVar1540._8_8_ = 0;
  auVar1540._0_8_ = in_stack_00000008[1];
  dVar2 = *in_RCX;
  auVar1333._8_8_ = 0;
  auVar1333._0_8_ = *in_stack_00000008;
  auVar857._8_8_ = 0;
  auVar857._0_8_ = dVar1 * -2.0 * in_stack_00000008[4];
  auVar1100._8_8_ = 0;
  auVar1100._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar857,auVar1540,auVar1100);
  dVar1 = in_RCX[4];
  auVar1101._8_8_ = 0;
  auVar1101._0_8_ = dVar1;
  auVar1541._8_8_ = 0;
  auVar1541._0_8_ = in_stack_00000008[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1541,auVar1101,auVar14);
  dVar3 = in_RCX[2];
  auVar858._8_8_ = 0;
  auVar858._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar858,auVar1680,auVar14);
  auVar1681._8_8_ = 0;
  auVar1681._0_8_ = in_stack_00000008[2];
  auVar1542._8_8_ = 0;
  auVar1542._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1542,auVar1681,auVar14);
  auVar859._8_8_ = 0;
  auVar859._0_8_ = in_stack_00000008[5];
  auVar1102._8_8_ = 0;
  auVar1102._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1102,auVar859,auVar14);
  dVar1 = in_RCX[5];
  auVar1543._8_8_ = 0;
  auVar1543._0_8_ = dVar1;
  auVar1682._8_8_ = 0;
  auVar1682._0_8_ = in_stack_00000008[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1682,auVar1543,auVar14);
  auVar1103._8_8_ = 0;
  auVar1103._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1103,auVar859,auVar14);
  auVar860._8_8_ = 0;
  auVar860._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar860,auVar1333,auVar14);
  auVar1104._8_8_ = 0;
  auVar1104._0_8_ = in_stack_00000008[3];
  auVar581._8_8_ = 0;
  auVar581._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar581,auVar1104,auVar14);
  dVar1 = in_RCX[3];
  auVar861._8_8_ = 0;
  auVar861._0_8_ = dVar1;
  auVar1334._8_8_ = 0;
  auVar1334._0_8_ = *in_stack_00000008 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1334,auVar861,auVar14);
  auVar582._8_8_ = 0;
  auVar582._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar582,auVar1104,auVar14);
  *(long *)(ctx + 0x5960) = auVar14._0_8_;
  dVar1 = in_RCX[1];
  auVar1683._8_8_ = 0;
  auVar1683._0_8_ = in_R9[4];
  auVar1544._8_8_ = 0;
  auVar1544._0_8_ = in_R9[1];
  dVar2 = *in_RCX;
  auVar1335._8_8_ = 0;
  auVar1335._0_8_ = *in_R9;
  auVar862._8_8_ = 0;
  auVar862._0_8_ = dVar1 * -2.0 * in_R9[4];
  auVar1105._8_8_ = 0;
  auVar1105._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar862,auVar1544,auVar1105);
  dVar1 = in_RCX[4];
  auVar1106._8_8_ = 0;
  auVar1106._0_8_ = dVar1;
  auVar1545._8_8_ = 0;
  auVar1545._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1545,auVar1106,auVar14);
  dVar3 = in_RCX[2];
  auVar863._8_8_ = 0;
  auVar863._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar863,auVar1683,auVar14);
  auVar1684._8_8_ = 0;
  auVar1684._0_8_ = in_R9[2];
  auVar1546._8_8_ = 0;
  auVar1546._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1546,auVar1684,auVar14);
  auVar864._8_8_ = 0;
  auVar864._0_8_ = in_R9[5];
  auVar1107._8_8_ = 0;
  auVar1107._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1107,auVar864,auVar14);
  dVar1 = in_RCX[5];
  auVar1547._8_8_ = 0;
  auVar1547._0_8_ = dVar1;
  auVar1685._8_8_ = 0;
  auVar1685._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1685,auVar1547,auVar14);
  auVar1108._8_8_ = 0;
  auVar1108._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1108,auVar864,auVar14);
  auVar865._8_8_ = 0;
  auVar865._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar865,auVar1335,auVar14);
  auVar1109._8_8_ = 0;
  auVar1109._0_8_ = in_R9[3];
  auVar583._8_8_ = 0;
  auVar583._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar583,auVar1109,auVar14);
  dVar1 = in_RCX[3];
  auVar866._8_8_ = 0;
  auVar866._0_8_ = dVar1;
  auVar1336._8_8_ = 0;
  auVar1336._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1336,auVar866,auVar14);
  auVar584._8_8_ = 0;
  auVar584._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar584,auVar1109,auVar14);
  *(long *)(ctx + 0x5ac0) = auVar14._0_8_;
  dVar1 = in_RCX[1];
  auVar1686._8_8_ = 0;
  auVar1686._0_8_ = in_R8[4];
  auVar1548._8_8_ = 0;
  auVar1548._0_8_ = in_R8[1];
  dVar2 = *in_RCX;
  auVar1337._8_8_ = 0;
  auVar1337._0_8_ = *in_R8;
  auVar867._8_8_ = 0;
  auVar867._0_8_ = dVar1 * -2.0 * in_R8[4];
  auVar1110._8_8_ = 0;
  auVar1110._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar867,auVar1548,auVar1110);
  dVar1 = in_RCX[4];
  auVar1111._8_8_ = 0;
  auVar1111._0_8_ = dVar1;
  auVar1549._8_8_ = 0;
  auVar1549._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1549,auVar1111,auVar14);
  dVar3 = in_RCX[2];
  auVar868._8_8_ = 0;
  auVar868._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar868,auVar1686,auVar14);
  auVar1687._8_8_ = 0;
  auVar1687._0_8_ = in_R8[2];
  auVar1550._8_8_ = 0;
  auVar1550._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1550,auVar1687,auVar14);
  auVar869._8_8_ = 0;
  auVar869._0_8_ = in_R8[5];
  auVar1112._8_8_ = 0;
  auVar1112._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1112,auVar869,auVar14);
  dVar1 = in_RCX[5];
  auVar1551._8_8_ = 0;
  auVar1551._0_8_ = dVar1;
  auVar1688._8_8_ = 0;
  auVar1688._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1688,auVar1551,auVar14);
  auVar1113._8_8_ = 0;
  auVar1113._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1113,auVar869,auVar14);
  auVar870._8_8_ = 0;
  auVar870._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar870,auVar1337,auVar14);
  auVar1114._8_8_ = 0;
  auVar1114._0_8_ = in_R8[3];
  auVar585._8_8_ = 0;
  auVar585._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar585,auVar1114,auVar14);
  dVar1 = in_RCX[3];
  auVar871._8_8_ = 0;
  auVar871._0_8_ = dVar1;
  auVar1338._8_8_ = 0;
  auVar1338._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1338,auVar871,auVar14);
  auVar586._8_8_ = 0;
  auVar586._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar586,auVar1114,auVar14);
  *(long *)(ctx + 0x5c20) = auVar14._0_8_;
  dVar1 = *in_RCX;
  dVar2 = in_RCX[1];
  dVar3 = in_RCX[3];
  auVar1339._8_8_ = 0;
  auVar1339._0_8_ = dVar3;
  auVar1115._8_8_ = 0;
  auVar1115._0_8_ = dVar1 * -2.0;
  auVar1552._8_8_ = 0;
  auVar1552._0_8_ = dVar2 * dVar2;
  auVar14 = vfmadd231sd_fma(auVar1552,auVar1339,auVar1115);
  dVar4 = in_RCX[4];
  auVar1116._8_8_ = 0;
  auVar1116._0_8_ = dVar4;
  dVar5 = in_RCX[2];
  dVar6 = in_RCX[5];
  auVar1830._8_8_ = 0;
  auVar1830._0_8_ = dVar6;
  auVar587._8_8_ = 0;
  auVar587._0_8_ =
       dVar3 * dVar3 + auVar14._0_8_ + dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6 + dVar1 * dVar1
  ;
  auVar872._8_8_ = 0;
  auVar872._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar872,auVar1116,auVar587);
  auVar588._8_8_ = 0;
  auVar588._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar588,auVar1830,auVar14);
  *(long *)(ctx + 0x5d80) = auVar14._0_8_;
  dVar1 = in_RDX[4];
  auVar1340._8_8_ = 0;
  auVar1340._0_8_ = dVar1;
  auVar873._8_8_ = 0;
  auVar873._0_8_ = in_stack_00000008[1];
  auVar1689._8_8_ = 0;
  auVar1689._0_8_ = in_stack_00000008[4];
  auVar1831._8_8_ = 0;
  auVar1831._0_8_ = in_stack_00000008[2];
  auVar589._8_8_ = 0;
  auVar589._0_8_ = *in_stack_00000008;
  auVar1117._8_8_ = 0;
  auVar1117._0_8_ = in_stack_00000008[1] * -2.0;
  auVar1553._8_8_ = 0;
  auVar1553._0_8_ = (dVar1 + dVar1) * in_stack_00000008[4];
  auVar14 = vfmadd231sd_fma(auVar1553,auVar1340,auVar1117);
  dVar1 = in_RDX[2];
  auVar1341._8_8_ = 0;
  auVar1341._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1341,auVar1831,auVar14);
  auVar1554._8_8_ = 0;
  auVar1554._0_8_ = in_stack_00000008[5];
  auVar1118._8_8_ = 0;
  auVar1118._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1118,auVar1554,auVar14);
  dVar1 = in_RDX[5];
  auVar1342._8_8_ = 0;
  auVar1342._0_8_ = dVar1;
  auVar1832._8_8_ = 0;
  auVar1832._0_8_ = in_stack_00000008[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1832,auVar1342,auVar14);
  dVar2 = *in_RDX;
  auVar1119._8_8_ = 0;
  auVar1119._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1119,auVar1554,auVar14);
  dVar1 = in_RDX[1];
  auVar1833._8_8_ = 0;
  auVar1833._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1833,auVar589,auVar14);
  auVar1120._8_8_ = 0;
  auVar1120._0_8_ = in_stack_00000008[3];
  auVar1343._8_8_ = 0;
  auVar1343._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1343,auVar1120,auVar14);
  dVar2 = in_RDX[3];
  auVar1834._8_8_ = 0;
  auVar1834._0_8_ = dVar2;
  auVar590._8_8_ = 0;
  auVar590._0_8_ = *in_stack_00000008 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar590,auVar1834,auVar14);
  auVar1344._8_8_ = 0;
  auVar1344._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1344,auVar1120,auVar14);
  auVar591._8_8_ = 0;
  auVar591._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar591,auVar873,auVar14);
  auVar874._8_8_ = 0;
  auVar874._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar874,auVar1689,auVar14);
  *(long *)(ctx + 0x5ee0) = auVar14._0_8_;
  dVar1 = in_RDX[4];
  auVar1345._8_8_ = 0;
  auVar1345._0_8_ = dVar1;
  auVar875._8_8_ = 0;
  auVar875._0_8_ = in_R9[1];
  auVar1690._8_8_ = 0;
  auVar1690._0_8_ = in_R9[4];
  auVar1835._8_8_ = 0;
  auVar1835._0_8_ = in_R9[2];
  auVar592._8_8_ = 0;
  auVar592._0_8_ = *in_R9;
  auVar1121._8_8_ = 0;
  auVar1121._0_8_ = in_R9[1] * -2.0;
  auVar1555._8_8_ = 0;
  auVar1555._0_8_ = (dVar1 + dVar1) * in_R9[4];
  auVar14 = vfmadd231sd_fma(auVar1555,auVar1345,auVar1121);
  dVar1 = in_RDX[2];
  auVar1346._8_8_ = 0;
  auVar1346._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1346,auVar1835,auVar14);
  auVar1556._8_8_ = 0;
  auVar1556._0_8_ = in_R9[5];
  auVar1122._8_8_ = 0;
  auVar1122._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1122,auVar1556,auVar14);
  dVar1 = in_RDX[5];
  auVar1347._8_8_ = 0;
  auVar1347._0_8_ = dVar1;
  auVar1836._8_8_ = 0;
  auVar1836._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1836,auVar1347,auVar14);
  dVar2 = *in_RDX;
  auVar1123._8_8_ = 0;
  auVar1123._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1123,auVar1556,auVar14);
  dVar1 = in_RDX[1];
  auVar1837._8_8_ = 0;
  auVar1837._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1837,auVar592,auVar14);
  auVar1124._8_8_ = 0;
  auVar1124._0_8_ = in_R9[3];
  auVar1348._8_8_ = 0;
  auVar1348._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1348,auVar1124,auVar14);
  dVar2 = in_RDX[3];
  auVar1838._8_8_ = 0;
  auVar1838._0_8_ = dVar2;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar593,auVar1838,auVar14);
  auVar1349._8_8_ = 0;
  auVar1349._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1349,auVar1124,auVar14);
  auVar594._8_8_ = 0;
  auVar594._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar594,auVar875,auVar14);
  auVar876._8_8_ = 0;
  auVar876._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar876,auVar1690,auVar14);
  *(long *)(ctx + 0x6040) = auVar14._0_8_;
  dVar1 = in_RDX[4];
  auVar1350._8_8_ = 0;
  auVar1350._0_8_ = dVar1;
  auVar877._8_8_ = 0;
  auVar877._0_8_ = in_R8[1];
  auVar1691._8_8_ = 0;
  auVar1691._0_8_ = in_R8[4];
  auVar1839._8_8_ = 0;
  auVar1839._0_8_ = in_R8[2];
  auVar595._8_8_ = 0;
  auVar595._0_8_ = *in_R8;
  auVar1125._8_8_ = 0;
  auVar1125._0_8_ = in_R8[1] * -2.0;
  auVar1557._8_8_ = 0;
  auVar1557._0_8_ = (dVar1 + dVar1) * in_R8[4];
  auVar14 = vfmadd231sd_fma(auVar1557,auVar1350,auVar1125);
  dVar1 = in_RDX[2];
  auVar1351._8_8_ = 0;
  auVar1351._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1351,auVar1839,auVar14);
  auVar1558._8_8_ = 0;
  auVar1558._0_8_ = in_R8[5];
  auVar1126._8_8_ = 0;
  auVar1126._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1126,auVar1558,auVar14);
  dVar1 = in_RDX[5];
  auVar1352._8_8_ = 0;
  auVar1352._0_8_ = dVar1;
  auVar1840._8_8_ = 0;
  auVar1840._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1840,auVar1352,auVar14);
  dVar2 = *in_RDX;
  auVar1127._8_8_ = 0;
  auVar1127._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1127,auVar1558,auVar14);
  dVar1 = in_RDX[1];
  auVar1841._8_8_ = 0;
  auVar1841._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1841,auVar595,auVar14);
  auVar1128._8_8_ = 0;
  auVar1128._0_8_ = in_R8[3];
  auVar1353._8_8_ = 0;
  auVar1353._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1353,auVar1128,auVar14);
  dVar2 = in_RDX[3];
  auVar1842._8_8_ = 0;
  auVar1842._0_8_ = dVar2;
  auVar596._8_8_ = 0;
  auVar596._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar596,auVar1842,auVar14);
  auVar1354._8_8_ = 0;
  auVar1354._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1354,auVar1128,auVar14);
  auVar597._8_8_ = 0;
  auVar597._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar597,auVar877,auVar14);
  auVar878._8_8_ = 0;
  auVar878._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar878,auVar1691,auVar14);
  *(long *)(ctx + 0x61a0) = auVar14._0_8_;
  dVar1 = in_RDX[4];
  auVar1355._8_8_ = 0;
  auVar1355._0_8_ = dVar1;
  auVar879._8_8_ = 0;
  auVar879._0_8_ = in_RCX[1];
  auVar1692._8_8_ = 0;
  auVar1692._0_8_ = in_RCX[4];
  auVar1843._8_8_ = 0;
  auVar1843._0_8_ = in_RCX[2];
  auVar598._8_8_ = 0;
  auVar598._0_8_ = *in_RCX;
  auVar1129._8_8_ = 0;
  auVar1129._0_8_ = in_RCX[1] * -2.0;
  auVar1559._8_8_ = 0;
  auVar1559._0_8_ = (dVar1 + dVar1) * in_RCX[4];
  auVar14 = vfmadd231sd_fma(auVar1559,auVar1355,auVar1129);
  dVar1 = in_RDX[2];
  auVar1356._8_8_ = 0;
  auVar1356._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1356,auVar1843,auVar14);
  auVar1560._8_8_ = 0;
  auVar1560._0_8_ = in_RCX[5];
  auVar1130._8_8_ = 0;
  auVar1130._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1130,auVar1560,auVar14);
  dVar1 = in_RDX[5];
  auVar1357._8_8_ = 0;
  auVar1357._0_8_ = dVar1;
  auVar1844._8_8_ = 0;
  auVar1844._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1844,auVar1357,auVar14);
  dVar2 = *in_RDX;
  auVar1131._8_8_ = 0;
  auVar1131._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1131,auVar1560,auVar14);
  dVar1 = in_RDX[1];
  auVar1845._8_8_ = 0;
  auVar1845._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1845,auVar598,auVar14);
  auVar1132._8_8_ = 0;
  auVar1132._0_8_ = in_RCX[3];
  auVar1358._8_8_ = 0;
  auVar1358._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1358,auVar1132,auVar14);
  dVar2 = in_RDX[3];
  auVar1846._8_8_ = 0;
  auVar1846._0_8_ = dVar2;
  auVar599._8_8_ = 0;
  auVar599._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar599,auVar1846,auVar14);
  auVar1359._8_8_ = 0;
  auVar1359._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1359,auVar1132,auVar14);
  auVar600._8_8_ = 0;
  auVar600._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar600,auVar879,auVar14);
  auVar880._8_8_ = 0;
  auVar880._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar880,auVar1692,auVar14);
  *(long *)(ctx + 0x6300) = auVar14._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  dVar3 = in_RDX[3];
  auVar1360._8_8_ = 0;
  auVar1360._0_8_ = dVar3;
  auVar1133._8_8_ = 0;
  auVar1133._0_8_ = dVar1 * -2.0;
  auVar1561._8_8_ = 0;
  auVar1561._0_8_ = dVar2 * dVar2;
  auVar14 = vfmadd231sd_fma(auVar1561,auVar1360,auVar1133);
  dVar4 = in_RDX[4];
  auVar1134._8_8_ = 0;
  auVar1134._0_8_ = dVar4;
  dVar5 = in_RDX[2];
  dVar6 = in_RDX[5];
  auVar1847._8_8_ = 0;
  auVar1847._0_8_ = dVar6;
  auVar601._8_8_ = 0;
  auVar601._0_8_ =
       dVar3 * dVar3 + auVar14._0_8_ + dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6 + dVar1 * dVar1
  ;
  auVar881._8_8_ = 0;
  auVar881._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar881,auVar1134,auVar601);
  auVar602._8_8_ = 0;
  auVar602._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar602,auVar1847,auVar14);
  *(long *)(ctx + 0x6460) = auVar14._0_8_;
  dVar1 = *in_RSI;
  auVar1361._8_8_ = 0;
  auVar1361._0_8_ = in_stack_00000008[3];
  auVar1562._8_8_ = 0;
  auVar1562._0_8_ = *in_stack_00000008;
  dVar2 = in_RSI[1];
  auVar1693._8_8_ = 0;
  auVar1693._0_8_ = in_stack_00000008[1];
  auVar603._8_8_ = 0;
  auVar603._0_8_ = in_stack_00000008[3] * dVar1 * -2.0;
  auVar1135._8_8_ = 0;
  auVar1135._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar603,auVar1562,auVar1135);
  dVar1 = in_RSI[3];
  auVar1136._8_8_ = 0;
  auVar1136._0_8_ = dVar1;
  auVar1563._8_8_ = 0;
  auVar1563._0_8_ = *in_stack_00000008 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1563,auVar1136,auVar14);
  auVar604._8_8_ = 0;
  auVar604._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar604,auVar1361,auVar14);
  auVar1137._8_8_ = 0;
  auVar1137._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1137,auVar1693,auVar14);
  auVar605._8_8_ = 0;
  auVar605._0_8_ = in_stack_00000008[4];
  auVar882._8_8_ = 0;
  auVar882._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar882,auVar605,auVar14);
  dVar1 = in_RSI[4];
  auVar1138._8_8_ = 0;
  auVar1138._0_8_ = dVar1;
  auVar1362._8_8_ = 0;
  auVar1362._0_8_ = in_stack_00000008[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1362,auVar1138,auVar14);
  auVar883._8_8_ = 0;
  auVar883._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar883,auVar605,auVar14);
  dVar1 = in_RSI[2];
  auVar1363._8_8_ = 0;
  auVar1363._0_8_ = in_stack_00000008[2];
  auVar1139._8_8_ = 0;
  auVar1139._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1139,auVar1363,auVar14);
  auVar884._8_8_ = 0;
  auVar884._0_8_ = in_stack_00000008[5];
  auVar606._8_8_ = 0;
  auVar606._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar606,auVar884,auVar14);
  dVar1 = in_RSI[5];
  auVar1140._8_8_ = 0;
  auVar1140._0_8_ = dVar1;
  auVar1364._8_8_ = 0;
  auVar1364._0_8_ = in_stack_00000008[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1364,auVar1140,auVar14);
  auVar607._8_8_ = 0;
  auVar607._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar607,auVar884,auVar14);
  *(long *)(ctx + 0x65c0) = auVar14._0_8_;
  dVar1 = *in_RSI;
  auVar1365._8_8_ = 0;
  auVar1365._0_8_ = in_R9[3];
  auVar1564._8_8_ = 0;
  auVar1564._0_8_ = *in_R9;
  dVar2 = in_RSI[1];
  auVar1694._8_8_ = 0;
  auVar1694._0_8_ = in_R9[1];
  auVar608._8_8_ = 0;
  auVar608._0_8_ = in_R9[3] * dVar1 * -2.0;
  auVar1141._8_8_ = 0;
  auVar1141._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar608,auVar1564,auVar1141);
  dVar1 = in_RSI[3];
  auVar1142._8_8_ = 0;
  auVar1142._0_8_ = dVar1;
  auVar1565._8_8_ = 0;
  auVar1565._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1565,auVar1142,auVar14);
  auVar609._8_8_ = 0;
  auVar609._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar609,auVar1365,auVar14);
  auVar1143._8_8_ = 0;
  auVar1143._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1143,auVar1694,auVar14);
  auVar610._8_8_ = 0;
  auVar610._0_8_ = in_R9[4];
  auVar885._8_8_ = 0;
  auVar885._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar885,auVar610,auVar14);
  dVar1 = in_RSI[4];
  auVar1144._8_8_ = 0;
  auVar1144._0_8_ = dVar1;
  auVar1366._8_8_ = 0;
  auVar1366._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1366,auVar1144,auVar14);
  auVar886._8_8_ = 0;
  auVar886._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar886,auVar610,auVar14);
  dVar1 = in_RSI[2];
  auVar1367._8_8_ = 0;
  auVar1367._0_8_ = in_R9[2];
  auVar1145._8_8_ = 0;
  auVar1145._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1145,auVar1367,auVar14);
  auVar887._8_8_ = 0;
  auVar887._0_8_ = in_R9[5];
  auVar611._8_8_ = 0;
  auVar611._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar611,auVar887,auVar14);
  dVar1 = in_RSI[5];
  auVar1146._8_8_ = 0;
  auVar1146._0_8_ = dVar1;
  auVar1368._8_8_ = 0;
  auVar1368._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1368,auVar1146,auVar14);
  auVar612._8_8_ = 0;
  auVar612._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar612,auVar887,auVar14);
  *(long *)(ctx + 0x6720) = auVar14._0_8_;
  dVar1 = *in_RSI;
  auVar1369._8_8_ = 0;
  auVar1369._0_8_ = in_R8[3];
  auVar1566._8_8_ = 0;
  auVar1566._0_8_ = *in_R8;
  dVar2 = in_RSI[1];
  auVar1695._8_8_ = 0;
  auVar1695._0_8_ = in_R8[1];
  auVar613._8_8_ = 0;
  auVar613._0_8_ = in_R8[3] * dVar1 * -2.0;
  auVar1147._8_8_ = 0;
  auVar1147._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar613,auVar1566,auVar1147);
  dVar1 = in_RSI[3];
  auVar1148._8_8_ = 0;
  auVar1148._0_8_ = dVar1;
  auVar1567._8_8_ = 0;
  auVar1567._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1567,auVar1148,auVar14);
  auVar614._8_8_ = 0;
  auVar614._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar614,auVar1369,auVar14);
  auVar1149._8_8_ = 0;
  auVar1149._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1149,auVar1695,auVar14);
  auVar615._8_8_ = 0;
  auVar615._0_8_ = in_R8[4];
  auVar888._8_8_ = 0;
  auVar888._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar888,auVar615,auVar14);
  dVar1 = in_RSI[4];
  auVar1150._8_8_ = 0;
  auVar1150._0_8_ = dVar1;
  auVar1370._8_8_ = 0;
  auVar1370._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1370,auVar1150,auVar14);
  auVar889._8_8_ = 0;
  auVar889._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar889,auVar615,auVar14);
  dVar1 = in_RSI[2];
  auVar1371._8_8_ = 0;
  auVar1371._0_8_ = in_R8[2];
  auVar1151._8_8_ = 0;
  auVar1151._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1151,auVar1371,auVar14);
  auVar890._8_8_ = 0;
  auVar890._0_8_ = in_R8[5];
  auVar616._8_8_ = 0;
  auVar616._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar616,auVar890,auVar14);
  dVar1 = in_RSI[5];
  auVar1152._8_8_ = 0;
  auVar1152._0_8_ = dVar1;
  auVar1372._8_8_ = 0;
  auVar1372._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1372,auVar1152,auVar14);
  auVar617._8_8_ = 0;
  auVar617._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar617,auVar890,auVar14);
  *(long *)(ctx + 0x6880) = auVar14._0_8_;
  dVar1 = *in_RSI;
  auVar1373._8_8_ = 0;
  auVar1373._0_8_ = in_RCX[3];
  auVar1568._8_8_ = 0;
  auVar1568._0_8_ = *in_RCX;
  dVar2 = in_RSI[1];
  auVar1696._8_8_ = 0;
  auVar1696._0_8_ = in_RCX[1];
  auVar618._8_8_ = 0;
  auVar618._0_8_ = in_RCX[3] * dVar1 * -2.0;
  auVar1153._8_8_ = 0;
  auVar1153._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar618,auVar1568,auVar1153);
  dVar1 = in_RSI[3];
  auVar1154._8_8_ = 0;
  auVar1154._0_8_ = dVar1;
  auVar1569._8_8_ = 0;
  auVar1569._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1569,auVar1154,auVar14);
  auVar619._8_8_ = 0;
  auVar619._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar619,auVar1373,auVar14);
  auVar1155._8_8_ = 0;
  auVar1155._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1155,auVar1696,auVar14);
  auVar620._8_8_ = 0;
  auVar620._0_8_ = in_RCX[4];
  auVar891._8_8_ = 0;
  auVar891._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar891,auVar620,auVar14);
  dVar1 = in_RSI[4];
  auVar1156._8_8_ = 0;
  auVar1156._0_8_ = dVar1;
  auVar1374._8_8_ = 0;
  auVar1374._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1374,auVar1156,auVar14);
  auVar892._8_8_ = 0;
  auVar892._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar892,auVar620,auVar14);
  dVar1 = in_RSI[2];
  auVar1375._8_8_ = 0;
  auVar1375._0_8_ = in_RCX[2];
  auVar1157._8_8_ = 0;
  auVar1157._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1157,auVar1375,auVar14);
  auVar893._8_8_ = 0;
  auVar893._0_8_ = in_RCX[5];
  auVar621._8_8_ = 0;
  auVar621._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar621,auVar893,auVar14);
  dVar1 = in_RSI[5];
  auVar1158._8_8_ = 0;
  auVar1158._0_8_ = dVar1;
  auVar1376._8_8_ = 0;
  auVar1376._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1376,auVar1158,auVar14);
  auVar622._8_8_ = 0;
  auVar622._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar622,auVar893,auVar14);
  *(long *)(ctx + 0x69e0) = auVar14._0_8_;
  dVar1 = *in_RSI;
  auVar1377._8_8_ = 0;
  auVar1377._0_8_ = in_RDX[3];
  auVar1570._8_8_ = 0;
  auVar1570._0_8_ = *in_RDX;
  dVar2 = in_RSI[1];
  auVar1697._8_8_ = 0;
  auVar1697._0_8_ = in_RDX[1];
  auVar623._8_8_ = 0;
  auVar623._0_8_ = in_RDX[3] * dVar1 * -2.0;
  auVar1159._8_8_ = 0;
  auVar1159._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd231sd_fma(auVar623,auVar1570,auVar1159);
  dVar1 = in_RSI[3];
  auVar1160._8_8_ = 0;
  auVar1160._0_8_ = dVar1;
  auVar1571._8_8_ = 0;
  auVar1571._0_8_ = *in_RDX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1571,auVar1160,auVar14);
  auVar624._8_8_ = 0;
  auVar624._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar624,auVar1377,auVar14);
  auVar1161._8_8_ = 0;
  auVar1161._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar1161,auVar1697,auVar14);
  auVar625._8_8_ = 0;
  auVar625._0_8_ = in_RDX[4];
  auVar894._8_8_ = 0;
  auVar894._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar894,auVar625,auVar14);
  dVar1 = in_RSI[4];
  auVar1162._8_8_ = 0;
  auVar1162._0_8_ = dVar1;
  auVar1378._8_8_ = 0;
  auVar1378._0_8_ = in_RDX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1378,auVar1162,auVar14);
  auVar895._8_8_ = 0;
  auVar895._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar895,auVar625,auVar14);
  dVar1 = in_RSI[2];
  auVar1379._8_8_ = 0;
  auVar1379._0_8_ = in_RDX[2];
  auVar1163._8_8_ = 0;
  auVar1163._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1163,auVar1379,auVar14);
  auVar896._8_8_ = 0;
  auVar896._0_8_ = in_RDX[5];
  auVar626._8_8_ = 0;
  auVar626._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar626,auVar896,auVar14);
  dVar1 = in_RSI[5];
  auVar1164._8_8_ = 0;
  auVar1164._0_8_ = dVar1;
  auVar1380._8_8_ = 0;
  auVar1380._0_8_ = in_RDX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1380,auVar1164,auVar14);
  auVar627._8_8_ = 0;
  auVar627._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar627,auVar896,auVar14);
  *(long *)(ctx + 0x6b40) = auVar14._0_8_;
  dVar1 = in_RSI[4];
  auVar628._8_8_ = 0;
  auVar628._0_8_ = dVar1;
  dVar2 = in_RSI[2];
  dVar3 = in_RSI[5];
  auVar1165._8_8_ = 0;
  auVar1165._0_8_ = dVar3;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = dVar2 * dVar2 + (dVar1 * dVar1 - auVar9._0_8_ * auVar9._0_8_);
  auVar897._8_8_ = 0;
  auVar897._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar897,auVar1165,auVar381);
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  dVar4 = in_RSI[3];
  auVar1381._8_8_ = 0;
  auVar1381._0_8_ = dVar4;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = dVar2 * dVar2 + auVar9._0_8_ + dVar3 * dVar3;
  auVar898._8_8_ = 0;
  auVar898._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar898,auVar1381,auVar382);
  auVar383._8_8_ = 0;
  auVar383._0_8_ = dVar1 * dVar1 + auVar9._0_8_ + dVar4 * dVar4;
  auVar899._8_8_ = 0;
  auVar899._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar899,auVar628,auVar383);
  *(long *)(ctx + 0x6ca0) = auVar9._0_8_;
  dVar1 = in_stack_00000008[1];
  dVar2 = in_stack_00000008[2];
  dVar3 = *in_stack_00000008;
  dVar4 = in_stack_00000008[6];
  auVar1382._8_8_ = 0;
  auVar1382._0_8_ = dVar4;
  dVar5 = in_stack_00000008[7];
  auVar1572._8_8_ = 0;
  auVar1572._0_8_ = dVar5;
  dVar6 = in_stack_00000008[8];
  auVar1698._8_8_ = 0;
  auVar1698._0_8_ = dVar6;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = dVar3 * -2.0;
  auVar900._8_8_ = 0;
  auVar900._0_8_ =
       dVar1 * dVar1 + dVar2 * dVar2 + dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6 + dVar3 * dVar3
  ;
  auVar9 = vfmadd213sd_fma(auVar384,auVar1382,auVar900);
  auVar629._8_8_ = 0;
  auVar629._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar629,auVar1572,auVar9);
  auVar385._8_8_ = 0;
  auVar385._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar385,auVar1698,auVar9);
  *(long *)(ctx + 0x5128) = auVar9._0_8_;
  dVar1 = in_R9[2];
  dVar2 = in_R9[1];
  auVar1383._8_8_ = 0;
  auVar1383._0_8_ = in_stack_00000008[1];
  dVar3 = *in_R9;
  auVar1166._8_8_ = 0;
  auVar1166._0_8_ = *in_stack_00000008;
  auVar901._8_8_ = 0;
  auVar901._0_8_ = dVar2 + dVar2;
  auVar1699._8_8_ = 0;
  auVar1699._0_8_ = (dVar1 + dVar1) * in_stack_00000008[2];
  auVar9 = vfmadd231sd_fma(auVar1699,auVar1383,auVar901);
  auVar902._8_8_ = 0;
  auVar902._0_8_ = in_stack_00000008[6];
  auVar1928._8_8_ = 0;
  auVar1928._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1928,auVar902,auVar9);
  dVar4 = in_R9[6];
  auVar1700._8_8_ = 0;
  auVar1700._0_8_ = dVar4;
  auVar1998._8_8_ = 0;
  auVar1998._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1998,auVar1700,auVar9);
  auVar1701._8_8_ = 0;
  auVar1701._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1701,auVar902,auVar9);
  auVar903._8_8_ = 0;
  auVar903._0_8_ = in_stack_00000008[7];
  auVar630._8_8_ = 0;
  auVar630._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar630,auVar903,auVar9);
  dVar2 = in_R9[7];
  auVar1702._8_8_ = 0;
  auVar1702._0_8_ = dVar2;
  auVar1384._8_8_ = 0;
  auVar1384._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1384,auVar1702,auVar9);
  auVar631._8_8_ = 0;
  auVar631._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar631,auVar903,auVar9);
  auVar904._8_8_ = 0;
  auVar904._0_8_ = in_stack_00000008[8];
  auVar1385._8_8_ = 0;
  auVar1385._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1385,auVar904,auVar9);
  dVar1 = in_R9[8];
  auVar632._8_8_ = 0;
  auVar632._0_8_ = dVar1;
  auVar1573._8_8_ = 0;
  auVar1573._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1573,auVar632,auVar9);
  auVar633._8_8_ = 0;
  auVar633._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar633,auVar904,auVar9);
  auVar386._8_8_ = 0;
  auVar386._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar386,auVar1166,auVar9);
  *(long *)(ctx + 0x5288) = auVar9._0_8_;
  dVar1 = in_R9[1];
  dVar2 = in_R9[2];
  dVar3 = *in_R9;
  dVar4 = in_R9[6];
  auVar1386._8_8_ = 0;
  auVar1386._0_8_ = dVar4;
  dVar5 = in_R9[7];
  auVar1574._8_8_ = 0;
  auVar1574._0_8_ = dVar5;
  dVar6 = in_R9[8];
  auVar1703._8_8_ = 0;
  auVar1703._0_8_ = dVar6;
  auVar387._8_8_ = 0;
  auVar387._0_8_ = dVar3 * -2.0;
  auVar905._8_8_ = 0;
  auVar905._0_8_ =
       dVar1 * dVar1 + dVar2 * dVar2 + dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6 + dVar3 * dVar3
  ;
  auVar9 = vfmadd213sd_fma(auVar387,auVar1386,auVar905);
  auVar634._8_8_ = 0;
  auVar634._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar634,auVar1574,auVar9);
  auVar388._8_8_ = 0;
  auVar388._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar388,auVar1703,auVar9);
  *(long *)(ctx + 0x53e8) = auVar9._0_8_;
  dVar1 = in_R8[2];
  dVar2 = in_R8[1];
  auVar1387._8_8_ = 0;
  auVar1387._0_8_ = in_stack_00000008[1];
  dVar3 = *in_R8;
  auVar1167._8_8_ = 0;
  auVar1167._0_8_ = *in_stack_00000008;
  auVar906._8_8_ = 0;
  auVar906._0_8_ = dVar2 + dVar2;
  auVar1704._8_8_ = 0;
  auVar1704._0_8_ = (dVar1 + dVar1) * in_stack_00000008[2];
  auVar9 = vfmadd231sd_fma(auVar1704,auVar1387,auVar906);
  auVar907._8_8_ = 0;
  auVar907._0_8_ = in_stack_00000008[6];
  auVar1929._8_8_ = 0;
  auVar1929._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1929,auVar907,auVar9);
  dVar4 = in_R8[6];
  auVar1705._8_8_ = 0;
  auVar1705._0_8_ = dVar4;
  auVar1999._8_8_ = 0;
  auVar1999._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1999,auVar1705,auVar9);
  auVar1706._8_8_ = 0;
  auVar1706._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1706,auVar907,auVar9);
  auVar908._8_8_ = 0;
  auVar908._0_8_ = in_stack_00000008[7];
  auVar635._8_8_ = 0;
  auVar635._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar635,auVar908,auVar9);
  dVar2 = in_R8[7];
  auVar1707._8_8_ = 0;
  auVar1707._0_8_ = dVar2;
  auVar1388._8_8_ = 0;
  auVar1388._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1388,auVar1707,auVar9);
  auVar636._8_8_ = 0;
  auVar636._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar636,auVar908,auVar9);
  auVar909._8_8_ = 0;
  auVar909._0_8_ = in_stack_00000008[8];
  auVar1389._8_8_ = 0;
  auVar1389._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1389,auVar909,auVar9);
  dVar1 = in_R8[8];
  auVar637._8_8_ = 0;
  auVar637._0_8_ = dVar1;
  auVar1575._8_8_ = 0;
  auVar1575._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1575,auVar637,auVar9);
  auVar638._8_8_ = 0;
  auVar638._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar638,auVar909,auVar9);
  auVar389._8_8_ = 0;
  auVar389._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar389,auVar1167,auVar9);
  *(long *)(ctx + 0x5548) = auVar9._0_8_;
  dVar1 = in_R8[2];
  dVar2 = in_R8[1];
  auVar1390._8_8_ = 0;
  auVar1390._0_8_ = in_R9[1];
  dVar3 = *in_R8;
  auVar1168._8_8_ = 0;
  auVar1168._0_8_ = *in_R9;
  auVar910._8_8_ = 0;
  auVar910._0_8_ = dVar2 + dVar2;
  auVar1708._8_8_ = 0;
  auVar1708._0_8_ = (dVar1 + dVar1) * in_R9[2];
  auVar9 = vfmadd231sd_fma(auVar1708,auVar1390,auVar910);
  auVar911._8_8_ = 0;
  auVar911._0_8_ = in_R9[6];
  auVar1930._8_8_ = 0;
  auVar1930._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1930,auVar911,auVar9);
  dVar4 = in_R8[6];
  auVar1709._8_8_ = 0;
  auVar1709._0_8_ = dVar4;
  auVar2000._8_8_ = 0;
  auVar2000._0_8_ = *in_R9 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2000,auVar1709,auVar9);
  auVar1710._8_8_ = 0;
  auVar1710._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1710,auVar911,auVar9);
  auVar912._8_8_ = 0;
  auVar912._0_8_ = in_R9[7];
  auVar639._8_8_ = 0;
  auVar639._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar639,auVar912,auVar9);
  dVar2 = in_R8[7];
  auVar1711._8_8_ = 0;
  auVar1711._0_8_ = dVar2;
  auVar1391._8_8_ = 0;
  auVar1391._0_8_ = in_R9[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1391,auVar1711,auVar9);
  auVar640._8_8_ = 0;
  auVar640._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar640,auVar912,auVar9);
  auVar913._8_8_ = 0;
  auVar913._0_8_ = in_R9[8];
  auVar1392._8_8_ = 0;
  auVar1392._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1392,auVar913,auVar9);
  dVar1 = in_R8[8];
  auVar641._8_8_ = 0;
  auVar641._0_8_ = dVar1;
  auVar1576._8_8_ = 0;
  auVar1576._0_8_ = in_R9[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1576,auVar641,auVar9);
  auVar642._8_8_ = 0;
  auVar642._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar642,auVar913,auVar9);
  auVar390._8_8_ = 0;
  auVar390._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar390,auVar1168,auVar9);
  *(long *)(ctx + 0x56a8) = auVar9._0_8_;
  dVar1 = in_R8[1];
  dVar2 = in_R8[2];
  dVar3 = *in_R8;
  dVar4 = in_R8[6];
  auVar1393._8_8_ = 0;
  auVar1393._0_8_ = dVar4;
  dVar5 = in_R8[7];
  auVar1577._8_8_ = 0;
  auVar1577._0_8_ = dVar5;
  dVar6 = in_R8[8];
  auVar1712._8_8_ = 0;
  auVar1712._0_8_ = dVar6;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = dVar3 * -2.0;
  auVar914._8_8_ = 0;
  auVar914._0_8_ =
       dVar1 * dVar1 + dVar2 * dVar2 + dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6 + dVar3 * dVar3
  ;
  auVar9 = vfmadd213sd_fma(auVar391,auVar1393,auVar914);
  auVar643._8_8_ = 0;
  auVar643._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar643,auVar1577,auVar9);
  auVar392._8_8_ = 0;
  auVar392._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar392,auVar1712,auVar9);
  *(long *)(ctx + 0x5808) = auVar9._0_8_;
  dVar1 = in_RCX[2];
  dVar2 = in_RCX[1];
  auVar1394._8_8_ = 0;
  auVar1394._0_8_ = in_stack_00000008[1];
  dVar3 = *in_RCX;
  auVar1169._8_8_ = 0;
  auVar1169._0_8_ = *in_stack_00000008;
  auVar915._8_8_ = 0;
  auVar915._0_8_ = dVar2 + dVar2;
  auVar1713._8_8_ = 0;
  auVar1713._0_8_ = (dVar1 + dVar1) * in_stack_00000008[2];
  auVar9 = vfmadd231sd_fma(auVar1713,auVar1394,auVar915);
  auVar916._8_8_ = 0;
  auVar916._0_8_ = in_stack_00000008[6];
  auVar1931._8_8_ = 0;
  auVar1931._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1931,auVar916,auVar9);
  dVar4 = in_RCX[6];
  auVar1714._8_8_ = 0;
  auVar1714._0_8_ = dVar4;
  auVar2001._8_8_ = 0;
  auVar2001._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2001,auVar1714,auVar9);
  auVar1715._8_8_ = 0;
  auVar1715._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1715,auVar916,auVar9);
  auVar917._8_8_ = 0;
  auVar917._0_8_ = in_stack_00000008[7];
  auVar644._8_8_ = 0;
  auVar644._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar644,auVar917,auVar9);
  dVar2 = in_RCX[7];
  auVar1716._8_8_ = 0;
  auVar1716._0_8_ = dVar2;
  auVar1395._8_8_ = 0;
  auVar1395._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1395,auVar1716,auVar9);
  auVar645._8_8_ = 0;
  auVar645._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar645,auVar917,auVar9);
  auVar918._8_8_ = 0;
  auVar918._0_8_ = in_stack_00000008[8];
  auVar1396._8_8_ = 0;
  auVar1396._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1396,auVar918,auVar9);
  dVar1 = in_RCX[8];
  auVar646._8_8_ = 0;
  auVar646._0_8_ = dVar1;
  auVar1578._8_8_ = 0;
  auVar1578._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1578,auVar646,auVar9);
  auVar647._8_8_ = 0;
  auVar647._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar647,auVar918,auVar9);
  auVar393._8_8_ = 0;
  auVar393._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar393,auVar1169,auVar9);
  *(long *)(ctx + 0x5968) = auVar9._0_8_;
  dVar1 = in_RCX[2];
  dVar2 = in_RCX[1];
  auVar1397._8_8_ = 0;
  auVar1397._0_8_ = in_R9[1];
  dVar3 = *in_RCX;
  auVar1170._8_8_ = 0;
  auVar1170._0_8_ = *in_R9;
  auVar919._8_8_ = 0;
  auVar919._0_8_ = dVar2 + dVar2;
  auVar1717._8_8_ = 0;
  auVar1717._0_8_ = (dVar1 + dVar1) * in_R9[2];
  auVar9 = vfmadd231sd_fma(auVar1717,auVar1397,auVar919);
  auVar920._8_8_ = 0;
  auVar920._0_8_ = in_R9[6];
  auVar1932._8_8_ = 0;
  auVar1932._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1932,auVar920,auVar9);
  dVar4 = in_RCX[6];
  auVar1718._8_8_ = 0;
  auVar1718._0_8_ = dVar4;
  auVar2002._8_8_ = 0;
  auVar2002._0_8_ = *in_R9 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2002,auVar1718,auVar9);
  auVar1719._8_8_ = 0;
  auVar1719._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1719,auVar920,auVar9);
  auVar921._8_8_ = 0;
  auVar921._0_8_ = in_R9[7];
  auVar648._8_8_ = 0;
  auVar648._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar648,auVar921,auVar9);
  dVar2 = in_RCX[7];
  auVar1720._8_8_ = 0;
  auVar1720._0_8_ = dVar2;
  auVar1398._8_8_ = 0;
  auVar1398._0_8_ = in_R9[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1398,auVar1720,auVar9);
  auVar649._8_8_ = 0;
  auVar649._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar649,auVar921,auVar9);
  auVar922._8_8_ = 0;
  auVar922._0_8_ = in_R9[8];
  auVar1399._8_8_ = 0;
  auVar1399._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1399,auVar922,auVar9);
  dVar1 = in_RCX[8];
  auVar650._8_8_ = 0;
  auVar650._0_8_ = dVar1;
  auVar1579._8_8_ = 0;
  auVar1579._0_8_ = in_R9[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1579,auVar650,auVar9);
  auVar651._8_8_ = 0;
  auVar651._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar651,auVar922,auVar9);
  auVar394._8_8_ = 0;
  auVar394._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar394,auVar1170,auVar9);
  *(long *)(ctx + 0x5ac8) = auVar9._0_8_;
  dVar1 = in_RCX[2];
  dVar2 = in_RCX[1];
  auVar1400._8_8_ = 0;
  auVar1400._0_8_ = in_R8[1];
  dVar3 = *in_RCX;
  auVar1171._8_8_ = 0;
  auVar1171._0_8_ = *in_R8;
  auVar923._8_8_ = 0;
  auVar923._0_8_ = dVar2 + dVar2;
  auVar1721._8_8_ = 0;
  auVar1721._0_8_ = (dVar1 + dVar1) * in_R8[2];
  auVar9 = vfmadd231sd_fma(auVar1721,auVar1400,auVar923);
  auVar924._8_8_ = 0;
  auVar924._0_8_ = in_R8[6];
  auVar1933._8_8_ = 0;
  auVar1933._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1933,auVar924,auVar9);
  dVar4 = in_RCX[6];
  auVar1722._8_8_ = 0;
  auVar1722._0_8_ = dVar4;
  auVar2003._8_8_ = 0;
  auVar2003._0_8_ = *in_R8 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2003,auVar1722,auVar9);
  auVar1723._8_8_ = 0;
  auVar1723._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1723,auVar924,auVar9);
  auVar925._8_8_ = 0;
  auVar925._0_8_ = in_R8[7];
  auVar652._8_8_ = 0;
  auVar652._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar652,auVar925,auVar9);
  dVar2 = in_RCX[7];
  auVar1724._8_8_ = 0;
  auVar1724._0_8_ = dVar2;
  auVar1401._8_8_ = 0;
  auVar1401._0_8_ = in_R8[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1401,auVar1724,auVar9);
  auVar653._8_8_ = 0;
  auVar653._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar653,auVar925,auVar9);
  auVar926._8_8_ = 0;
  auVar926._0_8_ = in_R8[8];
  auVar1402._8_8_ = 0;
  auVar1402._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1402,auVar926,auVar9);
  dVar1 = in_RCX[8];
  auVar654._8_8_ = 0;
  auVar654._0_8_ = dVar1;
  auVar1580._8_8_ = 0;
  auVar1580._0_8_ = in_R8[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1580,auVar654,auVar9);
  auVar655._8_8_ = 0;
  auVar655._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar655,auVar926,auVar9);
  auVar395._8_8_ = 0;
  auVar395._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar395,auVar1171,auVar9);
  *(long *)(ctx + 0x5c28) = auVar9._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = in_RCX[2];
  dVar3 = *in_RCX;
  dVar4 = in_RCX[6];
  auVar1403._8_8_ = 0;
  auVar1403._0_8_ = dVar4;
  dVar5 = in_RCX[7];
  auVar1581._8_8_ = 0;
  auVar1581._0_8_ = dVar5;
  dVar6 = in_RCX[8];
  auVar1725._8_8_ = 0;
  auVar1725._0_8_ = dVar6;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = dVar3 * -2.0;
  auVar927._8_8_ = 0;
  auVar927._0_8_ =
       dVar1 * dVar1 + dVar2 * dVar2 + dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6 + dVar3 * dVar3
  ;
  auVar9 = vfmadd213sd_fma(auVar396,auVar1403,auVar927);
  auVar656._8_8_ = 0;
  auVar656._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar656,auVar1581,auVar9);
  auVar397._8_8_ = 0;
  auVar397._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar397,auVar1725,auVar9);
  *(long *)(ctx + 0x5d88) = auVar9._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[2];
  auVar1172._8_8_ = 0;
  auVar1172._0_8_ = in_stack_00000008[6];
  auVar928._8_8_ = 0;
  auVar928._0_8_ = in_stack_00000008[2];
  auVar1848._8_8_ = 0;
  auVar1848._0_8_ = *in_stack_00000008;
  dVar3 = in_RDX[1];
  auVar1934._8_8_ = 0;
  auVar1934._0_8_ = in_stack_00000008[1];
  auVar657._8_8_ = 0;
  auVar657._0_8_ = dVar2 + dVar2;
  auVar1726._8_8_ = 0;
  auVar1726._0_8_ = dVar1 * -2.0 * in_stack_00000008[6];
  auVar9 = vfmadd231sd_fma(auVar1726,auVar928,auVar657);
  dVar4 = in_RDX[6];
  auVar658._8_8_ = 0;
  auVar658._0_8_ = dVar4;
  auVar2004._8_8_ = 0;
  auVar2004._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2004,auVar658,auVar9);
  auVar659._8_8_ = 0;
  auVar659._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar659,auVar1172,auVar9);
  auVar1173._8_8_ = 0;
  auVar1173._0_8_ = in_stack_00000008[7];
  auVar1727._8_8_ = 0;
  auVar1727._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1727,auVar1173,auVar9);
  dVar4 = in_RDX[7];
  auVar660._8_8_ = 0;
  auVar660._0_8_ = dVar4;
  auVar2005._8_8_ = 0;
  auVar2005._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2005,auVar660,auVar9);
  auVar661._8_8_ = 0;
  auVar661._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar661,auVar1173,auVar9);
  auVar1174._8_8_ = 0;
  auVar1174._0_8_ = in_stack_00000008[8];
  auVar398._8_8_ = 0;
  auVar398._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar398,auVar1174,auVar9);
  dVar2 = in_RDX[8];
  auVar662._8_8_ = 0;
  auVar662._0_8_ = dVar2;
  auVar929._8_8_ = 0;
  auVar929._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar929,auVar662,auVar9);
  auVar399._8_8_ = 0;
  auVar399._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar399,auVar1174,auVar9);
  auVar663._8_8_ = 0;
  auVar663._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar663,auVar1848,auVar9);
  auVar400._8_8_ = 0;
  auVar400._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar400,auVar1934,auVar9);
  *(long *)(ctx + 0x5ee8) = auVar9._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[2];
  auVar1175._8_8_ = 0;
  auVar1175._0_8_ = in_R9[6];
  auVar930._8_8_ = 0;
  auVar930._0_8_ = in_R9[2];
  auVar1849._8_8_ = 0;
  auVar1849._0_8_ = *in_R9;
  dVar3 = in_RDX[1];
  auVar1935._8_8_ = 0;
  auVar1935._0_8_ = in_R9[1];
  auVar664._8_8_ = 0;
  auVar664._0_8_ = dVar2 + dVar2;
  auVar1728._8_8_ = 0;
  auVar1728._0_8_ = dVar1 * -2.0 * in_R9[6];
  auVar9 = vfmadd231sd_fma(auVar1728,auVar930,auVar664);
  dVar4 = in_RDX[6];
  auVar665._8_8_ = 0;
  auVar665._0_8_ = dVar4;
  auVar2006._8_8_ = 0;
  auVar2006._0_8_ = *in_R9 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2006,auVar665,auVar9);
  auVar666._8_8_ = 0;
  auVar666._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar666,auVar1175,auVar9);
  auVar1176._8_8_ = 0;
  auVar1176._0_8_ = in_R9[7];
  auVar1729._8_8_ = 0;
  auVar1729._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1729,auVar1176,auVar9);
  dVar4 = in_RDX[7];
  auVar667._8_8_ = 0;
  auVar667._0_8_ = dVar4;
  auVar2007._8_8_ = 0;
  auVar2007._0_8_ = in_R9[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2007,auVar667,auVar9);
  auVar668._8_8_ = 0;
  auVar668._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar668,auVar1176,auVar9);
  auVar1177._8_8_ = 0;
  auVar1177._0_8_ = in_R9[8];
  auVar401._8_8_ = 0;
  auVar401._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar401,auVar1177,auVar9);
  dVar2 = in_RDX[8];
  auVar669._8_8_ = 0;
  auVar669._0_8_ = dVar2;
  auVar931._8_8_ = 0;
  auVar931._0_8_ = in_R9[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar931,auVar669,auVar9);
  auVar402._8_8_ = 0;
  auVar402._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar402,auVar1177,auVar9);
  auVar670._8_8_ = 0;
  auVar670._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar670,auVar1849,auVar9);
  auVar403._8_8_ = 0;
  auVar403._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar403,auVar1935,auVar9);
  *(long *)(ctx + 0x6048) = auVar9._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[2];
  auVar1178._8_8_ = 0;
  auVar1178._0_8_ = in_R8[6];
  auVar932._8_8_ = 0;
  auVar932._0_8_ = in_R8[2];
  auVar1850._8_8_ = 0;
  auVar1850._0_8_ = *in_R8;
  dVar3 = in_RDX[1];
  auVar1936._8_8_ = 0;
  auVar1936._0_8_ = in_R8[1];
  auVar671._8_8_ = 0;
  auVar671._0_8_ = dVar2 + dVar2;
  auVar1730._8_8_ = 0;
  auVar1730._0_8_ = dVar1 * -2.0 * in_R8[6];
  auVar9 = vfmadd231sd_fma(auVar1730,auVar932,auVar671);
  dVar4 = in_RDX[6];
  auVar672._8_8_ = 0;
  auVar672._0_8_ = dVar4;
  auVar2008._8_8_ = 0;
  auVar2008._0_8_ = *in_R8 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2008,auVar672,auVar9);
  auVar673._8_8_ = 0;
  auVar673._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar673,auVar1178,auVar9);
  auVar1179._8_8_ = 0;
  auVar1179._0_8_ = in_R8[7];
  auVar1731._8_8_ = 0;
  auVar1731._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1731,auVar1179,auVar9);
  dVar4 = in_RDX[7];
  auVar674._8_8_ = 0;
  auVar674._0_8_ = dVar4;
  auVar2009._8_8_ = 0;
  auVar2009._0_8_ = in_R8[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2009,auVar674,auVar9);
  auVar675._8_8_ = 0;
  auVar675._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar675,auVar1179,auVar9);
  auVar1180._8_8_ = 0;
  auVar1180._0_8_ = in_R8[8];
  auVar404._8_8_ = 0;
  auVar404._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar404,auVar1180,auVar9);
  dVar2 = in_RDX[8];
  auVar676._8_8_ = 0;
  auVar676._0_8_ = dVar2;
  auVar933._8_8_ = 0;
  auVar933._0_8_ = in_R8[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar933,auVar676,auVar9);
  auVar405._8_8_ = 0;
  auVar405._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar405,auVar1180,auVar9);
  auVar677._8_8_ = 0;
  auVar677._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar677,auVar1850,auVar9);
  auVar406._8_8_ = 0;
  auVar406._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar406,auVar1936,auVar9);
  *(long *)(ctx + 25000) = auVar9._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[2];
  auVar1181._8_8_ = 0;
  auVar1181._0_8_ = in_RCX[6];
  auVar934._8_8_ = 0;
  auVar934._0_8_ = in_RCX[2];
  auVar1851._8_8_ = 0;
  auVar1851._0_8_ = *in_RCX;
  dVar3 = in_RDX[1];
  auVar1937._8_8_ = 0;
  auVar1937._0_8_ = in_RCX[1];
  auVar678._8_8_ = 0;
  auVar678._0_8_ = dVar2 + dVar2;
  auVar1732._8_8_ = 0;
  auVar1732._0_8_ = dVar1 * -2.0 * in_RCX[6];
  auVar9 = vfmadd231sd_fma(auVar1732,auVar934,auVar678);
  dVar4 = in_RDX[6];
  auVar679._8_8_ = 0;
  auVar679._0_8_ = dVar4;
  auVar2010._8_8_ = 0;
  auVar2010._0_8_ = *in_RCX * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2010,auVar679,auVar9);
  auVar680._8_8_ = 0;
  auVar680._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar680,auVar1181,auVar9);
  auVar1182._8_8_ = 0;
  auVar1182._0_8_ = in_RCX[7];
  auVar1733._8_8_ = 0;
  auVar1733._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1733,auVar1182,auVar9);
  dVar4 = in_RDX[7];
  auVar681._8_8_ = 0;
  auVar681._0_8_ = dVar4;
  auVar2011._8_8_ = 0;
  auVar2011._0_8_ = in_RCX[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar2011,auVar681,auVar9);
  auVar682._8_8_ = 0;
  auVar682._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar682,auVar1182,auVar9);
  auVar1183._8_8_ = 0;
  auVar1183._0_8_ = in_RCX[8];
  auVar407._8_8_ = 0;
  auVar407._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar407,auVar1183,auVar9);
  dVar2 = in_RDX[8];
  auVar683._8_8_ = 0;
  auVar683._0_8_ = dVar2;
  auVar935._8_8_ = 0;
  auVar935._0_8_ = in_RCX[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar935,auVar683,auVar9);
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar408,auVar1183,auVar9);
  auVar684._8_8_ = 0;
  auVar684._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar684,auVar1851,auVar9);
  auVar409._8_8_ = 0;
  auVar409._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar409,auVar1937,auVar9);
  *(long *)(ctx + 0x6308) = auVar9._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = in_RDX[2];
  dVar3 = *in_RDX;
  dVar4 = in_RDX[6];
  auVar1404._8_8_ = 0;
  auVar1404._0_8_ = dVar4;
  dVar5 = in_RDX[7];
  auVar1582._8_8_ = 0;
  auVar1582._0_8_ = dVar5;
  dVar6 = in_RDX[8];
  auVar1734._8_8_ = 0;
  auVar1734._0_8_ = dVar6;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = dVar3 * -2.0;
  auVar936._8_8_ = 0;
  auVar936._0_8_ =
       dVar1 * dVar1 + dVar2 * dVar2 + dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6 + dVar3 * dVar3
  ;
  auVar9 = vfmadd213sd_fma(auVar410,auVar1404,auVar936);
  auVar685._8_8_ = 0;
  auVar685._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar685,auVar1582,auVar9);
  auVar411._8_8_ = 0;
  auVar411._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar411,auVar1734,auVar9);
  *(long *)(ctx + 0x6468) = auVar9._0_8_;
  dVar1 = *in_RSI;
  auVar1184._8_8_ = 0;
  auVar1184._0_8_ = in_stack_00000008[6];
  dVar2 = in_RSI[1];
  auVar1583._8_8_ = 0;
  auVar1583._0_8_ = in_stack_00000008[1];
  auVar1852._8_8_ = 0;
  auVar1852._0_8_ = in_stack_00000008[2];
  auVar412._8_8_ = 0;
  auVar412._0_8_ = *in_stack_00000008 * (dVar1 + dVar1);
  auVar937._8_8_ = 0;
  auVar937._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd231sd_fma(auVar412,auVar1184,auVar937);
  auVar938._8_8_ = 0;
  auVar938._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar938,auVar1583,auVar9);
  dVar1 = in_RSI[2];
  auVar1735._8_8_ = 0;
  auVar1735._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar1735,auVar1852,auVar9);
  dVar3 = in_RSI[6];
  auVar939._8_8_ = 0;
  auVar939._0_8_ = dVar3;
  auVar1405._8_8_ = 0;
  auVar1405._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1405,auVar939,auVar9);
  auVar940._8_8_ = 0;
  auVar940._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar940,auVar1184,auVar9);
  auVar1185._8_8_ = 0;
  auVar1185._0_8_ = in_stack_00000008[7];
  auVar686._8_8_ = 0;
  auVar686._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar686,auVar1185,auVar9);
  dVar2 = in_RSI[7];
  auVar941._8_8_ = 0;
  auVar941._0_8_ = dVar2;
  auVar1406._8_8_ = 0;
  auVar1406._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1406,auVar941,auVar9);
  auVar942._8_8_ = 0;
  auVar942._0_8_ = in_stack_00000008[8];
  auVar687._8_8_ = 0;
  auVar687._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar687,auVar1185,auVar9);
  auVar413._8_8_ = 0;
  auVar413._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar413,auVar942,auVar9);
  dVar1 = in_RSI[8];
  auVar688._8_8_ = 0;
  auVar688._0_8_ = dVar1;
  auVar1186._8_8_ = 0;
  auVar1186._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1186,auVar688,auVar9);
  auVar414._8_8_ = 0;
  auVar414._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar414,auVar942,auVar9);
  *(long *)(ctx + 0x65c8) = auVar9._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar1407._8_8_ = 0;
  auVar1407._0_8_ = *in_R9;
  auVar1853._8_8_ = 0;
  auVar1853._0_8_ = in_R9[2];
  auVar943._8_8_ = 0;
  auVar943._0_8_ = dVar2 + dVar2;
  auVar1187._8_8_ = 0;
  auVar1187._0_8_ = (dVar1 + dVar1) * in_R9[1];
  auVar9 = vfmadd231sd_fma(auVar1187,auVar1407,auVar943);
  dVar3 = in_RSI[2];
  auVar1736._8_8_ = 0;
  auVar1736._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1736,auVar1853,auVar9);
  dVar4 = in_RSI[6];
  auVar1188._8_8_ = 0;
  auVar1188._0_8_ = dVar4;
  auVar1408._8_8_ = 0;
  auVar1408._0_8_ = *in_R9 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1408,auVar1188,auVar9);
  auVar1737._8_8_ = 0;
  auVar1737._0_8_ = in_R9[6];
  auVar1189._8_8_ = 0;
  auVar1189._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1189,auVar1737,auVar9);
  auVar1409._8_8_ = 0;
  auVar1409._0_8_ = in_R9[7];
  auVar689._8_8_ = 0;
  auVar689._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar689,auVar1409,auVar9);
  dVar1 = in_RSI[7];
  auVar1190._8_8_ = 0;
  auVar1190._0_8_ = dVar1;
  auVar1584._8_8_ = 0;
  auVar1584._0_8_ = in_R9[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1584,auVar1190,auVar9);
  auVar1191._8_8_ = 0;
  auVar1191._0_8_ = in_R9[8];
  auVar690._8_8_ = 0;
  auVar690._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar690,auVar1409,auVar9);
  auVar944._8_8_ = 0;
  auVar944._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar944,auVar1191,auVar9);
  dVar1 = in_RSI[8];
  auVar691._8_8_ = 0;
  auVar691._0_8_ = dVar1;
  auVar1410._8_8_ = 0;
  auVar1410._0_8_ = in_R9[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1410,auVar691,auVar9);
  auVar692._8_8_ = 0;
  auVar692._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar692,auVar1191,auVar9);
  auVar415._8_8_ = 0;
  auVar415._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar415,auVar1737,auVar9);
  *(long *)(ctx + 0x6728) = auVar9._0_8_;
  dVar1 = *in_RSI;
  auVar1192._8_8_ = 0;
  auVar1192._0_8_ = in_R8[6];
  dVar2 = in_RSI[1];
  auVar1585._8_8_ = 0;
  auVar1585._0_8_ = in_R8[1];
  auVar1854._8_8_ = 0;
  auVar1854._0_8_ = in_R8[2];
  auVar416._8_8_ = 0;
  auVar416._0_8_ = *in_R8 * (dVar1 + dVar1);
  auVar945._8_8_ = 0;
  auVar945._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd231sd_fma(auVar416,auVar1192,auVar945);
  auVar946._8_8_ = 0;
  auVar946._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar946,auVar1585,auVar9);
  dVar1 = in_RSI[2];
  auVar1738._8_8_ = 0;
  auVar1738._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar1738,auVar1854,auVar9);
  dVar3 = in_RSI[6];
  auVar947._8_8_ = 0;
  auVar947._0_8_ = dVar3;
  auVar1411._8_8_ = 0;
  auVar1411._0_8_ = *in_R8 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1411,auVar947,auVar9);
  auVar948._8_8_ = 0;
  auVar948._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar948,auVar1192,auVar9);
  auVar1193._8_8_ = 0;
  auVar1193._0_8_ = in_R8[7];
  auVar693._8_8_ = 0;
  auVar693._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar693,auVar1193,auVar9);
  dVar2 = in_RSI[7];
  auVar949._8_8_ = 0;
  auVar949._0_8_ = dVar2;
  auVar1412._8_8_ = 0;
  auVar1412._0_8_ = in_R8[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1412,auVar949,auVar9);
  auVar950._8_8_ = 0;
  auVar950._0_8_ = in_R8[8];
  auVar694._8_8_ = 0;
  auVar694._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar694,auVar1193,auVar9);
  auVar417._8_8_ = 0;
  auVar417._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar417,auVar950,auVar9);
  dVar1 = in_RSI[8];
  auVar695._8_8_ = 0;
  auVar695._0_8_ = dVar1;
  auVar1194._8_8_ = 0;
  auVar1194._0_8_ = in_R8[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1194,auVar695,auVar9);
  auVar418._8_8_ = 0;
  auVar418._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar418,auVar950,auVar9);
  *(long *)(ctx + 0x6888) = auVar9._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar1413._8_8_ = 0;
  auVar1413._0_8_ = *in_RCX;
  auVar1855._8_8_ = 0;
  auVar1855._0_8_ = in_RCX[2];
  auVar951._8_8_ = 0;
  auVar951._0_8_ = dVar2 + dVar2;
  auVar1195._8_8_ = 0;
  auVar1195._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar9 = vfmadd231sd_fma(auVar1195,auVar1413,auVar951);
  dVar3 = in_RSI[2];
  auVar1739._8_8_ = 0;
  auVar1739._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1739,auVar1855,auVar9);
  dVar4 = in_RSI[6];
  auVar1196._8_8_ = 0;
  auVar1196._0_8_ = dVar4;
  auVar1414._8_8_ = 0;
  auVar1414._0_8_ = *in_RCX * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1414,auVar1196,auVar9);
  auVar1740._8_8_ = 0;
  auVar1740._0_8_ = in_RCX[6];
  auVar1197._8_8_ = 0;
  auVar1197._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1197,auVar1740,auVar9);
  auVar1415._8_8_ = 0;
  auVar1415._0_8_ = in_RCX[7];
  auVar696._8_8_ = 0;
  auVar696._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar696,auVar1415,auVar9);
  dVar1 = in_RSI[7];
  auVar1198._8_8_ = 0;
  auVar1198._0_8_ = dVar1;
  auVar1586._8_8_ = 0;
  auVar1586._0_8_ = in_RCX[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1586,auVar1198,auVar9);
  auVar1199._8_8_ = 0;
  auVar1199._0_8_ = in_RCX[8];
  auVar697._8_8_ = 0;
  auVar697._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar697,auVar1415,auVar9);
  auVar952._8_8_ = 0;
  auVar952._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar952,auVar1199,auVar9);
  dVar1 = in_RSI[8];
  auVar698._8_8_ = 0;
  auVar698._0_8_ = dVar1;
  auVar1416._8_8_ = 0;
  auVar1416._0_8_ = in_RCX[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1416,auVar698,auVar9);
  auVar699._8_8_ = 0;
  auVar699._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar699,auVar1199,auVar9);
  auVar419._8_8_ = 0;
  auVar419._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar419,auVar1740,auVar9);
  *(long *)(ctx + 0x69e8) = auVar9._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar1417._8_8_ = 0;
  auVar1417._0_8_ = *in_RDX;
  auVar1856._8_8_ = 0;
  auVar1856._0_8_ = in_RDX[2];
  auVar953._8_8_ = 0;
  auVar953._0_8_ = dVar2 + dVar2;
  auVar1200._8_8_ = 0;
  auVar1200._0_8_ = (dVar1 + dVar1) * in_RDX[1];
  auVar9 = vfmadd231sd_fma(auVar1200,auVar1417,auVar953);
  dVar3 = in_RSI[2];
  auVar1741._8_8_ = 0;
  auVar1741._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1741,auVar1856,auVar9);
  dVar4 = in_RSI[6];
  auVar1201._8_8_ = 0;
  auVar1201._0_8_ = dVar4;
  auVar1418._8_8_ = 0;
  auVar1418._0_8_ = *in_RDX * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1418,auVar1201,auVar9);
  auVar1742._8_8_ = 0;
  auVar1742._0_8_ = in_RDX[6];
  auVar1202._8_8_ = 0;
  auVar1202._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1202,auVar1742,auVar9);
  auVar1419._8_8_ = 0;
  auVar1419._0_8_ = in_RDX[7];
  auVar700._8_8_ = 0;
  auVar700._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar700,auVar1419,auVar9);
  dVar1 = in_RSI[7];
  auVar1203._8_8_ = 0;
  auVar1203._0_8_ = dVar1;
  auVar1587._8_8_ = 0;
  auVar1587._0_8_ = in_RDX[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1587,auVar1203,auVar9);
  auVar1204._8_8_ = 0;
  auVar1204._0_8_ = in_RDX[8];
  auVar701._8_8_ = 0;
  auVar701._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar701,auVar1419,auVar9);
  auVar954._8_8_ = 0;
  auVar954._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar954,auVar1204,auVar9);
  dVar1 = in_RSI[8];
  auVar702._8_8_ = 0;
  auVar702._0_8_ = dVar1;
  auVar1420._8_8_ = 0;
  auVar1420._0_8_ = in_RDX[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1420,auVar702,auVar9);
  auVar703._8_8_ = 0;
  auVar703._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar703,auVar1204,auVar9);
  auVar420._8_8_ = 0;
  auVar420._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar420,auVar1742,auVar9);
  *(long *)(ctx + 0x6b48) = auVar9._0_8_;
  dVar1 = in_RSI[2];
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  dVar4 = in_RSI[6];
  auVar704._8_8_ = 0;
  auVar704._0_8_ = dVar4;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = dVar1 * dVar1 - auVar8._0_8_ * auVar8._0_8_;
  auVar1421._8_8_ = 0;
  auVar1421._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1421,auVar704,auVar225);
  dVar5 = in_RSI[7];
  auVar705._8_8_ = 0;
  auVar705._0_8_ = dVar5;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = auVar9._0_8_ + dVar4 * dVar4;
  auVar1422._8_8_ = 0;
  auVar1422._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1422,auVar705,auVar226);
  dVar4 = in_RSI[8];
  auVar706._8_8_ = 0;
  auVar706._0_8_ = dVar4;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = auVar9._0_8_ + dVar5 * dVar5;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar421,auVar706,auVar227);
  *(double *)(ctx + 0x6ca8) = dVar3 * dVar3 + dVar2 * dVar2 + dVar4 * dVar4 + auVar9._0_8_;
  dVar1 = in_stack_00000008[1];
  dVar2 = in_stack_00000008[2];
  dVar3 = *in_stack_00000008;
  dVar4 = in_stack_00000008[9];
  auVar1205._8_8_ = 0;
  auVar1205._0_8_ = dVar4;
  dVar5 = in_stack_00000008[10];
  auVar1423._8_8_ = 0;
  auVar1423._0_8_ = dVar5;
  dVar6 = in_stack_00000008[0xb];
  auVar1588._8_8_ = 0;
  auVar1588._0_8_ = dVar6;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = dVar3 * -2.0;
  auVar707._8_8_ = 0;
  auVar707._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar9 = vfmadd213sd_fma(auVar228,auVar1205,auVar707);
  auVar422._8_8_ = 0;
  auVar422._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar422,auVar1423,auVar9);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar229,auVar1588,auVar9);
  *(long *)(ctx + 0x5130) = auVar9._0_8_;
  dVar1 = in_R9[2];
  dVar2 = in_R9[1];
  auVar1206._8_8_ = 0;
  auVar1206._0_8_ = in_stack_00000008[1];
  dVar3 = *in_R9;
  auVar955._8_8_ = 0;
  auVar955._0_8_ = *in_stack_00000008;
  auVar708._8_8_ = 0;
  auVar708._0_8_ = dVar2 + dVar2;
  auVar1589._8_8_ = 0;
  auVar1589._0_8_ = (dVar1 + dVar1) * in_stack_00000008[2];
  auVar9 = vfmadd231sd_fma(auVar1589,auVar1206,auVar708);
  auVar709._8_8_ = 0;
  auVar709._0_8_ = in_stack_00000008[9];
  auVar1857._8_8_ = 0;
  auVar1857._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1857,auVar709,auVar9);
  dVar4 = in_R9[9];
  auVar1590._8_8_ = 0;
  auVar1590._0_8_ = dVar4;
  auVar1938._8_8_ = 0;
  auVar1938._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1938,auVar1590,auVar9);
  auVar1591._8_8_ = 0;
  auVar1591._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1591,auVar709,auVar9);
  auVar710._8_8_ = 0;
  auVar710._0_8_ = in_stack_00000008[10];
  auVar423._8_8_ = 0;
  auVar423._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar423,auVar710,auVar9);
  dVar2 = in_R9[10];
  auVar1592._8_8_ = 0;
  auVar1592._0_8_ = dVar2;
  auVar1207._8_8_ = 0;
  auVar1207._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1207,auVar1592,auVar9);
  auVar424._8_8_ = 0;
  auVar424._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar424,auVar710,auVar9);
  auVar711._8_8_ = 0;
  auVar711._0_8_ = in_stack_00000008[0xb];
  auVar1208._8_8_ = 0;
  auVar1208._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1208,auVar711,auVar9);
  dVar1 = in_R9[0xb];
  auVar425._8_8_ = 0;
  auVar425._0_8_ = dVar1;
  auVar1424._8_8_ = 0;
  auVar1424._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1424,auVar425,auVar9);
  auVar426._8_8_ = 0;
  auVar426._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar426,auVar711,auVar9);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar230,auVar955,auVar9);
  *(long *)(ctx + 0x5290) = auVar9._0_8_;
  dVar1 = in_R9[1];
  dVar2 = in_R9[2];
  dVar3 = *in_R9;
  dVar4 = in_R9[9];
  auVar1209._8_8_ = 0;
  auVar1209._0_8_ = dVar4;
  dVar5 = in_R9[10];
  auVar1425._8_8_ = 0;
  auVar1425._0_8_ = dVar5;
  dVar6 = in_R9[0xb];
  auVar1593._8_8_ = 0;
  auVar1593._0_8_ = dVar6;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = dVar3 * -2.0;
  auVar712._8_8_ = 0;
  auVar712._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar9 = vfmadd213sd_fma(auVar231,auVar1209,auVar712);
  auVar427._8_8_ = 0;
  auVar427._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar427,auVar1425,auVar9);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar232,auVar1593,auVar9);
  *(long *)(ctx + 0x53f0) = auVar9._0_8_;
  dVar1 = in_R8[2];
  dVar2 = in_R8[1];
  auVar1210._8_8_ = 0;
  auVar1210._0_8_ = in_stack_00000008[1];
  dVar3 = *in_R8;
  auVar956._8_8_ = 0;
  auVar956._0_8_ = *in_stack_00000008;
  auVar713._8_8_ = 0;
  auVar713._0_8_ = dVar2 + dVar2;
  auVar1594._8_8_ = 0;
  auVar1594._0_8_ = (dVar1 + dVar1) * in_stack_00000008[2];
  auVar9 = vfmadd231sd_fma(auVar1594,auVar1210,auVar713);
  auVar714._8_8_ = 0;
  auVar714._0_8_ = in_stack_00000008[9];
  auVar1858._8_8_ = 0;
  auVar1858._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1858,auVar714,auVar9);
  dVar4 = in_R8[9];
  auVar1595._8_8_ = 0;
  auVar1595._0_8_ = dVar4;
  auVar1939._8_8_ = 0;
  auVar1939._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1939,auVar1595,auVar9);
  auVar1596._8_8_ = 0;
  auVar1596._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1596,auVar714,auVar9);
  auVar715._8_8_ = 0;
  auVar715._0_8_ = in_stack_00000008[10];
  auVar428._8_8_ = 0;
  auVar428._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar428,auVar715,auVar9);
  dVar2 = in_R8[10];
  auVar1597._8_8_ = 0;
  auVar1597._0_8_ = dVar2;
  auVar1211._8_8_ = 0;
  auVar1211._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1211,auVar1597,auVar9);
  auVar429._8_8_ = 0;
  auVar429._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar429,auVar715,auVar9);
  auVar716._8_8_ = 0;
  auVar716._0_8_ = in_stack_00000008[0xb];
  auVar1212._8_8_ = 0;
  auVar1212._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1212,auVar716,auVar9);
  dVar1 = in_R8[0xb];
  auVar430._8_8_ = 0;
  auVar430._0_8_ = dVar1;
  auVar1426._8_8_ = 0;
  auVar1426._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1426,auVar430,auVar9);
  auVar431._8_8_ = 0;
  auVar431._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar431,auVar716,auVar9);
  auVar233._8_8_ = 0;
  auVar233._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar233,auVar956,auVar9);
  *(long *)(ctx + 0x5550) = auVar9._0_8_;
  dVar1 = in_R8[2];
  dVar2 = in_R8[1];
  auVar1213._8_8_ = 0;
  auVar1213._0_8_ = in_R9[1];
  dVar3 = *in_R8;
  auVar957._8_8_ = 0;
  auVar957._0_8_ = *in_R9;
  auVar717._8_8_ = 0;
  auVar717._0_8_ = dVar2 + dVar2;
  auVar1598._8_8_ = 0;
  auVar1598._0_8_ = (dVar1 + dVar1) * in_R9[2];
  auVar9 = vfmadd231sd_fma(auVar1598,auVar1213,auVar717);
  auVar718._8_8_ = 0;
  auVar718._0_8_ = in_R9[9];
  auVar1859._8_8_ = 0;
  auVar1859._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1859,auVar718,auVar9);
  dVar4 = in_R8[9];
  auVar1599._8_8_ = 0;
  auVar1599._0_8_ = dVar4;
  auVar1940._8_8_ = 0;
  auVar1940._0_8_ = *in_R9 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1940,auVar1599,auVar9);
  auVar1600._8_8_ = 0;
  auVar1600._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1600,auVar718,auVar9);
  auVar719._8_8_ = 0;
  auVar719._0_8_ = in_R9[10];
  auVar432._8_8_ = 0;
  auVar432._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar432,auVar719,auVar9);
  dVar2 = in_R8[10];
  auVar1601._8_8_ = 0;
  auVar1601._0_8_ = dVar2;
  auVar1214._8_8_ = 0;
  auVar1214._0_8_ = in_R9[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1214,auVar1601,auVar9);
  auVar433._8_8_ = 0;
  auVar433._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar433,auVar719,auVar9);
  auVar720._8_8_ = 0;
  auVar720._0_8_ = in_R9[0xb];
  auVar1215._8_8_ = 0;
  auVar1215._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1215,auVar720,auVar9);
  dVar1 = in_R8[0xb];
  auVar434._8_8_ = 0;
  auVar434._0_8_ = dVar1;
  auVar1427._8_8_ = 0;
  auVar1427._0_8_ = in_R9[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1427,auVar434,auVar9);
  auVar435._8_8_ = 0;
  auVar435._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar435,auVar720,auVar9);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar234,auVar957,auVar9);
  *(long *)(ctx + 0x56b0) = auVar9._0_8_;
  dVar1 = *in_R8;
  dVar2 = in_R8[1];
  dVar3 = in_R8[9];
  auVar958._8_8_ = 0;
  auVar958._0_8_ = dVar3;
  auVar721._8_8_ = 0;
  auVar721._0_8_ = dVar1 * -2.0;
  auVar1216._8_8_ = 0;
  auVar1216._0_8_ = dVar2 * dVar2;
  auVar9 = vfmadd231sd_fma(auVar1216,auVar958,auVar721);
  dVar4 = in_R8[2];
  dVar5 = in_R8[10];
  auVar1217._8_8_ = 0;
  auVar1217._0_8_ = dVar5;
  dVar6 = in_R8[0xb];
  auVar1428._8_8_ = 0;
  auVar1428._0_8_ = dVar6;
  auVar235._8_8_ = 0;
  auVar235._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar3 * dVar3 + auVar9._0_8_ + dVar4 * dVar4 + dVar1 * dVar1;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar436,auVar1217,auVar235);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = dVar4 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar236,auVar1428,auVar9);
  *(long *)(ctx + 0x5810) = auVar9._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  auVar959._8_8_ = 0;
  auVar959._0_8_ = in_stack_00000008[9];
  auVar1860._8_8_ = 0;
  auVar1860._0_8_ = in_stack_00000008[2];
  auVar1429._8_8_ = 0;
  auVar1429._0_8_ = *in_stack_00000008;
  auVar722._8_8_ = 0;
  auVar722._0_8_ = dVar2 * -2.0;
  auVar1218._8_8_ = 0;
  auVar1218._0_8_ = (dVar1 + dVar1) * in_stack_00000008[1];
  auVar9 = vfmadd231sd_fma(auVar1218,auVar959,auVar722);
  dVar3 = in_RCX[2];
  auVar1743._8_8_ = 0;
  auVar1743._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1743,auVar1860,auVar9);
  dVar4 = in_RCX[9];
  auVar1219._8_8_ = 0;
  auVar1219._0_8_ = dVar4;
  auVar1941._8_8_ = 0;
  auVar1941._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1941,auVar1219,auVar9);
  auVar1220._8_8_ = 0;
  auVar1220._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1220,auVar959,auVar9);
  auVar960._8_8_ = 0;
  auVar960._0_8_ = in_stack_00000008[10];
  auVar437._8_8_ = 0;
  auVar437._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar437,auVar960,auVar9);
  dVar1 = in_RCX[10];
  auVar1221._8_8_ = 0;
  auVar1221._0_8_ = dVar1;
  auVar1602._8_8_ = 0;
  auVar1602._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1602,auVar1221,auVar9);
  auVar438._8_8_ = 0;
  auVar438._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar438,auVar960,auVar9);
  auVar961._8_8_ = 0;
  auVar961._0_8_ = in_stack_00000008[0xb];
  auVar723._8_8_ = 0;
  auVar723._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar723,auVar961,auVar9);
  dVar1 = in_RCX[0xb];
  auVar439._8_8_ = 0;
  auVar439._0_8_ = dVar1;
  auVar1222._8_8_ = 0;
  auVar1222._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1222,auVar439,auVar9);
  auVar440._8_8_ = 0;
  auVar440._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar440,auVar961,auVar9);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar237,auVar1429,auVar9);
  *(long *)(ctx + 0x5970) = auVar9._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  auVar962._8_8_ = 0;
  auVar962._0_8_ = in_R9[9];
  auVar1861._8_8_ = 0;
  auVar1861._0_8_ = in_R9[2];
  auVar1430._8_8_ = 0;
  auVar1430._0_8_ = *in_R9;
  auVar724._8_8_ = 0;
  auVar724._0_8_ = dVar2 * -2.0;
  auVar1223._8_8_ = 0;
  auVar1223._0_8_ = (dVar1 + dVar1) * in_R9[1];
  auVar9 = vfmadd231sd_fma(auVar1223,auVar962,auVar724);
  dVar3 = in_RCX[2];
  auVar1744._8_8_ = 0;
  auVar1744._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1744,auVar1861,auVar9);
  dVar4 = in_RCX[9];
  auVar1224._8_8_ = 0;
  auVar1224._0_8_ = dVar4;
  auVar1942._8_8_ = 0;
  auVar1942._0_8_ = *in_R9 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1942,auVar1224,auVar9);
  auVar1225._8_8_ = 0;
  auVar1225._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1225,auVar962,auVar9);
  auVar963._8_8_ = 0;
  auVar963._0_8_ = in_R9[10];
  auVar441._8_8_ = 0;
  auVar441._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar441,auVar963,auVar9);
  dVar1 = in_RCX[10];
  auVar1226._8_8_ = 0;
  auVar1226._0_8_ = dVar1;
  auVar1603._8_8_ = 0;
  auVar1603._0_8_ = in_R9[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1603,auVar1226,auVar9);
  auVar442._8_8_ = 0;
  auVar442._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar442,auVar963,auVar9);
  auVar964._8_8_ = 0;
  auVar964._0_8_ = in_R9[0xb];
  auVar725._8_8_ = 0;
  auVar725._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar725,auVar964,auVar9);
  dVar1 = in_RCX[0xb];
  auVar443._8_8_ = 0;
  auVar443._0_8_ = dVar1;
  auVar1227._8_8_ = 0;
  auVar1227._0_8_ = in_R9[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1227,auVar443,auVar9);
  auVar444._8_8_ = 0;
  auVar444._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar444,auVar964,auVar9);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar238,auVar1430,auVar9);
  *(long *)(ctx + 0x5ad0) = auVar9._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = *in_RCX;
  auVar965._8_8_ = 0;
  auVar965._0_8_ = in_R8[9];
  auVar1862._8_8_ = 0;
  auVar1862._0_8_ = in_R8[2];
  auVar1431._8_8_ = 0;
  auVar1431._0_8_ = *in_R8;
  auVar726._8_8_ = 0;
  auVar726._0_8_ = dVar2 * -2.0;
  auVar1228._8_8_ = 0;
  auVar1228._0_8_ = (dVar1 + dVar1) * in_R8[1];
  auVar9 = vfmadd231sd_fma(auVar1228,auVar965,auVar726);
  dVar3 = in_RCX[2];
  auVar1745._8_8_ = 0;
  auVar1745._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1745,auVar1862,auVar9);
  dVar4 = in_RCX[9];
  auVar1229._8_8_ = 0;
  auVar1229._0_8_ = dVar4;
  auVar1943._8_8_ = 0;
  auVar1943._0_8_ = *in_R8 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1943,auVar1229,auVar9);
  auVar1230._8_8_ = 0;
  auVar1230._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1230,auVar965,auVar9);
  auVar966._8_8_ = 0;
  auVar966._0_8_ = in_R8[10];
  auVar445._8_8_ = 0;
  auVar445._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar445,auVar966,auVar9);
  dVar1 = in_RCX[10];
  auVar1231._8_8_ = 0;
  auVar1231._0_8_ = dVar1;
  auVar1604._8_8_ = 0;
  auVar1604._0_8_ = in_R8[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1604,auVar1231,auVar9);
  auVar446._8_8_ = 0;
  auVar446._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar446,auVar966,auVar9);
  auVar967._8_8_ = 0;
  auVar967._0_8_ = in_R8[0xb];
  auVar727._8_8_ = 0;
  auVar727._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar727,auVar967,auVar9);
  dVar1 = in_RCX[0xb];
  auVar447._8_8_ = 0;
  auVar447._0_8_ = dVar1;
  auVar1232._8_8_ = 0;
  auVar1232._0_8_ = in_R8[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1232,auVar447,auVar9);
  auVar448._8_8_ = 0;
  auVar448._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar448,auVar967,auVar9);
  auVar239._8_8_ = 0;
  auVar239._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar239,auVar1431,auVar9);
  *(long *)(ctx + 0x5c30) = auVar9._0_8_;
  dVar1 = in_RCX[1];
  dVar2 = in_RCX[2];
  dVar3 = *in_RCX;
  dVar4 = in_RCX[9];
  auVar1233._8_8_ = 0;
  auVar1233._0_8_ = dVar4;
  dVar5 = in_RCX[10];
  auVar1432._8_8_ = 0;
  auVar1432._0_8_ = dVar5;
  dVar6 = in_RCX[0xb];
  auVar1605._8_8_ = 0;
  auVar1605._0_8_ = dVar6;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = dVar1 * -2.0;
  auVar728._8_8_ = 0;
  auVar728._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar9 = vfmadd213sd_fma(auVar449,auVar1432,auVar728);
  auVar729._8_8_ = 0;
  auVar729._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar729,auVar1605,auVar9);
  auVar240._8_8_ = 0;
  auVar240._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar240,auVar1233,auVar9);
  *(long *)(ctx + 0x5d90) = auVar9._0_8_;
  dVar1 = in_RDX[2];
  dVar2 = *in_RDX;
  auVar968._8_8_ = 0;
  auVar968._0_8_ = in_stack_00000008[9];
  auVar1746._8_8_ = 0;
  auVar1746._0_8_ = *in_stack_00000008;
  dVar3 = in_RDX[1];
  auVar1863._8_8_ = 0;
  auVar1863._0_8_ = in_stack_00000008[1];
  auVar730._8_8_ = 0;
  auVar730._0_8_ = dVar2 * -2.0;
  auVar1433._8_8_ = 0;
  auVar1433._0_8_ = (dVar1 + dVar1) * in_stack_00000008[2];
  auVar9 = vfmadd231sd_fma(auVar1433,auVar968,auVar730);
  dVar4 = in_RDX[9];
  auVar731._8_8_ = 0;
  auVar731._0_8_ = dVar4;
  auVar1944._8_8_ = 0;
  auVar1944._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1944,auVar731,auVar9);
  auVar732._8_8_ = 0;
  auVar732._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar732,auVar968,auVar9);
  auVar969._8_8_ = 0;
  auVar969._0_8_ = in_stack_00000008[10];
  auVar1434._8_8_ = 0;
  auVar1434._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1434,auVar969,auVar9);
  dVar4 = in_RDX[10];
  auVar733._8_8_ = 0;
  auVar733._0_8_ = dVar4;
  auVar1945._8_8_ = 0;
  auVar1945._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1945,auVar733,auVar9);
  auVar734._8_8_ = 0;
  auVar734._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar734,auVar969,auVar9);
  auVar970._8_8_ = 0;
  auVar970._0_8_ = in_stack_00000008[0xb];
  auVar1234._8_8_ = 0;
  auVar1234._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1234,auVar970,auVar9);
  dVar1 = in_RDX[0xb];
  auVar735._8_8_ = 0;
  auVar735._0_8_ = dVar1;
  auVar1435._8_8_ = 0;
  auVar1435._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1435,auVar735,auVar9);
  auVar736._8_8_ = 0;
  auVar736._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar736,auVar970,auVar9);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar241,auVar1746,auVar9);
  auVar450._8_8_ = 0;
  auVar450._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar450,auVar1863,auVar9);
  *(long *)(ctx + 0x5ef0) = auVar9._0_8_;
  dVar1 = in_RDX[2];
  dVar2 = *in_RDX;
  auVar971._8_8_ = 0;
  auVar971._0_8_ = in_R9[9];
  auVar1747._8_8_ = 0;
  auVar1747._0_8_ = *in_R9;
  dVar3 = in_RDX[1];
  auVar1864._8_8_ = 0;
  auVar1864._0_8_ = in_R9[1];
  auVar737._8_8_ = 0;
  auVar737._0_8_ = dVar2 * -2.0;
  auVar1436._8_8_ = 0;
  auVar1436._0_8_ = (dVar1 + dVar1) * in_R9[2];
  auVar9 = vfmadd231sd_fma(auVar1436,auVar971,auVar737);
  dVar4 = in_RDX[9];
  auVar738._8_8_ = 0;
  auVar738._0_8_ = dVar4;
  auVar1946._8_8_ = 0;
  auVar1946._0_8_ = *in_R9 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1946,auVar738,auVar9);
  auVar739._8_8_ = 0;
  auVar739._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar739,auVar971,auVar9);
  auVar972._8_8_ = 0;
  auVar972._0_8_ = in_R9[10];
  auVar1437._8_8_ = 0;
  auVar1437._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1437,auVar972,auVar9);
  dVar4 = in_RDX[10];
  auVar740._8_8_ = 0;
  auVar740._0_8_ = dVar4;
  auVar1947._8_8_ = 0;
  auVar1947._0_8_ = in_R9[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1947,auVar740,auVar9);
  auVar741._8_8_ = 0;
  auVar741._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar741,auVar972,auVar9);
  auVar973._8_8_ = 0;
  auVar973._0_8_ = in_R9[0xb];
  auVar1235._8_8_ = 0;
  auVar1235._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1235,auVar973,auVar9);
  dVar1 = in_RDX[0xb];
  auVar742._8_8_ = 0;
  auVar742._0_8_ = dVar1;
  auVar1438._8_8_ = 0;
  auVar1438._0_8_ = in_R9[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1438,auVar742,auVar9);
  auVar743._8_8_ = 0;
  auVar743._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar743,auVar973,auVar9);
  auVar242._8_8_ = 0;
  auVar242._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar242,auVar1747,auVar9);
  auVar451._8_8_ = 0;
  auVar451._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar451,auVar1864,auVar9);
  *(long *)(ctx + 0x6050) = auVar9._0_8_;
  dVar1 = in_RDX[2];
  dVar2 = *in_RDX;
  auVar974._8_8_ = 0;
  auVar974._0_8_ = in_R8[9];
  auVar1748._8_8_ = 0;
  auVar1748._0_8_ = *in_R8;
  dVar3 = in_RDX[1];
  auVar1865._8_8_ = 0;
  auVar1865._0_8_ = in_R8[1];
  auVar744._8_8_ = 0;
  auVar744._0_8_ = dVar2 * -2.0;
  auVar1439._8_8_ = 0;
  auVar1439._0_8_ = (dVar1 + dVar1) * in_R8[2];
  auVar9 = vfmadd231sd_fma(auVar1439,auVar974,auVar744);
  dVar4 = in_RDX[9];
  auVar745._8_8_ = 0;
  auVar745._0_8_ = dVar4;
  auVar1948._8_8_ = 0;
  auVar1948._0_8_ = *in_R8 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1948,auVar745,auVar9);
  auVar746._8_8_ = 0;
  auVar746._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar746,auVar974,auVar9);
  auVar975._8_8_ = 0;
  auVar975._0_8_ = in_R8[10];
  auVar1440._8_8_ = 0;
  auVar1440._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1440,auVar975,auVar9);
  dVar4 = in_RDX[10];
  auVar747._8_8_ = 0;
  auVar747._0_8_ = dVar4;
  auVar1949._8_8_ = 0;
  auVar1949._0_8_ = in_R8[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1949,auVar747,auVar9);
  auVar748._8_8_ = 0;
  auVar748._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar748,auVar975,auVar9);
  auVar976._8_8_ = 0;
  auVar976._0_8_ = in_R8[0xb];
  auVar1236._8_8_ = 0;
  auVar1236._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1236,auVar976,auVar9);
  dVar1 = in_RDX[0xb];
  auVar749._8_8_ = 0;
  auVar749._0_8_ = dVar1;
  auVar1441._8_8_ = 0;
  auVar1441._0_8_ = in_R8[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1441,auVar749,auVar9);
  auVar750._8_8_ = 0;
  auVar750._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar750,auVar976,auVar9);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar243,auVar1748,auVar9);
  auVar452._8_8_ = 0;
  auVar452._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar452,auVar1865,auVar9);
  *(long *)(ctx + 0x61b0) = auVar9._0_8_;
  auVar1442._8_8_ = 0;
  auVar1442._0_8_ = *in_RCX;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[9];
  auVar977._8_8_ = 0;
  auVar977._0_8_ = in_RCX[9];
  auVar1950._8_8_ = 0;
  auVar1950._0_8_ = in_RCX[2];
  dVar3 = in_RDX[1];
  auVar1606._8_8_ = 0;
  auVar1606._0_8_ = in_RCX[1];
  auVar751._8_8_ = 0;
  auVar751._0_8_ = dVar1 * -2.0;
  auVar1749._8_8_ = 0;
  auVar1749._0_8_ = *in_RCX * -2.0 * dVar2;
  auVar9 = vfmadd231sd_fma(auVar1749,auVar977,auVar751);
  dVar4 = in_RDX[2];
  auVar1866._8_8_ = 0;
  auVar1866._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1866,auVar1950,auVar9);
  auVar1237._8_8_ = 0;
  auVar1237._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar1237,auVar977,auVar9);
  auVar978._8_8_ = 0;
  auVar978._0_8_ = in_RCX[10];
  auVar1750._8_8_ = 0;
  auVar1750._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1750,auVar978,auVar9);
  dVar2 = in_RDX[10];
  auVar1238._8_8_ = 0;
  auVar1238._0_8_ = dVar2;
  auVar1867._8_8_ = 0;
  auVar1867._0_8_ = in_RCX[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1867,auVar1238,auVar9);
  auVar1239._8_8_ = 0;
  auVar1239._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar1239,auVar978,auVar9);
  auVar979._8_8_ = 0;
  auVar979._0_8_ = in_RCX[0xb];
  auVar752._8_8_ = 0;
  auVar752._0_8_ = dVar4 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar752,auVar979,auVar9);
  dVar2 = in_RDX[0xb];
  auVar1240._8_8_ = 0;
  auVar1240._0_8_ = dVar2;
  auVar1751._8_8_ = 0;
  auVar1751._0_8_ = in_RCX[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1751,auVar1240,auVar9);
  auVar753._8_8_ = 0;
  auVar753._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar753,auVar979,auVar9);
  auVar244._8_8_ = 0;
  auVar244._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar244,auVar1442,auVar9);
  auVar453._8_8_ = 0;
  auVar453._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar453,auVar1606,auVar9);
  *(long *)(ctx + 0x6310) = auVar9._0_8_;
  dVar1 = in_RDX[1];
  dVar2 = in_RDX[2];
  dVar3 = *in_RDX;
  dVar4 = in_RDX[9];
  auVar1241._8_8_ = 0;
  auVar1241._0_8_ = dVar4;
  dVar5 = in_RDX[10];
  auVar1443._8_8_ = 0;
  auVar1443._0_8_ = dVar5;
  dVar6 = in_RDX[0xb];
  auVar1607._8_8_ = 0;
  auVar1607._0_8_ = dVar6;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = dVar1 * -2.0;
  auVar754._8_8_ = 0;
  auVar754._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar9 = vfmadd213sd_fma(auVar454,auVar1443,auVar754);
  auVar755._8_8_ = 0;
  auVar755._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar755,auVar1607,auVar9);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar245,auVar1241,auVar9);
  *(long *)(ctx + 0x6470) = auVar9._0_8_;
  dVar1 = *in_RSI;
  auVar980._8_8_ = 0;
  auVar980._0_8_ = in_stack_00000008[9];
  dVar2 = in_RSI[1];
  auVar1444._8_8_ = 0;
  auVar1444._0_8_ = in_stack_00000008[1];
  auVar1752._8_8_ = 0;
  auVar1752._0_8_ = in_stack_00000008[2];
  auVar246._8_8_ = 0;
  auVar246._0_8_ = *in_stack_00000008 * (dVar1 + dVar1);
  auVar756._8_8_ = 0;
  auVar756._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd231sd_fma(auVar246,auVar980,auVar756);
  auVar757._8_8_ = 0;
  auVar757._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar757,auVar1444,auVar9);
  dVar1 = in_RSI[2];
  auVar1608._8_8_ = 0;
  auVar1608._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar1608,auVar1752,auVar9);
  dVar3 = in_RSI[9];
  auVar758._8_8_ = 0;
  auVar758._0_8_ = dVar3;
  auVar1242._8_8_ = 0;
  auVar1242._0_8_ = *in_stack_00000008 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1242,auVar758,auVar9);
  auVar759._8_8_ = 0;
  auVar759._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar759,auVar980,auVar9);
  auVar981._8_8_ = 0;
  auVar981._0_8_ = in_stack_00000008[10];
  auVar455._8_8_ = 0;
  auVar455._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar455,auVar981,auVar9);
  dVar2 = in_RSI[10];
  auVar760._8_8_ = 0;
  auVar760._0_8_ = dVar2;
  auVar1243._8_8_ = 0;
  auVar1243._0_8_ = in_stack_00000008[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1243,auVar760,auVar9);
  auVar761._8_8_ = 0;
  auVar761._0_8_ = in_stack_00000008[0xb];
  auVar456._8_8_ = 0;
  auVar456._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar456,auVar981,auVar9);
  auVar247._8_8_ = 0;
  auVar247._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar247,auVar761,auVar9);
  dVar1 = in_RSI[0xb];
  auVar457._8_8_ = 0;
  auVar457._0_8_ = dVar1;
  auVar982._8_8_ = 0;
  auVar982._0_8_ = in_stack_00000008[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar982,auVar457,auVar9);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar248,auVar761,auVar9);
  *(long *)(ctx + 0x65d0) = auVar9._0_8_;
  dVar1 = *in_RSI;
  auVar983._8_8_ = 0;
  auVar983._0_8_ = in_R9[9];
  dVar2 = in_RSI[1];
  auVar1445._8_8_ = 0;
  auVar1445._0_8_ = in_R9[1];
  auVar1753._8_8_ = 0;
  auVar1753._0_8_ = in_R9[2];
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *in_R9 * (dVar1 + dVar1);
  auVar762._8_8_ = 0;
  auVar762._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd231sd_fma(auVar249,auVar983,auVar762);
  auVar763._8_8_ = 0;
  auVar763._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar763,auVar1445,auVar9);
  dVar1 = in_RSI[2];
  auVar1609._8_8_ = 0;
  auVar1609._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar1609,auVar1753,auVar9);
  dVar3 = in_RSI[9];
  auVar764._8_8_ = 0;
  auVar764._0_8_ = dVar3;
  auVar1244._8_8_ = 0;
  auVar1244._0_8_ = *in_R9 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1244,auVar764,auVar9);
  auVar765._8_8_ = 0;
  auVar765._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar765,auVar983,auVar9);
  auVar984._8_8_ = 0;
  auVar984._0_8_ = in_R9[10];
  auVar458._8_8_ = 0;
  auVar458._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar458,auVar984,auVar9);
  dVar2 = in_RSI[10];
  auVar766._8_8_ = 0;
  auVar766._0_8_ = dVar2;
  auVar1245._8_8_ = 0;
  auVar1245._0_8_ = in_R9[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1245,auVar766,auVar9);
  auVar767._8_8_ = 0;
  auVar767._0_8_ = in_R9[0xb];
  auVar459._8_8_ = 0;
  auVar459._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar459,auVar984,auVar9);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar250,auVar767,auVar9);
  dVar1 = in_RSI[0xb];
  auVar460._8_8_ = 0;
  auVar460._0_8_ = dVar1;
  auVar985._8_8_ = 0;
  auVar985._0_8_ = in_R9[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar985,auVar460,auVar9);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar251,auVar767,auVar9);
  *(long *)(ctx + 0x6730) = auVar9._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar1246._8_8_ = 0;
  auVar1246._0_8_ = *in_R8;
  auVar1754._8_8_ = 0;
  auVar1754._0_8_ = in_R8[2];
  auVar1951._8_8_ = 0;
  auVar1951._0_8_ = in_R8[9];
  auVar768._8_8_ = 0;
  auVar768._0_8_ = dVar2 + dVar2;
  auVar986._8_8_ = 0;
  auVar986._0_8_ = (dVar1 + dVar1) * in_R8[1];
  auVar9 = vfmadd231sd_fma(auVar986,auVar1246,auVar768);
  dVar3 = in_RSI[2];
  auVar1610._8_8_ = 0;
  auVar1610._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1610,auVar1754,auVar9);
  dVar4 = in_RSI[9];
  auVar987._8_8_ = 0;
  auVar987._0_8_ = dVar4;
  auVar1868._8_8_ = 0;
  auVar1868._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1868,auVar1951,auVar9);
  auVar1611._8_8_ = 0;
  auVar1611._0_8_ = in_R8[10];
  auVar461._8_8_ = 0;
  auVar461._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar461,auVar1611,auVar9);
  dVar1 = in_RSI[10];
  auVar1869._8_8_ = 0;
  auVar1869._0_8_ = dVar1;
  auVar1446._8_8_ = 0;
  auVar1446._0_8_ = in_R8[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1446,auVar1869,auVar9);
  auVar462._8_8_ = 0;
  auVar462._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar462,auVar1611,auVar9);
  auVar1447._8_8_ = 0;
  auVar1447._0_8_ = in_R8[0xb];
  auVar769._8_8_ = 0;
  auVar769._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar769,auVar1447,auVar9);
  dVar1 = in_RSI[0xb];
  auVar463._8_8_ = 0;
  auVar463._0_8_ = dVar1;
  auVar1612._8_8_ = 0;
  auVar1612._0_8_ = in_R8[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1612,auVar463,auVar9);
  auVar464._8_8_ = 0;
  auVar464._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar464,auVar1447,auVar9);
  auVar770._8_8_ = 0;
  auVar770._0_8_ = *in_R8 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar770,auVar987,auVar9);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar252,auVar1951,auVar9);
  *(long *)(ctx + 0x6890) = auVar9._0_8_;
  dVar1 = in_RSI[1];
  dVar2 = *in_RSI;
  auVar1247._8_8_ = 0;
  auVar1247._0_8_ = *in_RCX;
  auVar1755._8_8_ = 0;
  auVar1755._0_8_ = in_RCX[2];
  auVar1952._8_8_ = 0;
  auVar1952._0_8_ = in_RCX[9];
  auVar771._8_8_ = 0;
  auVar771._0_8_ = dVar2 + dVar2;
  auVar988._8_8_ = 0;
  auVar988._0_8_ = (dVar1 + dVar1) * in_RCX[1];
  auVar9 = vfmadd231sd_fma(auVar988,auVar1247,auVar771);
  dVar3 = in_RSI[2];
  auVar1613._8_8_ = 0;
  auVar1613._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1613,auVar1755,auVar9);
  dVar4 = in_RSI[9];
  auVar989._8_8_ = 0;
  auVar989._0_8_ = dVar4;
  auVar1870._8_8_ = 0;
  auVar1870._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1870,auVar1952,auVar9);
  auVar1614._8_8_ = 0;
  auVar1614._0_8_ = in_RCX[10];
  auVar465._8_8_ = 0;
  auVar465._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar465,auVar1614,auVar9);
  dVar1 = in_RSI[10];
  auVar1871._8_8_ = 0;
  auVar1871._0_8_ = dVar1;
  auVar1448._8_8_ = 0;
  auVar1448._0_8_ = in_RCX[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1448,auVar1871,auVar9);
  auVar466._8_8_ = 0;
  auVar466._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar466,auVar1614,auVar9);
  auVar1449._8_8_ = 0;
  auVar1449._0_8_ = in_RCX[0xb];
  auVar772._8_8_ = 0;
  auVar772._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar772,auVar1449,auVar9);
  dVar1 = in_RSI[0xb];
  auVar467._8_8_ = 0;
  auVar467._0_8_ = dVar1;
  auVar1615._8_8_ = 0;
  auVar1615._0_8_ = in_RCX[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1615,auVar467,auVar9);
  auVar468._8_8_ = 0;
  auVar468._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar468,auVar1449,auVar9);
  auVar773._8_8_ = 0;
  auVar773._0_8_ = *in_RCX * -2.0;
  auVar9 = vfmadd213sd_fma(auVar773,auVar989,auVar9);
  auVar253._8_8_ = 0;
  auVar253._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar253,auVar1952,auVar9);
  *(long *)(ctx + 0x69f0) = auVar9._0_8_;
  dVar1 = *in_RSI;
  auVar990._8_8_ = 0;
  auVar990._0_8_ = in_RDX[9];
  dVar2 = in_RSI[1];
  auVar1450._8_8_ = 0;
  auVar1450._0_8_ = in_RDX[1];
  auVar1756._8_8_ = 0;
  auVar1756._0_8_ = in_RDX[2];
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *in_RDX * (dVar1 + dVar1);
  auVar774._8_8_ = 0;
  auVar774._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd231sd_fma(auVar254,auVar990,auVar774);
  auVar775._8_8_ = 0;
  auVar775._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar775,auVar1450,auVar9);
  dVar1 = in_RSI[2];
  auVar1616._8_8_ = 0;
  auVar1616._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar1616,auVar1756,auVar9);
  dVar3 = in_RSI[9];
  auVar776._8_8_ = 0;
  auVar776._0_8_ = dVar3;
  auVar1872._8_8_ = 0;
  auVar1872._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1872,auVar990,auVar9);
  auVar991._8_8_ = 0;
  auVar991._0_8_ = in_RDX[10];
  dVar3 = in_RSI[10];
  auVar1617._8_8_ = 0;
  auVar1617._0_8_ = dVar3;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar469,auVar991,auVar9);
  auVar1451._8_8_ = 0;
  auVar1451._0_8_ = in_RDX[1] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1451,auVar1617,auVar9);
  auVar470._8_8_ = 0;
  auVar470._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar470,auVar991,auVar9);
  auVar992._8_8_ = 0;
  auVar992._0_8_ = in_RDX[0xb];
  auVar255._8_8_ = 0;
  auVar255._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar255,auVar992,auVar9);
  dVar1 = in_RSI[0xb];
  auVar471._8_8_ = 0;
  auVar471._0_8_ = dVar1;
  auVar1452._8_8_ = 0;
  auVar1452._0_8_ = in_RDX[2] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1452,auVar471,auVar9);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar256,auVar992,auVar9);
  auVar472._8_8_ = 0;
  auVar472._0_8_ = *in_RDX * -2.0;
  auVar9 = vfmadd213sd_fma(auVar472,auVar776,auVar9);
  *(long *)(ctx + 0x6b50) = auVar9._0_8_;
  dVar1 = in_RSI[2];
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  dVar4 = in_RSI[9];
  auVar473._8_8_ = 0;
  auVar473._0_8_ = dVar4;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = dVar1 * dVar1 - auVar11._0_8_ * auVar11._0_8_;
  auVar1248._8_8_ = 0;
  auVar1248._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1248,auVar473,auVar130);
  dVar5 = in_RSI[10];
  auVar474._8_8_ = 0;
  auVar474._0_8_ = dVar5;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = auVar9._0_8_ + dVar4 * dVar4;
  auVar1249._8_8_ = 0;
  auVar1249._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1249,auVar474,auVar131);
  dVar4 = in_RSI[0xb];
  auVar475._8_8_ = 0;
  auVar475._0_8_ = dVar4;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = auVar9._0_8_ + dVar5 * dVar5;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar257,auVar475,auVar132);
  *(double *)(ctx + 0x6cb0) = dVar3 * dVar3 + dVar2 * dVar2 + dVar4 * dVar4 + auVar9._0_8_;
  dVar1 = in_stack_00000008[4];
  dVar2 = in_stack_00000008[5];
  dVar3 = in_stack_00000008[3];
  dVar4 = in_stack_00000008[6];
  auVar993._8_8_ = 0;
  auVar993._0_8_ = dVar4;
  dVar5 = in_stack_00000008[7];
  auVar1250._8_8_ = 0;
  auVar1250._0_8_ = dVar5;
  dVar6 = in_stack_00000008[8];
  auVar1453._8_8_ = 0;
  auVar1453._0_8_ = dVar6;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = dVar3 * -2.0;
  auVar476._8_8_ = 0;
  auVar476._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar9 = vfmadd213sd_fma(auVar133,auVar993,auVar476);
  auVar258._8_8_ = 0;
  auVar258._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar258,auVar1250,auVar9);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar134,auVar1453,auVar9);
  *(long *)(ctx + 0x5138) = auVar9._0_8_;
  dVar1 = in_R9[5];
  dVar2 = in_R9[4];
  auVar994._8_8_ = 0;
  auVar994._0_8_ = in_stack_00000008[4];
  auVar1873._8_8_ = 0;
  auVar1873._0_8_ = in_stack_00000008[6];
  auVar2012._8_8_ = 0;
  auVar2012._0_8_ = in_stack_00000008[7];
  dVar3 = in_R9[3];
  auVar777._8_8_ = 0;
  auVar777._0_8_ = in_stack_00000008[3];
  auVar477._8_8_ = 0;
  auVar477._0_8_ = dVar2 + dVar2;
  auVar1454._8_8_ = 0;
  auVar1454._0_8_ = (dVar1 + dVar1) * in_stack_00000008[5];
  auVar9 = vfmadd231sd_fma(auVar1454,auVar994,auVar477);
  dVar4 = in_R9[6];
  auVar478._8_8_ = 0;
  auVar478._0_8_ = dVar4;
  auVar1757._8_8_ = 0;
  auVar1757._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1757,auVar1873,auVar9);
  dVar4 = in_R9[7];
  auVar1455._8_8_ = 0;
  auVar1455._0_8_ = dVar4;
  auVar1953._8_8_ = 0;
  auVar1953._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1953,auVar2012,auVar9);
  auVar1758._8_8_ = 0;
  auVar1758._0_8_ = in_R9[8];
  auVar8 = vaddsd_avx512f(auVar1758,auVar1758);
  auVar2072._8_8_ = 0;
  auVar2072._0_8_ = in_stack_00000008[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2072,auVar9);
  auVar259._8_8_ = 0;
  auVar259._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar259,auVar2012,auVar9);
  auVar995._8_8_ = 0;
  auVar995._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar995,auVar1455,auVar9);
  auVar260._8_8_ = 0;
  auVar260._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar260,auVar1873,auVar9);
  auVar996._8_8_ = 0;
  auVar996._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar996,auVar478,auVar9);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar261,auVar2072,auVar9);
  auVar479._8_8_ = 0;
  auVar479._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar479,auVar1758,auVar9);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar135,auVar777,auVar9);
  *(long *)(ctx + 0x5298) = auVar9._0_8_;
  dVar1 = in_R9[4];
  dVar2 = in_R9[5];
  dVar3 = in_R9[3];
  dVar4 = in_R9[6];
  auVar997._8_8_ = 0;
  auVar997._0_8_ = dVar4;
  dVar5 = in_R9[7];
  auVar1251._8_8_ = 0;
  auVar1251._0_8_ = dVar5;
  dVar6 = in_R9[8];
  auVar1456._8_8_ = 0;
  auVar1456._0_8_ = dVar6;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar3 * -2.0;
  auVar480._8_8_ = 0;
  auVar480._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar9 = vfmadd213sd_fma(auVar136,auVar997,auVar480);
  auVar262._8_8_ = 0;
  auVar262._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar262,auVar1251,auVar9);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar137,auVar1456,auVar9);
  *(long *)(ctx + 0x53f8) = auVar9._0_8_;
  dVar1 = in_R8[5];
  dVar2 = in_R8[4];
  auVar998._8_8_ = 0;
  auVar998._0_8_ = in_stack_00000008[4];
  auVar1874._8_8_ = 0;
  auVar1874._0_8_ = in_stack_00000008[6];
  auVar2013._8_8_ = 0;
  auVar2013._0_8_ = in_stack_00000008[7];
  dVar3 = in_R8[3];
  auVar778._8_8_ = 0;
  auVar778._0_8_ = in_stack_00000008[3];
  auVar481._8_8_ = 0;
  auVar481._0_8_ = dVar2 + dVar2;
  auVar1457._8_8_ = 0;
  auVar1457._0_8_ = (dVar1 + dVar1) * in_stack_00000008[5];
  auVar9 = vfmadd231sd_fma(auVar1457,auVar998,auVar481);
  dVar4 = in_R8[6];
  auVar482._8_8_ = 0;
  auVar482._0_8_ = dVar4;
  auVar1759._8_8_ = 0;
  auVar1759._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1759,auVar1874,auVar9);
  dVar4 = in_R8[7];
  auVar1458._8_8_ = 0;
  auVar1458._0_8_ = dVar4;
  auVar1954._8_8_ = 0;
  auVar1954._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1954,auVar2013,auVar9);
  auVar1760._8_8_ = 0;
  auVar1760._0_8_ = in_R8[8];
  auVar8 = vaddsd_avx512f(auVar1760,auVar1760);
  auVar2073._8_8_ = 0;
  auVar2073._0_8_ = in_stack_00000008[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2073,auVar9);
  auVar1252._8_8_ = 0;
  auVar1252._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1252,auVar2073,auVar9);
  auVar263._8_8_ = 0;
  auVar263._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar263,auVar2013,auVar9);
  auVar999._8_8_ = 0;
  auVar999._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar999,auVar1458,auVar9);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar264,auVar1874,auVar9);
  auVar1000._8_8_ = 0;
  auVar1000._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1000,auVar482,auVar9);
  auVar265._8_8_ = 0;
  auVar265._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar265,auVar1760,auVar9);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar138,auVar778,auVar9);
  *(long *)(ctx + 0x5558) = auVar9._0_8_;
  dVar1 = in_R8[5];
  dVar2 = in_R8[4];
  auVar1001._8_8_ = 0;
  auVar1001._0_8_ = in_R9[4];
  auVar1875._8_8_ = 0;
  auVar1875._0_8_ = in_R9[6];
  auVar2014._8_8_ = 0;
  auVar2014._0_8_ = in_R9[7];
  dVar3 = in_R8[3];
  auVar779._8_8_ = 0;
  auVar779._0_8_ = in_R9[3];
  auVar483._8_8_ = 0;
  auVar483._0_8_ = dVar2 + dVar2;
  auVar1459._8_8_ = 0;
  auVar1459._0_8_ = (dVar1 + dVar1) * in_R9[5];
  auVar9 = vfmadd231sd_fma(auVar1459,auVar1001,auVar483);
  dVar4 = in_R8[6];
  auVar484._8_8_ = 0;
  auVar484._0_8_ = dVar4;
  auVar1761._8_8_ = 0;
  auVar1761._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1761,auVar1875,auVar9);
  dVar4 = in_R8[7];
  auVar1460._8_8_ = 0;
  auVar1460._0_8_ = dVar4;
  auVar1955._8_8_ = 0;
  auVar1955._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1955,auVar2014,auVar9);
  auVar1762._8_8_ = 0;
  auVar1762._0_8_ = in_R8[8];
  auVar8 = vaddsd_avx512f(auVar1762,auVar1762);
  auVar2074._8_8_ = 0;
  auVar2074._0_8_ = in_R9[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2074,auVar9);
  auVar1253._8_8_ = 0;
  auVar1253._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1253,auVar2074,auVar9);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar266,auVar2014,auVar9);
  auVar1002._8_8_ = 0;
  auVar1002._0_8_ = in_R9[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1002,auVar1460,auVar9);
  auVar267._8_8_ = 0;
  auVar267._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar267,auVar1875,auVar9);
  auVar1003._8_8_ = 0;
  auVar1003._0_8_ = in_R9[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1003,auVar484,auVar9);
  auVar268._8_8_ = 0;
  auVar268._0_8_ = in_R9[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar268,auVar1762,auVar9);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar139,auVar779,auVar9);
  *(long *)(ctx + 0x56b8) = auVar9._0_8_;
  dVar1 = in_R8[4];
  dVar2 = in_R8[5];
  dVar3 = in_R8[3];
  dVar4 = in_R8[6];
  auVar1004._8_8_ = 0;
  auVar1004._0_8_ = dVar4;
  dVar5 = in_R8[7];
  auVar1254._8_8_ = 0;
  auVar1254._0_8_ = dVar5;
  dVar6 = in_R8[8];
  auVar1461._8_8_ = 0;
  auVar1461._0_8_ = dVar6;
  auVar485._8_8_ = 0;
  auVar485._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar780._8_8_ = 0;
  auVar780._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar780,auVar1461,auVar485);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar140,auVar1004,auVar9);
  auVar269._8_8_ = 0;
  auVar269._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar269,auVar1254,auVar9);
  *(long *)(ctx + 0x5818) = auVar9._0_8_;
  dVar1 = in_RCX[5];
  dVar2 = in_RCX[4];
  auVar1005._8_8_ = 0;
  auVar1005._0_8_ = in_stack_00000008[4];
  auVar1876._8_8_ = 0;
  auVar1876._0_8_ = in_stack_00000008[6];
  auVar2015._8_8_ = 0;
  auVar2015._0_8_ = in_stack_00000008[7];
  dVar3 = in_RCX[3];
  auVar781._8_8_ = 0;
  auVar781._0_8_ = in_stack_00000008[3];
  auVar486._8_8_ = 0;
  auVar486._0_8_ = dVar2 + dVar2;
  auVar1462._8_8_ = 0;
  auVar1462._0_8_ = (dVar1 + dVar1) * in_stack_00000008[5];
  auVar9 = vfmadd231sd_fma(auVar1462,auVar1005,auVar486);
  dVar4 = in_RCX[6];
  auVar487._8_8_ = 0;
  auVar487._0_8_ = dVar4;
  auVar1763._8_8_ = 0;
  auVar1763._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1763,auVar1876,auVar9);
  dVar4 = in_RCX[7];
  auVar1463._8_8_ = 0;
  auVar1463._0_8_ = dVar4;
  auVar1956._8_8_ = 0;
  auVar1956._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1956,auVar2015,auVar9);
  auVar1764._8_8_ = 0;
  auVar1764._0_8_ = in_RCX[8];
  auVar8 = vaddsd_avx512f(auVar1764,auVar1764);
  auVar2075._8_8_ = 0;
  auVar2075._0_8_ = in_stack_00000008[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2075,auVar9);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar270,auVar2015,auVar9);
  auVar1006._8_8_ = 0;
  auVar1006._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1006,auVar1463,auVar9);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar271,auVar2075,auVar9);
  auVar1007._8_8_ = 0;
  auVar1007._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1007,auVar1876,auVar9);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar272,auVar487,auVar9);
  auVar488._8_8_ = 0;
  auVar488._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar488,auVar1764,auVar9);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar141,auVar781,auVar9);
  *(long *)(ctx + 0x5978) = auVar9._0_8_;
  dVar1 = in_RCX[5];
  dVar2 = in_RCX[4];
  auVar1008._8_8_ = 0;
  auVar1008._0_8_ = in_R9[4];
  auVar1877._8_8_ = 0;
  auVar1877._0_8_ = in_R9[6];
  auVar2016._8_8_ = 0;
  auVar2016._0_8_ = in_R9[7];
  dVar3 = in_RCX[3];
  auVar782._8_8_ = 0;
  auVar782._0_8_ = in_R9[3];
  auVar489._8_8_ = 0;
  auVar489._0_8_ = dVar2 + dVar2;
  auVar1464._8_8_ = 0;
  auVar1464._0_8_ = (dVar1 + dVar1) * in_R9[5];
  auVar9 = vfmadd231sd_fma(auVar1464,auVar1008,auVar489);
  dVar4 = in_RCX[6];
  auVar490._8_8_ = 0;
  auVar490._0_8_ = dVar4;
  auVar1765._8_8_ = 0;
  auVar1765._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1765,auVar1877,auVar9);
  dVar4 = in_RCX[7];
  auVar1465._8_8_ = 0;
  auVar1465._0_8_ = dVar4;
  auVar1957._8_8_ = 0;
  auVar1957._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1957,auVar2016,auVar9);
  auVar1766._8_8_ = 0;
  auVar1766._0_8_ = in_RCX[8];
  auVar8 = vaddsd_avx512f(auVar1766,auVar1766);
  auVar2076._8_8_ = 0;
  auVar2076._0_8_ = in_R9[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2076,auVar9);
  auVar273._8_8_ = 0;
  auVar273._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar273,auVar2016,auVar9);
  auVar1009._8_8_ = 0;
  auVar1009._0_8_ = in_R9[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1009,auVar1465,auVar9);
  auVar274._8_8_ = 0;
  auVar274._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar274,auVar2076,auVar9);
  auVar1010._8_8_ = 0;
  auVar1010._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1010,auVar1877,auVar9);
  auVar275._8_8_ = 0;
  auVar275._0_8_ = in_R9[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar275,auVar490,auVar9);
  auVar491._8_8_ = 0;
  auVar491._0_8_ = in_R9[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar491,auVar1766,auVar9);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar142,auVar782,auVar9);
  *(long *)(ctx + 0x5ad8) = auVar9._0_8_;
  dVar1 = in_RCX[5];
  dVar2 = in_RCX[4];
  auVar1011._8_8_ = 0;
  auVar1011._0_8_ = in_R8[4];
  auVar1878._8_8_ = 0;
  auVar1878._0_8_ = in_R8[6];
  auVar2017._8_8_ = 0;
  auVar2017._0_8_ = in_R8[7];
  dVar3 = in_RCX[3];
  auVar783._8_8_ = 0;
  auVar783._0_8_ = in_R8[3];
  auVar492._8_8_ = 0;
  auVar492._0_8_ = dVar2 + dVar2;
  auVar1466._8_8_ = 0;
  auVar1466._0_8_ = (dVar1 + dVar1) * in_R8[5];
  auVar9 = vfmadd231sd_fma(auVar1466,auVar1011,auVar492);
  dVar4 = in_RCX[6];
  auVar493._8_8_ = 0;
  auVar493._0_8_ = dVar4;
  auVar1767._8_8_ = 0;
  auVar1767._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1767,auVar1878,auVar9);
  dVar4 = in_RCX[7];
  auVar1467._8_8_ = 0;
  auVar1467._0_8_ = dVar4;
  auVar1958._8_8_ = 0;
  auVar1958._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1958,auVar2017,auVar9);
  auVar1768._8_8_ = 0;
  auVar1768._0_8_ = in_RCX[8];
  auVar8 = vaddsd_avx512f(auVar1768,auVar1768);
  auVar2077._8_8_ = 0;
  auVar2077._0_8_ = in_R8[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2077,auVar9);
  auVar1618._8_8_ = 0;
  auVar1618._0_8_ = in_R8[5] * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1618,auVar1768,auVar9);
  auVar276._8_8_ = 0;
  auVar276._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar276,auVar2017,auVar9);
  auVar1012._8_8_ = 0;
  auVar1012._0_8_ = in_R8[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1012,auVar1467,auVar9);
  auVar277._8_8_ = 0;
  auVar277._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar277,auVar2077,auVar9);
  auVar1013._8_8_ = 0;
  auVar1013._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1013,auVar1878,auVar9);
  auVar278._8_8_ = 0;
  auVar278._0_8_ = in_R8[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar278,auVar493,auVar9);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar143,auVar783,auVar9);
  *(long *)(ctx + 0x5c38) = auVar9._0_8_;
  dVar1 = in_RCX[4];
  dVar2 = in_RCX[5];
  dVar3 = in_RCX[3];
  dVar4 = in_RCX[6];
  auVar1014._8_8_ = 0;
  auVar1014._0_8_ = dVar4;
  dVar5 = in_RCX[7];
  auVar1255._8_8_ = 0;
  auVar1255._0_8_ = dVar5;
  dVar6 = in_RCX[8];
  auVar1468._8_8_ = 0;
  auVar1468._0_8_ = dVar6;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar3 * -2.0;
  auVar494._8_8_ = 0;
  auVar494._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar9 = vfmadd213sd_fma(auVar144,auVar1014,auVar494);
  auVar279._8_8_ = 0;
  auVar279._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar279,auVar1255,auVar9);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar145,auVar1468,auVar9);
  *(long *)(ctx + 0x5d98) = auVar9._0_8_;
  dVar1 = in_RDX[5];
  dVar2 = in_RDX[4];
  auVar1015._8_8_ = 0;
  auVar1015._0_8_ = in_stack_00000008[4];
  auVar1879._8_8_ = 0;
  auVar1879._0_8_ = in_stack_00000008[6];
  auVar2018._8_8_ = 0;
  auVar2018._0_8_ = in_stack_00000008[7];
  dVar3 = in_RDX[3];
  auVar784._8_8_ = 0;
  auVar784._0_8_ = in_stack_00000008[3];
  auVar495._8_8_ = 0;
  auVar495._0_8_ = dVar2 + dVar2;
  auVar1469._8_8_ = 0;
  auVar1469._0_8_ = (dVar1 + dVar1) * in_stack_00000008[5];
  auVar9 = vfmadd231sd_fma(auVar1469,auVar1015,auVar495);
  dVar4 = in_RDX[6];
  auVar496._8_8_ = 0;
  auVar496._0_8_ = dVar4;
  auVar1769._8_8_ = 0;
  auVar1769._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1769,auVar1879,auVar9);
  dVar4 = in_RDX[7];
  auVar1470._8_8_ = 0;
  auVar1470._0_8_ = dVar4;
  auVar1959._8_8_ = 0;
  auVar1959._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1959,auVar2018,auVar9);
  auVar1770._8_8_ = 0;
  auVar1770._0_8_ = in_RDX[8];
  auVar8 = vaddsd_avx512f(auVar1770,auVar1770);
  auVar2078._8_8_ = 0;
  auVar2078._0_8_ = in_stack_00000008[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2078,auVar9);
  auVar1016._8_8_ = 0;
  auVar1016._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1016,auVar1470,auVar9);
  auVar1256._8_8_ = 0;
  auVar1256._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1256,auVar2078,auVar9);
  auVar1017._8_8_ = 0;
  auVar1017._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1017,auVar1879,auVar9);
  auVar1257._8_8_ = 0;
  auVar1257._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1257,auVar496,auVar9);
  auVar280._8_8_ = 0;
  auVar280._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar280,auVar2018,auVar9);
  auVar497._8_8_ = 0;
  auVar497._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar497,auVar1770,auVar9);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar146,auVar784,auVar9);
  *(long *)(ctx + 0x5ef8) = auVar9._0_8_;
  dVar1 = in_RDX[5];
  dVar2 = in_RDX[4];
  auVar1018._8_8_ = 0;
  auVar1018._0_8_ = in_R9[4];
  auVar1880._8_8_ = 0;
  auVar1880._0_8_ = in_R9[6];
  auVar2019._8_8_ = 0;
  auVar2019._0_8_ = in_R9[7];
  dVar3 = in_RDX[3];
  auVar785._8_8_ = 0;
  auVar785._0_8_ = in_R9[3];
  auVar498._8_8_ = 0;
  auVar498._0_8_ = dVar2 + dVar2;
  auVar1471._8_8_ = 0;
  auVar1471._0_8_ = (dVar1 + dVar1) * in_R9[5];
  auVar9 = vfmadd231sd_fma(auVar1471,auVar1018,auVar498);
  dVar4 = in_RDX[6];
  auVar499._8_8_ = 0;
  auVar499._0_8_ = dVar4;
  auVar1771._8_8_ = 0;
  auVar1771._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1771,auVar1880,auVar9);
  dVar4 = in_RDX[7];
  auVar1472._8_8_ = 0;
  auVar1472._0_8_ = dVar4;
  auVar1960._8_8_ = 0;
  auVar1960._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1960,auVar2019,auVar9);
  auVar1772._8_8_ = 0;
  auVar1772._0_8_ = in_RDX[8];
  auVar8 = vaddsd_avx512f(auVar1772,auVar1772);
  auVar2079._8_8_ = 0;
  auVar2079._0_8_ = in_R9[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2079,auVar9);
  auVar1019._8_8_ = 0;
  auVar1019._0_8_ = in_R9[4] * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1019,auVar1472,auVar9);
  auVar1258._8_8_ = 0;
  auVar1258._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1258,auVar2079,auVar9);
  auVar1020._8_8_ = 0;
  auVar1020._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1020,auVar1880,auVar9);
  auVar1259._8_8_ = 0;
  auVar1259._0_8_ = in_R9[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1259,auVar499,auVar9);
  auVar281._8_8_ = 0;
  auVar281._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar281,auVar2019,auVar9);
  auVar500._8_8_ = 0;
  auVar500._0_8_ = in_R9[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar500,auVar1772,auVar9);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar147,auVar785,auVar9);
  *(long *)(ctx + 0x6058) = auVar9._0_8_;
  dVar1 = in_RDX[5];
  dVar2 = in_RDX[4];
  auVar1021._8_8_ = 0;
  auVar1021._0_8_ = in_R8[4];
  auVar1881._8_8_ = 0;
  auVar1881._0_8_ = in_R8[6];
  auVar2020._8_8_ = 0;
  auVar2020._0_8_ = in_R8[7];
  dVar3 = in_RDX[3];
  auVar786._8_8_ = 0;
  auVar786._0_8_ = in_R8[3];
  auVar501._8_8_ = 0;
  auVar501._0_8_ = dVar2 + dVar2;
  auVar1473._8_8_ = 0;
  auVar1473._0_8_ = (dVar1 + dVar1) * in_R8[5];
  auVar9 = vfmadd231sd_fma(auVar1473,auVar1021,auVar501);
  dVar4 = in_RDX[6];
  auVar502._8_8_ = 0;
  auVar502._0_8_ = dVar4;
  auVar1773._8_8_ = 0;
  auVar1773._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1773,auVar1881,auVar9);
  dVar4 = in_RDX[7];
  auVar1474._8_8_ = 0;
  auVar1474._0_8_ = dVar4;
  auVar1961._8_8_ = 0;
  auVar1961._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1961,auVar2020,auVar9);
  auVar1774._8_8_ = 0;
  auVar1774._0_8_ = in_RDX[8];
  auVar8 = vaddsd_avx512f(auVar1774,auVar1774);
  auVar2080._8_8_ = 0;
  auVar2080._0_8_ = in_R8[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2080,auVar9);
  auVar1619._8_8_ = 0;
  auVar1619._0_8_ = in_R8[5] * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1619,auVar1774,auVar9);
  auVar1022._8_8_ = 0;
  auVar1022._0_8_ = in_R8[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1022,auVar1474,auVar9);
  auVar1260._8_8_ = 0;
  auVar1260._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1260,auVar2080,auVar9);
  auVar1023._8_8_ = 0;
  auVar1023._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1023,auVar1881,auVar9);
  auVar1261._8_8_ = 0;
  auVar1261._0_8_ = in_R8[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1261,auVar502,auVar9);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar282,auVar2020,auVar9);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar148,auVar786,auVar9);
  *(long *)(ctx + 0x61b8) = auVar9._0_8_;
  dVar1 = in_RDX[5];
  dVar2 = in_RDX[4];
  auVar1024._8_8_ = 0;
  auVar1024._0_8_ = in_RCX[4];
  auVar1882._8_8_ = 0;
  auVar1882._0_8_ = in_RCX[6];
  auVar2021._8_8_ = 0;
  auVar2021._0_8_ = in_RCX[7];
  dVar3 = in_RDX[3];
  auVar787._8_8_ = 0;
  auVar787._0_8_ = in_RCX[3];
  auVar503._8_8_ = 0;
  auVar503._0_8_ = dVar2 + dVar2;
  auVar1475._8_8_ = 0;
  auVar1475._0_8_ = (dVar1 + dVar1) * in_RCX[5];
  auVar9 = vfmadd231sd_fma(auVar1475,auVar1024,auVar503);
  dVar4 = in_RDX[6];
  auVar504._8_8_ = 0;
  auVar504._0_8_ = dVar4;
  auVar1775._8_8_ = 0;
  auVar1775._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1775,auVar1882,auVar9);
  dVar4 = in_RDX[7];
  auVar1476._8_8_ = 0;
  auVar1476._0_8_ = dVar4;
  auVar1962._8_8_ = 0;
  auVar1962._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1962,auVar2021,auVar9);
  auVar1776._8_8_ = 0;
  auVar1776._0_8_ = in_RDX[8];
  auVar8 = vaddsd_avx512f(auVar1776,auVar1776);
  auVar2081._8_8_ = 0;
  auVar2081._0_8_ = in_RCX[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2081,auVar9);
  auVar1025._8_8_ = 0;
  auVar1025._0_8_ = in_RCX[4] * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1025,auVar1476,auVar9);
  auVar1262._8_8_ = 0;
  auVar1262._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1262,auVar2081,auVar9);
  auVar1026._8_8_ = 0;
  auVar1026._0_8_ = in_RCX[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1026,auVar1776,auVar9);
  auVar1263._8_8_ = 0;
  auVar1263._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1263,auVar1882,auVar9);
  auVar1027._8_8_ = 0;
  auVar1027._0_8_ = in_RCX[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1027,auVar504,auVar9);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar283,auVar2021,auVar9);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar149,auVar787,auVar9);
  *(long *)(ctx + 0x6318) = auVar9._0_8_;
  dVar1 = in_RDX[4];
  dVar2 = in_RDX[5];
  dVar3 = in_RDX[3];
  dVar4 = in_RDX[6];
  auVar1028._8_8_ = 0;
  auVar1028._0_8_ = dVar4;
  dVar5 = in_RDX[7];
  auVar1264._8_8_ = 0;
  auVar1264._0_8_ = dVar5;
  dVar6 = in_RDX[8];
  auVar1477._8_8_ = 0;
  auVar1477._0_8_ = dVar6;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = dVar3 * -2.0;
  auVar505._8_8_ = 0;
  auVar505._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar9 = vfmadd213sd_fma(auVar150,auVar1028,auVar505);
  auVar284._8_8_ = 0;
  auVar284._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar284,auVar1264,auVar9);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar151,auVar1477,auVar9);
  *(long *)(ctx + 0x6478) = auVar9._0_8_;
  dVar1 = in_RSI[3];
  auVar788._8_8_ = 0;
  auVar788._0_8_ = in_stack_00000008[6];
  dVar2 = in_RSI[4];
  auVar1265._8_8_ = 0;
  auVar1265._0_8_ = in_stack_00000008[4];
  auVar1620._8_8_ = 0;
  auVar1620._0_8_ = in_stack_00000008[5];
  auVar1883._8_8_ = 0;
  auVar1883._0_8_ = in_stack_00000008[7];
  auVar2022._8_8_ = 0;
  auVar2022._0_8_ = in_stack_00000008[8];
  auVar152._8_8_ = 0;
  auVar152._0_8_ = in_stack_00000008[3] * (dVar1 + dVar1);
  auVar506._8_8_ = 0;
  auVar506._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd231sd_fma(auVar152,auVar788,auVar506);
  auVar507._8_8_ = 0;
  auVar507._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar507,auVar1265,auVar9);
  dVar1 = in_RSI[5];
  auVar1478._8_8_ = 0;
  auVar1478._0_8_ = dVar1 + dVar1;
  auVar9 = vfmadd213sd_fma(auVar1478,auVar1620,auVar9);
  dVar3 = in_RSI[6];
  auVar508._8_8_ = 0;
  auVar508._0_8_ = dVar3;
  auVar1777._8_8_ = 0;
  auVar1777._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1777,auVar788,auVar9);
  dVar3 = in_RSI[7];
  auVar789._8_8_ = 0;
  auVar789._0_8_ = dVar3;
  auVar1479._8_8_ = 0;
  auVar1479._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1479,auVar1883,auVar9);
  dVar3 = in_RSI[8];
  auVar1778._8_8_ = 0;
  auVar1778._0_8_ = dVar3;
  auVar1963._8_8_ = 0;
  auVar1963._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1963,auVar2022,auVar9);
  auVar1029._8_8_ = 0;
  auVar1029._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1029,auVar508,auVar9);
  auVar285._8_8_ = 0;
  auVar285._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar285,auVar1883,auVar9);
  auVar509._8_8_ = 0;
  auVar509._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar509,auVar789,auVar9);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar153,auVar2022,auVar9);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar286,auVar1778,auVar9);
  *(long *)(ctx + 0x65d8) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar1030._8_8_ = 0;
  auVar1030._0_8_ = in_R9[3];
  auVar1621._8_8_ = 0;
  auVar1621._0_8_ = in_R9[5];
  auVar1884._8_8_ = 0;
  auVar1884._0_8_ = in_R9[6];
  auVar2023._8_8_ = 0;
  auVar2023._0_8_ = in_R9[7];
  auVar510._8_8_ = 0;
  auVar510._0_8_ = dVar2 + dVar2;
  auVar790._8_8_ = 0;
  auVar790._0_8_ = in_R9[4] * (dVar1 + dVar1);
  auVar9 = vfmadd231sd_fma(auVar790,auVar1030,auVar510);
  dVar3 = in_RSI[5];
  auVar1480._8_8_ = 0;
  auVar1480._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1480,auVar1621,auVar9);
  dVar4 = in_RSI[6];
  auVar791._8_8_ = 0;
  auVar791._0_8_ = dVar4;
  auVar1779._8_8_ = 0;
  auVar1779._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1779,auVar1884,auVar9);
  dVar4 = in_RSI[7];
  auVar1481._8_8_ = 0;
  auVar1481._0_8_ = dVar4;
  auVar1964._8_8_ = 0;
  auVar1964._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1964,auVar2023,auVar9);
  auVar1780._8_8_ = 0;
  auVar1780._0_8_ = in_RSI[8];
  auVar8 = vaddsd_avx512f(auVar1780,auVar1780);
  auVar2082._8_8_ = 0;
  auVar2082._0_8_ = in_R9[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2082,auVar9);
  auVar1031._8_8_ = 0;
  auVar1031._0_8_ = in_R9[3] * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1031,auVar791,auVar9);
  auVar287._8_8_ = 0;
  auVar287._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar287,auVar2023,auVar9);
  auVar792._8_8_ = 0;
  auVar792._0_8_ = in_R9[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar792,auVar1481,auVar9);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar288,auVar2082,auVar9);
  auVar511._8_8_ = 0;
  auVar511._0_8_ = in_R9[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar511,auVar1780,auVar9);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar154,auVar1884,auVar9);
  *(long *)(ctx + 0x6738) = auVar9._0_8_;
  auVar793._8_8_ = 0;
  auVar793._0_8_ = in_R8[5];
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[8];
  auVar1482._8_8_ = 0;
  auVar1482._0_8_ = in_R8[3];
  dVar3 = in_RSI[4];
  auVar1622._8_8_ = 0;
  auVar1622._0_8_ = in_R8[4];
  auVar1885._8_8_ = 0;
  auVar1885._0_8_ = in_R8[6];
  auVar2024._8_8_ = 0;
  auVar2024._0_8_ = in_R8[7];
  auVar512._8_8_ = 0;
  auVar512._0_8_ = dVar1 + dVar1;
  auVar1266._8_8_ = 0;
  auVar1266._0_8_ = in_R8[5] * -2.0 * dVar2;
  auVar9 = vfmadd231sd_fma(auVar1266,auVar1482,auVar512);
  auVar513._8_8_ = 0;
  auVar513._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar513,auVar1622,auVar9);
  dVar4 = in_RSI[5];
  auVar1781._8_8_ = 0;
  auVar1781._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1781,auVar793,auVar9);
  dVar5 = in_RSI[6];
  auVar514._8_8_ = 0;
  auVar514._0_8_ = dVar5;
  auVar794._8_8_ = 0;
  auVar794._0_8_ = dVar5 + dVar5;
  auVar9 = vfmadd213sd_fma(auVar794,auVar1885,auVar9);
  dVar5 = in_RSI[7];
  auVar1782._8_8_ = 0;
  auVar1782._0_8_ = dVar5;
  auVar1965._8_8_ = 0;
  auVar1965._0_8_ = dVar5 + dVar5;
  auVar9 = vfmadd213sd_fma(auVar1965,auVar2024,auVar9);
  auVar1032._8_8_ = 0;
  auVar1032._0_8_ = in_R8[8];
  auVar795._8_8_ = 0;
  auVar795._0_8_ = dVar2 + dVar2;
  auVar9 = vfmadd213sd_fma(auVar795,auVar1032,auVar9);
  auVar1483._8_8_ = 0;
  auVar1483._0_8_ = in_R8[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1483,auVar514,auVar9);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar289,auVar2024,auVar9);
  auVar515._8_8_ = 0;
  auVar515._0_8_ = in_R8[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar515,auVar1782,auVar9);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = dVar4 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar290,auVar1032,auVar9);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar155,auVar1885,auVar9);
  *(long *)(ctx + 0x6898) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar1033._8_8_ = 0;
  auVar1033._0_8_ = in_RCX[3];
  auVar1623._8_8_ = 0;
  auVar1623._0_8_ = in_RCX[5];
  auVar1886._8_8_ = 0;
  auVar1886._0_8_ = in_RCX[6];
  auVar2025._8_8_ = 0;
  auVar2025._0_8_ = in_RCX[7];
  auVar516._8_8_ = 0;
  auVar516._0_8_ = dVar2 + dVar2;
  auVar796._8_8_ = 0;
  auVar796._0_8_ = in_RCX[4] * (dVar1 + dVar1);
  auVar9 = vfmadd231sd_fma(auVar796,auVar1033,auVar516);
  dVar3 = in_RSI[5];
  auVar1484._8_8_ = 0;
  auVar1484._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1484,auVar1623,auVar9);
  dVar4 = in_RSI[6];
  auVar797._8_8_ = 0;
  auVar797._0_8_ = dVar4;
  auVar1783._8_8_ = 0;
  auVar1783._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1783,auVar1886,auVar9);
  dVar4 = in_RSI[7];
  auVar1485._8_8_ = 0;
  auVar1485._0_8_ = dVar4;
  auVar1966._8_8_ = 0;
  auVar1966._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1966,auVar2025,auVar9);
  auVar1784._8_8_ = 0;
  auVar1784._0_8_ = in_RSI[8];
  auVar8 = vaddsd_avx512f(auVar1784,auVar1784);
  auVar2083._8_8_ = 0;
  auVar2083._0_8_ = in_RCX[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2083,auVar9);
  auVar1034._8_8_ = 0;
  auVar1034._0_8_ = in_RCX[3] * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1034,auVar797,auVar9);
  auVar291._8_8_ = 0;
  auVar291._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar291,auVar2025,auVar9);
  auVar798._8_8_ = 0;
  auVar798._0_8_ = in_RCX[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar798,auVar1485,auVar9);
  auVar292._8_8_ = 0;
  auVar292._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar292,auVar2083,auVar9);
  auVar517._8_8_ = 0;
  auVar517._0_8_ = in_RCX[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar517,auVar1784,auVar9);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar156,auVar1886,auVar9);
  *(long *)(ctx + 0x69f8) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar1035._8_8_ = 0;
  auVar1035._0_8_ = in_RDX[3];
  auVar1624._8_8_ = 0;
  auVar1624._0_8_ = in_RDX[5];
  auVar1887._8_8_ = 0;
  auVar1887._0_8_ = in_RDX[6];
  auVar2026._8_8_ = 0;
  auVar2026._0_8_ = in_RDX[7];
  auVar518._8_8_ = 0;
  auVar518._0_8_ = dVar2 + dVar2;
  auVar799._8_8_ = 0;
  auVar799._0_8_ = in_RDX[4] * (dVar1 + dVar1);
  auVar9 = vfmadd231sd_fma(auVar799,auVar1035,auVar518);
  dVar3 = in_RSI[5];
  auVar1486._8_8_ = 0;
  auVar1486._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1486,auVar1624,auVar9);
  dVar4 = in_RSI[6];
  auVar800._8_8_ = 0;
  auVar800._0_8_ = dVar4;
  auVar1785._8_8_ = 0;
  auVar1785._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1785,auVar1887,auVar9);
  dVar4 = in_RSI[7];
  auVar1487._8_8_ = 0;
  auVar1487._0_8_ = dVar4;
  auVar1967._8_8_ = 0;
  auVar1967._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1967,auVar2026,auVar9);
  auVar1786._8_8_ = 0;
  auVar1786._0_8_ = in_RSI[8];
  auVar8 = vaddsd_avx512f(auVar1786,auVar1786);
  auVar2084._8_8_ = 0;
  auVar2084._0_8_ = in_RDX[8];
  auVar9 = vfmadd213sd_avx512f(auVar8,auVar2084,auVar9);
  auVar1036._8_8_ = 0;
  auVar1036._0_8_ = in_RDX[3] * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar1036,auVar800,auVar9);
  auVar293._8_8_ = 0;
  auVar293._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar293,auVar2026,auVar9);
  auVar801._8_8_ = 0;
  auVar801._0_8_ = in_RDX[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar801,auVar1487,auVar9);
  auVar294._8_8_ = 0;
  auVar294._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar294,auVar2084,auVar9);
  auVar519._8_8_ = 0;
  auVar519._0_8_ = in_RDX[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar519,auVar1786,auVar9);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar157,auVar1887,auVar9);
  *(long *)(ctx + 0x6b58) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  dVar3 = in_RSI[5];
  dVar4 = in_RSI[6];
  auVar802._8_8_ = 0;
  auVar802._0_8_ = dVar4;
  dVar5 = in_RSI[7];
  auVar1037._8_8_ = 0;
  auVar1037._0_8_ = dVar5;
  dVar6 = in_RSI[8];
  auVar1267._8_8_ = 0;
  auVar1267._0_8_ = dVar6;
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       dVar6 * dVar6 +
       dVar5 * dVar5 +
       dVar4 * dVar4 + (dVar1 * dVar1 - auVar13._0_8_ * auVar13._0_8_) + dVar3 * dVar3;
  auVar1488._8_8_ = 0;
  auVar1488._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1488,auVar802,auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar62,auVar1037,auVar9);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar2 * dVar2 + auVar9._0_8_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar158,auVar1267,auVar63);
  *(long *)(ctx + 0x6cb8) = auVar9._0_8_;
  dVar1 = in_stack_00000008[4];
  dVar2 = in_stack_00000008[5];
  dVar3 = in_stack_00000008[3];
  dVar4 = in_stack_00000008[9];
  auVar803._8_8_ = 0;
  auVar803._0_8_ = dVar4;
  dVar5 = in_stack_00000008[10];
  auVar1038._8_8_ = 0;
  auVar1038._0_8_ = dVar5;
  dVar6 = in_stack_00000008[0xb];
  auVar1268._8_8_ = 0;
  auVar1268._0_8_ = dVar6;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar3 * -2.0;
  auVar295._8_8_ = 0;
  auVar295._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2
  ;
  auVar9 = vfmadd213sd_fma(auVar64,auVar803,auVar295);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar159,auVar1038,auVar9);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar65,auVar1268,auVar9);
  *(long *)(ctx + 0x5140) = auVar9._0_8_;
  dVar1 = in_R9[5];
  dVar2 = in_R9[4];
  auVar804._8_8_ = 0;
  auVar804._0_8_ = in_stack_00000008[4];
  auVar1787._8_8_ = 0;
  auVar1787._0_8_ = in_stack_00000008[9];
  auVar1968._8_8_ = 0;
  auVar1968._0_8_ = in_stack_00000008[10];
  dVar3 = in_R9[3];
  auVar520._8_8_ = 0;
  auVar520._0_8_ = in_stack_00000008[3];
  auVar296._8_8_ = 0;
  auVar296._0_8_ = dVar2 + dVar2;
  auVar1269._8_8_ = 0;
  auVar1269._0_8_ = (dVar1 + dVar1) * in_stack_00000008[5];
  auVar9 = vfmadd231sd_fma(auVar1269,auVar804,auVar296);
  dVar4 = in_R9[9];
  auVar297._8_8_ = 0;
  auVar297._0_8_ = dVar4;
  auVar1625._8_8_ = 0;
  auVar1625._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1625,auVar1787,auVar9);
  dVar4 = in_R9[10];
  auVar1270._8_8_ = 0;
  auVar1270._0_8_ = dVar4;
  auVar1888._8_8_ = 0;
  auVar1888._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1888,auVar1968,auVar9);
  dVar4 = in_R9[0xb];
  auVar1626._8_8_ = 0;
  auVar1626._0_8_ = dVar4;
  auVar2027._8_8_ = 0;
  auVar2027._0_8_ = dVar4 + dVar4;
  auVar2057._8_8_ = 0;
  auVar2057._0_8_ = in_stack_00000008[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2027,auVar2057,auVar9);
  auVar1889._8_8_ = 0;
  auVar1889._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1889,auVar1787,auVar9);
  auVar1788._8_8_ = 0;
  auVar1788._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1788,auVar297,auVar9);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar160,auVar1968,auVar9);
  auVar298._8_8_ = 0;
  auVar298._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar298,auVar1270,auVar9);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar161,auVar2057,auVar9);
  auVar299._8_8_ = 0;
  auVar299._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar299,auVar1626,auVar9);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar66,auVar520,auVar9);
  *(long *)(ctx + 0x52a0) = auVar9._0_8_;
  dVar1 = in_R9[4];
  dVar2 = in_R9[5];
  dVar3 = in_R9[3];
  dVar4 = in_R9[9];
  auVar805._8_8_ = 0;
  auVar805._0_8_ = dVar4;
  dVar5 = in_R9[10];
  auVar1039._8_8_ = 0;
  auVar1039._0_8_ = dVar5;
  dVar6 = in_R9[0xb];
  auVar1271._8_8_ = 0;
  auVar1271._0_8_ = dVar6;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar3 * -2.0;
  auVar300._8_8_ = 0;
  auVar300._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2
  ;
  auVar9 = vfmadd213sd_fma(auVar67,auVar805,auVar300);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar162,auVar1039,auVar9);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar68,auVar1271,auVar9);
  *(long *)(ctx + 0x5400) = auVar9._0_8_;
  dVar1 = in_R8[5];
  dVar2 = in_R8[4];
  auVar806._8_8_ = 0;
  auVar806._0_8_ = in_stack_00000008[4];
  auVar1789._8_8_ = 0;
  auVar1789._0_8_ = in_stack_00000008[9];
  auVar1969._8_8_ = 0;
  auVar1969._0_8_ = in_stack_00000008[10];
  dVar3 = in_R8[3];
  auVar521._8_8_ = 0;
  auVar521._0_8_ = in_stack_00000008[3];
  auVar301._8_8_ = 0;
  auVar301._0_8_ = dVar2 + dVar2;
  auVar1272._8_8_ = 0;
  auVar1272._0_8_ = (dVar1 + dVar1) * in_stack_00000008[5];
  auVar9 = vfmadd231sd_fma(auVar1272,auVar806,auVar301);
  dVar4 = in_R8[9];
  auVar302._8_8_ = 0;
  auVar302._0_8_ = dVar4;
  auVar1627._8_8_ = 0;
  auVar1627._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1627,auVar1789,auVar9);
  dVar4 = in_R8[10];
  auVar1273._8_8_ = 0;
  auVar1273._0_8_ = dVar4;
  auVar1890._8_8_ = 0;
  auVar1890._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1890,auVar1969,auVar9);
  dVar4 = in_R8[0xb];
  auVar1628._8_8_ = 0;
  auVar1628._0_8_ = dVar4;
  auVar2028._8_8_ = 0;
  auVar2028._0_8_ = dVar4 + dVar4;
  auVar2058._8_8_ = 0;
  auVar2058._0_8_ = in_stack_00000008[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2028,auVar2058,auVar9);
  auVar1891._8_8_ = 0;
  auVar1891._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1891,auVar1789,auVar9);
  auVar1790._8_8_ = 0;
  auVar1790._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1790,auVar302,auVar9);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar163,auVar1969,auVar9);
  auVar303._8_8_ = 0;
  auVar303._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar303,auVar1273,auVar9);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar164,auVar2058,auVar9);
  auVar304._8_8_ = 0;
  auVar304._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar304,auVar1628,auVar9);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar69,auVar521,auVar9);
  *(long *)(ctx + 0x5560) = auVar9._0_8_;
  dVar1 = in_R8[5];
  dVar2 = in_R8[4];
  auVar807._8_8_ = 0;
  auVar807._0_8_ = in_R9[4];
  auVar1791._8_8_ = 0;
  auVar1791._0_8_ = in_R9[9];
  auVar1970._8_8_ = 0;
  auVar1970._0_8_ = in_R9[10];
  dVar3 = in_R8[3];
  auVar522._8_8_ = 0;
  auVar522._0_8_ = in_R9[3];
  auVar305._8_8_ = 0;
  auVar305._0_8_ = dVar2 + dVar2;
  auVar1274._8_8_ = 0;
  auVar1274._0_8_ = (dVar1 + dVar1) * in_R9[5];
  auVar9 = vfmadd231sd_fma(auVar1274,auVar807,auVar305);
  dVar4 = in_R8[9];
  auVar306._8_8_ = 0;
  auVar306._0_8_ = dVar4;
  auVar1629._8_8_ = 0;
  auVar1629._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1629,auVar1791,auVar9);
  dVar4 = in_R8[10];
  auVar1275._8_8_ = 0;
  auVar1275._0_8_ = dVar4;
  auVar1892._8_8_ = 0;
  auVar1892._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1892,auVar1970,auVar9);
  dVar4 = in_R8[0xb];
  auVar1630._8_8_ = 0;
  auVar1630._0_8_ = dVar4;
  auVar2029._8_8_ = 0;
  auVar2029._0_8_ = dVar4 + dVar4;
  auVar2059._8_8_ = 0;
  auVar2059._0_8_ = in_R9[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2029,auVar2059,auVar9);
  auVar1893._8_8_ = 0;
  auVar1893._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1893,auVar1791,auVar9);
  auVar1792._8_8_ = 0;
  auVar1792._0_8_ = in_R9[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1792,auVar306,auVar9);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar165,auVar1970,auVar9);
  auVar307._8_8_ = 0;
  auVar307._0_8_ = in_R9[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar307,auVar1275,auVar9);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar166,auVar2059,auVar9);
  auVar308._8_8_ = 0;
  auVar308._0_8_ = in_R9[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar308,auVar1630,auVar9);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar70,auVar522,auVar9);
  *(long *)(ctx + 0x56c0) = auVar9._0_8_;
  dVar1 = in_R8[4];
  dVar2 = in_R8[5];
  dVar3 = in_R8[3];
  dVar4 = in_R8[9];
  auVar808._8_8_ = 0;
  auVar808._0_8_ = dVar4;
  dVar5 = in_R8[10];
  auVar1040._8_8_ = 0;
  auVar1040._0_8_ = dVar5;
  dVar6 = in_R8[0xb];
  auVar1276._8_8_ = 0;
  auVar1276._0_8_ = dVar6;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar3 * -2.0;
  auVar309._8_8_ = 0;
  auVar309._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2
  ;
  auVar9 = vfmadd213sd_fma(auVar71,auVar808,auVar309);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar167,auVar1040,auVar9);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar72,auVar1276,auVar9);
  *(long *)(ctx + 0x5820) = auVar9._0_8_;
  dVar1 = in_RCX[5];
  dVar2 = in_RCX[4];
  auVar809._8_8_ = 0;
  auVar809._0_8_ = in_stack_00000008[4];
  auVar1793._8_8_ = 0;
  auVar1793._0_8_ = in_stack_00000008[9];
  auVar1971._8_8_ = 0;
  auVar1971._0_8_ = in_stack_00000008[10];
  dVar3 = in_RCX[3];
  auVar523._8_8_ = 0;
  auVar523._0_8_ = in_stack_00000008[3];
  auVar310._8_8_ = 0;
  auVar310._0_8_ = dVar2 + dVar2;
  auVar1277._8_8_ = 0;
  auVar1277._0_8_ = (dVar1 + dVar1) * in_stack_00000008[5];
  auVar9 = vfmadd231sd_fma(auVar1277,auVar809,auVar310);
  dVar4 = in_RCX[9];
  auVar311._8_8_ = 0;
  auVar311._0_8_ = dVar4;
  auVar1631._8_8_ = 0;
  auVar1631._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1631,auVar1793,auVar9);
  dVar4 = in_RCX[10];
  auVar1278._8_8_ = 0;
  auVar1278._0_8_ = dVar4;
  auVar1894._8_8_ = 0;
  auVar1894._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1894,auVar1971,auVar9);
  dVar4 = in_RCX[0xb];
  auVar1632._8_8_ = 0;
  auVar1632._0_8_ = dVar4;
  auVar2030._8_8_ = 0;
  auVar2030._0_8_ = dVar4 + dVar4;
  auVar2060._8_8_ = 0;
  auVar2060._0_8_ = in_stack_00000008[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2030,auVar2060,auVar9);
  auVar1895._8_8_ = 0;
  auVar1895._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1895,auVar1793,auVar9);
  auVar1794._8_8_ = 0;
  auVar1794._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1794,auVar311,auVar9);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar168,auVar1971,auVar9);
  auVar312._8_8_ = 0;
  auVar312._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar312,auVar1278,auVar9);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar169,auVar2060,auVar9);
  auVar313._8_8_ = 0;
  auVar313._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar313,auVar1632,auVar9);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar73,auVar523,auVar9);
  *(long *)(ctx + 0x5980) = auVar9._0_8_;
  dVar1 = in_RCX[5];
  dVar2 = in_RCX[4];
  auVar810._8_8_ = 0;
  auVar810._0_8_ = in_R9[4];
  auVar1795._8_8_ = 0;
  auVar1795._0_8_ = in_R9[9];
  auVar1972._8_8_ = 0;
  auVar1972._0_8_ = in_R9[10];
  dVar3 = in_RCX[3];
  auVar524._8_8_ = 0;
  auVar524._0_8_ = in_R9[3];
  auVar314._8_8_ = 0;
  auVar314._0_8_ = dVar2 + dVar2;
  auVar1279._8_8_ = 0;
  auVar1279._0_8_ = (dVar1 + dVar1) * in_R9[5];
  auVar9 = vfmadd231sd_fma(auVar1279,auVar810,auVar314);
  dVar4 = in_RCX[9];
  auVar315._8_8_ = 0;
  auVar315._0_8_ = dVar4;
  auVar1633._8_8_ = 0;
  auVar1633._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1633,auVar1795,auVar9);
  dVar4 = in_RCX[10];
  auVar1280._8_8_ = 0;
  auVar1280._0_8_ = dVar4;
  auVar1896._8_8_ = 0;
  auVar1896._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1896,auVar1972,auVar9);
  dVar4 = in_RCX[0xb];
  auVar1634._8_8_ = 0;
  auVar1634._0_8_ = dVar4;
  auVar2031._8_8_ = 0;
  auVar2031._0_8_ = dVar4 + dVar4;
  auVar2061._8_8_ = 0;
  auVar2061._0_8_ = in_R9[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2031,auVar2061,auVar9);
  auVar1897._8_8_ = 0;
  auVar1897._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1897,auVar1795,auVar9);
  auVar1796._8_8_ = 0;
  auVar1796._0_8_ = in_R9[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1796,auVar315,auVar9);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar170,auVar1972,auVar9);
  auVar316._8_8_ = 0;
  auVar316._0_8_ = in_R9[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar316,auVar1280,auVar9);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar171,auVar2061,auVar9);
  auVar317._8_8_ = 0;
  auVar317._0_8_ = in_R9[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar317,auVar1634,auVar9);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar74,auVar524,auVar9);
  *(long *)(ctx + 0x5ae0) = auVar9._0_8_;
  dVar1 = in_RCX[5];
  dVar2 = in_RCX[4];
  auVar811._8_8_ = 0;
  auVar811._0_8_ = in_R8[4];
  auVar1797._8_8_ = 0;
  auVar1797._0_8_ = in_R8[9];
  auVar1973._8_8_ = 0;
  auVar1973._0_8_ = in_R8[10];
  dVar3 = in_RCX[3];
  auVar525._8_8_ = 0;
  auVar525._0_8_ = in_R8[3];
  auVar318._8_8_ = 0;
  auVar318._0_8_ = dVar2 + dVar2;
  auVar1281._8_8_ = 0;
  auVar1281._0_8_ = (dVar1 + dVar1) * in_R8[5];
  auVar9 = vfmadd231sd_fma(auVar1281,auVar811,auVar318);
  dVar4 = in_RCX[9];
  auVar319._8_8_ = 0;
  auVar319._0_8_ = dVar4;
  auVar1635._8_8_ = 0;
  auVar1635._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1635,auVar1797,auVar9);
  dVar4 = in_RCX[10];
  auVar1282._8_8_ = 0;
  auVar1282._0_8_ = dVar4;
  auVar1898._8_8_ = 0;
  auVar1898._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1898,auVar1973,auVar9);
  dVar4 = in_RCX[0xb];
  auVar1636._8_8_ = 0;
  auVar1636._0_8_ = dVar4;
  auVar2032._8_8_ = 0;
  auVar2032._0_8_ = dVar4 + dVar4;
  auVar2062._8_8_ = 0;
  auVar2062._0_8_ = in_R8[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2032,auVar2062,auVar9);
  auVar1899._8_8_ = 0;
  auVar1899._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1899,auVar1797,auVar9);
  auVar1798._8_8_ = 0;
  auVar1798._0_8_ = in_R8[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1798,auVar319,auVar9);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar172,auVar1973,auVar9);
  auVar320._8_8_ = 0;
  auVar320._0_8_ = in_R8[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar320,auVar1282,auVar9);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar173,auVar2062,auVar9);
  auVar321._8_8_ = 0;
  auVar321._0_8_ = in_R8[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar321,auVar1636,auVar9);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar75,auVar525,auVar9);
  *(long *)(ctx + 0x5c40) = auVar9._0_8_;
  dVar1 = in_RCX[4];
  dVar2 = in_RCX[5];
  dVar3 = in_RCX[3];
  dVar4 = in_RCX[9];
  auVar812._8_8_ = 0;
  auVar812._0_8_ = dVar4;
  dVar5 = in_RCX[10];
  auVar1041._8_8_ = 0;
  auVar1041._0_8_ = dVar5;
  dVar6 = in_RCX[0xb];
  auVar1283._8_8_ = 0;
  auVar1283._0_8_ = dVar6;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar3 * -2.0;
  auVar322._8_8_ = 0;
  auVar322._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2
  ;
  auVar9 = vfmadd213sd_fma(auVar76,auVar812,auVar322);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar174,auVar1041,auVar9);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar77,auVar1283,auVar9);
  *(long *)(ctx + 0x5da0) = auVar9._0_8_;
  dVar1 = in_RDX[5];
  dVar2 = in_RDX[4];
  auVar813._8_8_ = 0;
  auVar813._0_8_ = in_stack_00000008[4];
  auVar1799._8_8_ = 0;
  auVar1799._0_8_ = in_stack_00000008[9];
  auVar1974._8_8_ = 0;
  auVar1974._0_8_ = in_stack_00000008[10];
  dVar3 = in_RDX[3];
  auVar526._8_8_ = 0;
  auVar526._0_8_ = in_stack_00000008[3];
  auVar323._8_8_ = 0;
  auVar323._0_8_ = dVar2 + dVar2;
  auVar1284._8_8_ = 0;
  auVar1284._0_8_ = (dVar1 + dVar1) * in_stack_00000008[5];
  auVar9 = vfmadd231sd_fma(auVar1284,auVar813,auVar323);
  dVar4 = in_RDX[9];
  auVar324._8_8_ = 0;
  auVar324._0_8_ = dVar4;
  auVar1637._8_8_ = 0;
  auVar1637._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1637,auVar1799,auVar9);
  dVar4 = in_RDX[10];
  auVar1285._8_8_ = 0;
  auVar1285._0_8_ = dVar4;
  auVar1900._8_8_ = 0;
  auVar1900._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1900,auVar1974,auVar9);
  dVar4 = in_RDX[0xb];
  auVar1638._8_8_ = 0;
  auVar1638._0_8_ = dVar4;
  auVar2033._8_8_ = 0;
  auVar2033._0_8_ = dVar4 + dVar4;
  auVar2063._8_8_ = 0;
  auVar2063._0_8_ = in_stack_00000008[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2033,auVar2063,auVar9);
  auVar1901._8_8_ = 0;
  auVar1901._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1901,auVar1799,auVar9);
  auVar1800._8_8_ = 0;
  auVar1800._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1800,auVar324,auVar9);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar175,auVar1974,auVar9);
  auVar325._8_8_ = 0;
  auVar325._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar325,auVar1285,auVar9);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar176,auVar2063,auVar9);
  auVar326._8_8_ = 0;
  auVar326._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar326,auVar1638,auVar9);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar78,auVar526,auVar9);
  *(long *)(ctx + 0x5f00) = auVar9._0_8_;
  dVar1 = in_RDX[5];
  dVar2 = in_RDX[4];
  auVar814._8_8_ = 0;
  auVar814._0_8_ = in_R9[4];
  auVar1801._8_8_ = 0;
  auVar1801._0_8_ = in_R9[9];
  auVar1975._8_8_ = 0;
  auVar1975._0_8_ = in_R9[10];
  dVar3 = in_RDX[3];
  auVar527._8_8_ = 0;
  auVar527._0_8_ = in_R9[3];
  auVar327._8_8_ = 0;
  auVar327._0_8_ = dVar2 + dVar2;
  auVar1286._8_8_ = 0;
  auVar1286._0_8_ = (dVar1 + dVar1) * in_R9[5];
  auVar9 = vfmadd231sd_fma(auVar1286,auVar814,auVar327);
  dVar4 = in_RDX[9];
  auVar328._8_8_ = 0;
  auVar328._0_8_ = dVar4;
  auVar1639._8_8_ = 0;
  auVar1639._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1639,auVar1801,auVar9);
  dVar4 = in_RDX[10];
  auVar1287._8_8_ = 0;
  auVar1287._0_8_ = dVar4;
  auVar1902._8_8_ = 0;
  auVar1902._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1902,auVar1975,auVar9);
  dVar4 = in_RDX[0xb];
  auVar1640._8_8_ = 0;
  auVar1640._0_8_ = dVar4;
  auVar2034._8_8_ = 0;
  auVar2034._0_8_ = dVar4 + dVar4;
  auVar2064._8_8_ = 0;
  auVar2064._0_8_ = in_R9[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2034,auVar2064,auVar9);
  auVar1903._8_8_ = 0;
  auVar1903._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1903,auVar1801,auVar9);
  auVar1802._8_8_ = 0;
  auVar1802._0_8_ = in_R9[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1802,auVar328,auVar9);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar177,auVar1975,auVar9);
  auVar329._8_8_ = 0;
  auVar329._0_8_ = in_R9[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar329,auVar1287,auVar9);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar178,auVar2064,auVar9);
  auVar330._8_8_ = 0;
  auVar330._0_8_ = in_R9[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar330,auVar1640,auVar9);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar79,auVar527,auVar9);
  *(long *)(ctx + 0x6060) = auVar9._0_8_;
  dVar1 = in_RDX[5];
  dVar2 = in_RDX[4];
  auVar815._8_8_ = 0;
  auVar815._0_8_ = in_R8[4];
  auVar1803._8_8_ = 0;
  auVar1803._0_8_ = in_R8[9];
  auVar1976._8_8_ = 0;
  auVar1976._0_8_ = in_R8[10];
  dVar3 = in_RDX[3];
  auVar528._8_8_ = 0;
  auVar528._0_8_ = in_R8[3];
  auVar331._8_8_ = 0;
  auVar331._0_8_ = dVar2 + dVar2;
  auVar1288._8_8_ = 0;
  auVar1288._0_8_ = (dVar1 + dVar1) * in_R8[5];
  auVar9 = vfmadd231sd_fma(auVar1288,auVar815,auVar331);
  dVar4 = in_RDX[9];
  auVar332._8_8_ = 0;
  auVar332._0_8_ = dVar4;
  auVar1641._8_8_ = 0;
  auVar1641._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1641,auVar1803,auVar9);
  dVar4 = in_RDX[10];
  auVar1289._8_8_ = 0;
  auVar1289._0_8_ = dVar4;
  auVar1904._8_8_ = 0;
  auVar1904._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1904,auVar1976,auVar9);
  dVar4 = in_RDX[0xb];
  auVar1642._8_8_ = 0;
  auVar1642._0_8_ = dVar4;
  auVar2035._8_8_ = 0;
  auVar2035._0_8_ = dVar4 + dVar4;
  auVar2065._8_8_ = 0;
  auVar2065._0_8_ = in_R8[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2035,auVar2065,auVar9);
  auVar1905._8_8_ = 0;
  auVar1905._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1905,auVar1803,auVar9);
  auVar1804._8_8_ = 0;
  auVar1804._0_8_ = in_R8[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1804,auVar332,auVar9);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar179,auVar1976,auVar9);
  auVar333._8_8_ = 0;
  auVar333._0_8_ = in_R8[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar333,auVar1289,auVar9);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar180,auVar2065,auVar9);
  auVar334._8_8_ = 0;
  auVar334._0_8_ = in_R8[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar334,auVar1642,auVar9);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar80,auVar528,auVar9);
  *(long *)(ctx + 0x61c0) = auVar9._0_8_;
  dVar1 = in_RDX[5];
  dVar2 = in_RDX[4];
  auVar816._8_8_ = 0;
  auVar816._0_8_ = in_RCX[4];
  auVar1805._8_8_ = 0;
  auVar1805._0_8_ = in_RCX[9];
  auVar1977._8_8_ = 0;
  auVar1977._0_8_ = in_RCX[10];
  dVar3 = in_RDX[3];
  auVar529._8_8_ = 0;
  auVar529._0_8_ = in_RCX[3];
  auVar335._8_8_ = 0;
  auVar335._0_8_ = dVar2 + dVar2;
  auVar1290._8_8_ = 0;
  auVar1290._0_8_ = (dVar1 + dVar1) * in_RCX[5];
  auVar9 = vfmadd231sd_fma(auVar1290,auVar816,auVar335);
  dVar4 = in_RDX[9];
  auVar336._8_8_ = 0;
  auVar336._0_8_ = dVar4;
  auVar1643._8_8_ = 0;
  auVar1643._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1643,auVar1805,auVar9);
  dVar4 = in_RDX[10];
  auVar1291._8_8_ = 0;
  auVar1291._0_8_ = dVar4;
  auVar1906._8_8_ = 0;
  auVar1906._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1906,auVar1977,auVar9);
  dVar4 = in_RDX[0xb];
  auVar1644._8_8_ = 0;
  auVar1644._0_8_ = dVar4;
  auVar2036._8_8_ = 0;
  auVar2036._0_8_ = dVar4 + dVar4;
  auVar2066._8_8_ = 0;
  auVar2066._0_8_ = in_RCX[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2036,auVar2066,auVar9);
  auVar1907._8_8_ = 0;
  auVar1907._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1907,auVar1805,auVar9);
  auVar1806._8_8_ = 0;
  auVar1806._0_8_ = in_RCX[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1806,auVar336,auVar9);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar181,auVar1977,auVar9);
  auVar337._8_8_ = 0;
  auVar337._0_8_ = in_RCX[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar337,auVar1291,auVar9);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar182,auVar2066,auVar9);
  auVar338._8_8_ = 0;
  auVar338._0_8_ = in_RCX[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar338,auVar1644,auVar9);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar81,auVar529,auVar9);
  *(long *)(ctx + 0x6320) = auVar9._0_8_;
  dVar1 = in_RDX[4];
  dVar2 = in_RDX[5];
  dVar3 = in_RDX[3];
  dVar4 = in_RDX[9];
  auVar817._8_8_ = 0;
  auVar817._0_8_ = dVar4;
  dVar5 = in_RDX[10];
  auVar1042._8_8_ = 0;
  auVar1042._0_8_ = dVar5;
  dVar6 = in_RDX[0xb];
  auVar1292._8_8_ = 0;
  auVar1292._0_8_ = dVar6;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar3 * -2.0;
  auVar339._8_8_ = 0;
  auVar339._0_8_ =
       dVar3 * dVar3 + dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2
  ;
  auVar9 = vfmadd213sd_fma(auVar82,auVar817,auVar339);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar183,auVar1042,auVar9);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar83,auVar1292,auVar9);
  *(long *)(ctx + 0x6480) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar818._8_8_ = 0;
  auVar818._0_8_ = in_stack_00000008[3];
  auVar1489._8_8_ = 0;
  auVar1489._0_8_ = in_stack_00000008[5];
  auVar1807._8_8_ = 0;
  auVar1807._0_8_ = in_stack_00000008[9];
  auVar1978._8_8_ = 0;
  auVar1978._0_8_ = in_stack_00000008[10];
  auVar340._8_8_ = 0;
  auVar340._0_8_ = dVar2 + dVar2;
  auVar530._8_8_ = 0;
  auVar530._0_8_ = in_stack_00000008[4] * (dVar1 + dVar1);
  auVar9 = vfmadd231sd_fma(auVar530,auVar818,auVar340);
  dVar3 = in_RSI[5];
  auVar1293._8_8_ = 0;
  auVar1293._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1293,auVar1489,auVar9);
  dVar4 = in_RSI[9];
  auVar531._8_8_ = 0;
  auVar531._0_8_ = dVar4;
  auVar1645._8_8_ = 0;
  auVar1645._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1645,auVar1807,auVar9);
  dVar4 = in_RSI[10];
  auVar1294._8_8_ = 0;
  auVar1294._0_8_ = dVar4;
  auVar1908._8_8_ = 0;
  auVar1908._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1908,auVar1978,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1646._8_8_ = 0;
  auVar1646._0_8_ = dVar4;
  auVar2037._8_8_ = 0;
  auVar2037._0_8_ = dVar4 + dVar4;
  auVar2067._8_8_ = 0;
  auVar2067._0_8_ = in_stack_00000008[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2037,auVar2067,auVar9);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar84,auVar1807,auVar9);
  auVar819._8_8_ = 0;
  auVar819._0_8_ = in_stack_00000008[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar819,auVar531,auVar9);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar85,auVar1978,auVar9);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = in_stack_00000008[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar184,auVar1294,auVar9);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar86,auVar2067,auVar9);
  auVar185._8_8_ = 0;
  auVar185._0_8_ = in_stack_00000008[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar185,auVar1646,auVar9);
  *(long *)(ctx + 0x65e0) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar820._8_8_ = 0;
  auVar820._0_8_ = in_R9[3];
  auVar1490._8_8_ = 0;
  auVar1490._0_8_ = in_R9[5];
  auVar1808._8_8_ = 0;
  auVar1808._0_8_ = in_R9[9];
  auVar1979._8_8_ = 0;
  auVar1979._0_8_ = in_R9[10];
  auVar341._8_8_ = 0;
  auVar341._0_8_ = dVar2 + dVar2;
  auVar532._8_8_ = 0;
  auVar532._0_8_ = in_R9[4] * (dVar1 + dVar1);
  auVar9 = vfmadd231sd_fma(auVar532,auVar820,auVar341);
  dVar3 = in_RSI[5];
  auVar1295._8_8_ = 0;
  auVar1295._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1295,auVar1490,auVar9);
  dVar4 = in_RSI[9];
  auVar533._8_8_ = 0;
  auVar533._0_8_ = dVar4;
  auVar1647._8_8_ = 0;
  auVar1647._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1647,auVar1808,auVar9);
  dVar4 = in_RSI[10];
  auVar1296._8_8_ = 0;
  auVar1296._0_8_ = dVar4;
  auVar1909._8_8_ = 0;
  auVar1909._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1909,auVar1979,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1648._8_8_ = 0;
  auVar1648._0_8_ = dVar4;
  auVar2038._8_8_ = 0;
  auVar2038._0_8_ = dVar4 + dVar4;
  auVar2068._8_8_ = 0;
  auVar2068._0_8_ = in_R9[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2038,auVar2068,auVar9);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar87,auVar1808,auVar9);
  auVar821._8_8_ = 0;
  auVar821._0_8_ = in_R9[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar821,auVar533,auVar9);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar88,auVar1979,auVar9);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = in_R9[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar186,auVar1296,auVar9);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar89,auVar2068,auVar9);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = in_R9[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar187,auVar1648,auVar9);
  *(long *)(ctx + 0x6740) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar822._8_8_ = 0;
  auVar822._0_8_ = in_R8[3];
  auVar1491._8_8_ = 0;
  auVar1491._0_8_ = in_R8[5];
  auVar1809._8_8_ = 0;
  auVar1809._0_8_ = in_R8[9];
  auVar1980._8_8_ = 0;
  auVar1980._0_8_ = in_R8[10];
  auVar342._8_8_ = 0;
  auVar342._0_8_ = dVar2 + dVar2;
  auVar534._8_8_ = 0;
  auVar534._0_8_ = in_R8[4] * (dVar1 + dVar1);
  auVar9 = vfmadd231sd_fma(auVar534,auVar822,auVar342);
  dVar3 = in_RSI[5];
  auVar1297._8_8_ = 0;
  auVar1297._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1297,auVar1491,auVar9);
  dVar4 = in_RSI[9];
  auVar535._8_8_ = 0;
  auVar535._0_8_ = dVar4;
  auVar1649._8_8_ = 0;
  auVar1649._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1649,auVar1809,auVar9);
  dVar4 = in_RSI[10];
  auVar1298._8_8_ = 0;
  auVar1298._0_8_ = dVar4;
  auVar1910._8_8_ = 0;
  auVar1910._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1910,auVar1980,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1650._8_8_ = 0;
  auVar1650._0_8_ = dVar4;
  auVar2039._8_8_ = 0;
  auVar2039._0_8_ = dVar4 + dVar4;
  auVar2069._8_8_ = 0;
  auVar2069._0_8_ = in_R8[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2039,auVar2069,auVar9);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar90,auVar1809,auVar9);
  auVar823._8_8_ = 0;
  auVar823._0_8_ = in_R8[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar823,auVar535,auVar9);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar91,auVar1980,auVar9);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = in_R8[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar188,auVar1298,auVar9);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar92,auVar2069,auVar9);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = in_R8[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar189,auVar1650,auVar9);
  *(long *)(ctx + 0x68a0) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar824._8_8_ = 0;
  auVar824._0_8_ = in_RCX[3];
  auVar1492._8_8_ = 0;
  auVar1492._0_8_ = in_RCX[5];
  auVar1810._8_8_ = 0;
  auVar1810._0_8_ = in_RCX[9];
  auVar1981._8_8_ = 0;
  auVar1981._0_8_ = in_RCX[10];
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dVar2 + dVar2;
  auVar536._8_8_ = 0;
  auVar536._0_8_ = in_RCX[4] * (dVar1 + dVar1);
  auVar9 = vfmadd231sd_fma(auVar536,auVar824,auVar343);
  dVar3 = in_RSI[5];
  auVar1299._8_8_ = 0;
  auVar1299._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1299,auVar1492,auVar9);
  dVar4 = in_RSI[9];
  auVar537._8_8_ = 0;
  auVar537._0_8_ = dVar4;
  auVar1651._8_8_ = 0;
  auVar1651._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1651,auVar1810,auVar9);
  dVar4 = in_RSI[10];
  auVar1300._8_8_ = 0;
  auVar1300._0_8_ = dVar4;
  auVar1911._8_8_ = 0;
  auVar1911._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1911,auVar1981,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1652._8_8_ = 0;
  auVar1652._0_8_ = dVar4;
  auVar2040._8_8_ = 0;
  auVar2040._0_8_ = dVar4 + dVar4;
  auVar2070._8_8_ = 0;
  auVar2070._0_8_ = in_RCX[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2040,auVar2070,auVar9);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar93,auVar1810,auVar9);
  auVar825._8_8_ = 0;
  auVar825._0_8_ = in_RCX[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar825,auVar537,auVar9);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar94,auVar1981,auVar9);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = in_RCX[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar190,auVar1300,auVar9);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar95,auVar2070,auVar9);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = in_RCX[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar191,auVar1652,auVar9);
  *(long *)(ctx + 0x6a00) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  auVar826._8_8_ = 0;
  auVar826._0_8_ = in_RDX[3];
  auVar1493._8_8_ = 0;
  auVar1493._0_8_ = in_RDX[5];
  auVar1811._8_8_ = 0;
  auVar1811._0_8_ = in_RDX[9];
  auVar1982._8_8_ = 0;
  auVar1982._0_8_ = in_RDX[10];
  auVar344._8_8_ = 0;
  auVar344._0_8_ = dVar2 + dVar2;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = in_RDX[4] * (dVar1 + dVar1);
  auVar9 = vfmadd231sd_fma(auVar538,auVar826,auVar344);
  dVar3 = in_RSI[5];
  auVar1301._8_8_ = 0;
  auVar1301._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1301,auVar1493,auVar9);
  dVar4 = in_RSI[9];
  auVar539._8_8_ = 0;
  auVar539._0_8_ = dVar4;
  auVar1653._8_8_ = 0;
  auVar1653._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1653,auVar1811,auVar9);
  dVar4 = in_RSI[10];
  auVar1302._8_8_ = 0;
  auVar1302._0_8_ = dVar4;
  auVar1912._8_8_ = 0;
  auVar1912._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1912,auVar1982,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1654._8_8_ = 0;
  auVar1654._0_8_ = dVar4;
  auVar2041._8_8_ = 0;
  auVar2041._0_8_ = dVar4 + dVar4;
  auVar2071._8_8_ = 0;
  auVar2071._0_8_ = in_RDX[0xb];
  auVar9 = vfmadd213sd_avx512f(auVar2041,auVar2071,auVar9);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar96,auVar1811,auVar9);
  auVar827._8_8_ = 0;
  auVar827._0_8_ = in_RDX[3] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar827,auVar539,auVar9);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar97,auVar1982,auVar9);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = in_RDX[4] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar192,auVar1302,auVar9);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_avx512f(auVar98,auVar2071,auVar9);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = in_RDX[5] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar193,auVar1654,auVar9);
  *(long *)(ctx + 0x6b60) = auVar9._0_8_;
  dVar1 = in_RSI[4];
  dVar2 = in_RSI[3];
  dVar3 = in_RSI[5];
  dVar4 = in_RSI[9];
  auVar540._8_8_ = 0;
  auVar540._0_8_ = dVar4;
  dVar5 = in_RSI[10];
  auVar828._8_8_ = 0;
  auVar828._0_8_ = dVar5;
  dVar6 = in_RSI[0xb];
  auVar1043._8_8_ = 0;
  auVar1043._0_8_ = dVar6;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       dVar2 * dVar2 +
       dVar6 * dVar6 +
       dVar5 * dVar5 +
       (dVar1 * dVar1 - auVar12._0_8_ * auVar12._0_8_) + dVar3 * dVar3 + dVar4 * dVar4;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar99,auVar540,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar14,auVar828,auVar9);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar100,auVar1043,auVar9);
  *(long *)(ctx + 0x6cc0) = auVar9._0_8_;
  dVar1 = in_stack_00000008[6];
  dVar2 = in_stack_00000008[7];
  dVar3 = in_stack_00000008[8];
  dVar4 = in_stack_00000008[9];
  auVar541._8_8_ = 0;
  auVar541._0_8_ = dVar4;
  dVar5 = in_stack_00000008[10];
  auVar829._8_8_ = 0;
  auVar829._0_8_ = dVar5;
  dVar6 = in_stack_00000008[0xb];
  auVar1044._8_8_ = 0;
  auVar1044._0_8_ = dVar6;
  auVar194._8_8_ = 0;
  auVar194._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar345,auVar1044,auVar194);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar15,auVar541,auVar9);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar101,auVar829,auVar9);
  *(long *)(ctx + 0x5148) = auVar9._0_8_;
  dVar1 = in_R9[7];
  dVar2 = in_R9[6];
  auVar542._8_8_ = 0;
  auVar542._0_8_ = in_stack_00000008[6];
  auVar1303._8_8_ = 0;
  auVar1303._0_8_ = in_stack_00000008[8];
  auVar1655._8_8_ = 0;
  auVar1655._0_8_ = in_stack_00000008[9];
  auVar1913._8_8_ = 0;
  auVar1913._0_8_ = in_stack_00000008[10];
  auVar2042._8_8_ = 0;
  auVar2042._0_8_ = in_stack_00000008[0xb];
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar2 + dVar2;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = (dVar1 + dVar1) * in_stack_00000008[7];
  auVar9 = vfmadd231sd_fma(auVar346,auVar542,auVar195);
  dVar3 = in_R9[8];
  auVar1045._8_8_ = 0;
  auVar1045._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1045,auVar1303,auVar9);
  dVar4 = in_R9[9];
  auVar347._8_8_ = 0;
  auVar347._0_8_ = dVar4;
  auVar1494._8_8_ = 0;
  auVar1494._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1494,auVar1655,auVar9);
  dVar4 = in_R9[10];
  auVar1046._8_8_ = 0;
  auVar1046._0_8_ = dVar4;
  auVar1812._8_8_ = 0;
  auVar1812._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1812,auVar1913,auVar9);
  dVar4 = in_R9[0xb];
  auVar1495._8_8_ = 0;
  auVar1495._0_8_ = dVar4;
  auVar1983._8_8_ = 0;
  auVar1983._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1983,auVar2042,auVar9);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar16,auVar1655,auVar9);
  auVar543._8_8_ = 0;
  auVar543._0_8_ = in_stack_00000008[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar543,auVar347,auVar9);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar17,auVar1913,auVar9);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = in_stack_00000008[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar102,auVar1046,auVar9);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar18,auVar2042,auVar9);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = in_stack_00000008[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar103,auVar1495,auVar9);
  *(long *)(ctx + 0x52a8) = auVar9._0_8_;
  dVar1 = in_R9[6];
  dVar2 = in_R9[7];
  dVar3 = in_R9[8];
  dVar4 = in_R9[9];
  auVar544._8_8_ = 0;
  auVar544._0_8_ = dVar4;
  dVar5 = in_R9[10];
  auVar830._8_8_ = 0;
  auVar830._0_8_ = dVar5;
  dVar6 = in_R9[0xb];
  auVar1047._8_8_ = 0;
  auVar1047._0_8_ = dVar6;
  auVar196._8_8_ = 0;
  auVar196._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar348,auVar1047,auVar196);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar19,auVar544,auVar9);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar104,auVar830,auVar9);
  *(long *)(ctx + 0x5408) = auVar9._0_8_;
  dVar1 = in_R8[7];
  dVar2 = in_R8[6];
  auVar545._8_8_ = 0;
  auVar545._0_8_ = in_stack_00000008[6];
  auVar1304._8_8_ = 0;
  auVar1304._0_8_ = in_stack_00000008[8];
  auVar1656._8_8_ = 0;
  auVar1656._0_8_ = in_stack_00000008[9];
  auVar1914._8_8_ = 0;
  auVar1914._0_8_ = in_stack_00000008[10];
  auVar2043._8_8_ = 0;
  auVar2043._0_8_ = in_stack_00000008[0xb];
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar2 + dVar2;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = (dVar1 + dVar1) * in_stack_00000008[7];
  auVar9 = vfmadd231sd_fma(auVar349,auVar545,auVar197);
  dVar3 = in_R8[8];
  auVar1048._8_8_ = 0;
  auVar1048._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1048,auVar1304,auVar9);
  dVar4 = in_R8[9];
  auVar350._8_8_ = 0;
  auVar350._0_8_ = dVar4;
  auVar1496._8_8_ = 0;
  auVar1496._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1496,auVar1656,auVar9);
  dVar4 = in_R8[10];
  auVar1049._8_8_ = 0;
  auVar1049._0_8_ = dVar4;
  auVar1813._8_8_ = 0;
  auVar1813._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1813,auVar1914,auVar9);
  dVar4 = in_R8[0xb];
  auVar1497._8_8_ = 0;
  auVar1497._0_8_ = dVar4;
  auVar1984._8_8_ = 0;
  auVar1984._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1984,auVar2043,auVar9);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar105,auVar1914,auVar9);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar20,auVar1656,auVar9);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = in_stack_00000008[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar106,auVar350,auVar9);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = in_stack_00000008[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar21,auVar1049,auVar9);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar107,auVar2043,auVar9);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = in_stack_00000008[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar22,auVar1497,auVar9);
  *(long *)(ctx + 0x5568) = auVar9._0_8_;
  dVar1 = in_R8[7];
  dVar2 = in_R8[6];
  auVar546._8_8_ = 0;
  auVar546._0_8_ = in_R9[6];
  auVar1305._8_8_ = 0;
  auVar1305._0_8_ = in_R9[8];
  auVar1657._8_8_ = 0;
  auVar1657._0_8_ = in_R9[9];
  auVar1915._8_8_ = 0;
  auVar1915._0_8_ = in_R9[10];
  auVar2044._8_8_ = 0;
  auVar2044._0_8_ = in_R9[0xb];
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar2 + dVar2;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = (dVar1 + dVar1) * in_R9[7];
  auVar9 = vfmadd231sd_fma(auVar351,auVar546,auVar198);
  dVar3 = in_R8[8];
  auVar1050._8_8_ = 0;
  auVar1050._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1050,auVar1305,auVar9);
  dVar4 = in_R8[9];
  auVar352._8_8_ = 0;
  auVar352._0_8_ = dVar4;
  auVar1498._8_8_ = 0;
  auVar1498._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1498,auVar1657,auVar9);
  dVar4 = in_R8[10];
  auVar1051._8_8_ = 0;
  auVar1051._0_8_ = dVar4;
  auVar1814._8_8_ = 0;
  auVar1814._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1814,auVar1915,auVar9);
  dVar4 = in_R8[0xb];
  auVar1499._8_8_ = 0;
  auVar1499._0_8_ = dVar4;
  auVar1985._8_8_ = 0;
  auVar1985._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1985,auVar2044,auVar9);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar108,auVar1915,auVar9);
  auVar831._8_8_ = 0;
  auVar831._0_8_ = in_R9[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar831,auVar1051,auVar9);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar23,auVar1657,auVar9);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = in_R9[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar109,auVar352,auVar9);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar24,auVar2044,auVar9);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = in_R9[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar110,auVar1499,auVar9);
  *(long *)(ctx + 0x56c8) = auVar9._0_8_;
  dVar1 = in_R8[6];
  dVar2 = in_R8[7];
  dVar3 = in_R8[8];
  dVar4 = in_R8[9];
  auVar547._8_8_ = 0;
  auVar547._0_8_ = dVar4;
  dVar5 = in_R8[10];
  auVar832._8_8_ = 0;
  auVar832._0_8_ = dVar5;
  dVar6 = in_R8[0xb];
  auVar1052._8_8_ = 0;
  auVar1052._0_8_ = dVar6;
  auVar199._8_8_ = 0;
  auVar199._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar353,auVar1052,auVar199);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar25,auVar547,auVar9);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar111,auVar832,auVar9);
  *(long *)(ctx + 0x5828) = auVar9._0_8_;
  dVar1 = in_RCX[7];
  dVar2 = in_RCX[6];
  auVar548._8_8_ = 0;
  auVar548._0_8_ = in_stack_00000008[6];
  auVar1306._8_8_ = 0;
  auVar1306._0_8_ = in_stack_00000008[8];
  auVar1658._8_8_ = 0;
  auVar1658._0_8_ = in_stack_00000008[9];
  auVar1916._8_8_ = 0;
  auVar1916._0_8_ = in_stack_00000008[10];
  auVar2045._8_8_ = 0;
  auVar2045._0_8_ = in_stack_00000008[0xb];
  auVar200._8_8_ = 0;
  auVar200._0_8_ = dVar2 + dVar2;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = (dVar1 + dVar1) * in_stack_00000008[7];
  auVar9 = vfmadd231sd_fma(auVar354,auVar548,auVar200);
  dVar3 = in_RCX[8];
  auVar1053._8_8_ = 0;
  auVar1053._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1053,auVar1306,auVar9);
  dVar4 = in_RCX[9];
  auVar355._8_8_ = 0;
  auVar355._0_8_ = dVar4;
  auVar1500._8_8_ = 0;
  auVar1500._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1500,auVar1658,auVar9);
  dVar4 = in_RCX[10];
  auVar1054._8_8_ = 0;
  auVar1054._0_8_ = dVar4;
  auVar1815._8_8_ = 0;
  auVar1815._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1815,auVar1916,auVar9);
  dVar4 = in_RCX[0xb];
  auVar1501._8_8_ = 0;
  auVar1501._0_8_ = dVar4;
  auVar1986._8_8_ = 0;
  auVar1986._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1986,auVar2045,auVar9);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar26,auVar1658,auVar9);
  auVar549._8_8_ = 0;
  auVar549._0_8_ = in_stack_00000008[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar549,auVar355,auVar9);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar27,auVar1916,auVar9);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = in_stack_00000008[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar112,auVar1054,auVar9);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar28,auVar2045,auVar9);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = in_stack_00000008[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar113,auVar1501,auVar9);
  *(long *)(ctx + 0x5988) = auVar9._0_8_;
  dVar1 = in_RCX[7];
  dVar2 = in_RCX[6];
  auVar550._8_8_ = 0;
  auVar550._0_8_ = in_R9[6];
  auVar1307._8_8_ = 0;
  auVar1307._0_8_ = in_R9[8];
  auVar1659._8_8_ = 0;
  auVar1659._0_8_ = in_R9[9];
  auVar1917._8_8_ = 0;
  auVar1917._0_8_ = in_R9[10];
  auVar2046._8_8_ = 0;
  auVar2046._0_8_ = in_R9[0xb];
  auVar201._8_8_ = 0;
  auVar201._0_8_ = dVar2 + dVar2;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = (dVar1 + dVar1) * in_R9[7];
  auVar9 = vfmadd231sd_fma(auVar356,auVar550,auVar201);
  dVar3 = in_RCX[8];
  auVar1055._8_8_ = 0;
  auVar1055._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1055,auVar1307,auVar9);
  dVar4 = in_RCX[9];
  auVar357._8_8_ = 0;
  auVar357._0_8_ = dVar4;
  auVar1502._8_8_ = 0;
  auVar1502._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1502,auVar1659,auVar9);
  dVar4 = in_RCX[10];
  auVar1056._8_8_ = 0;
  auVar1056._0_8_ = dVar4;
  auVar1816._8_8_ = 0;
  auVar1816._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1816,auVar1917,auVar9);
  dVar4 = in_RCX[0xb];
  auVar1503._8_8_ = 0;
  auVar1503._0_8_ = dVar4;
  auVar1987._8_8_ = 0;
  auVar1987._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1987,auVar2046,auVar9);
  auVar833._8_8_ = 0;
  auVar833._0_8_ = in_R9[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar833,auVar1056,auVar9);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar29,auVar1659,auVar9);
  auVar551._8_8_ = 0;
  auVar551._0_8_ = in_R9[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar551,auVar357,auVar9);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar30,auVar1917,auVar9);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar114,auVar2046,auVar9);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = in_R9[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar31,auVar1503,auVar9);
  *(long *)(ctx + 0x5ae8) = auVar9._0_8_;
  dVar1 = in_RCX[7];
  dVar2 = in_RCX[6];
  auVar552._8_8_ = 0;
  auVar552._0_8_ = in_R8[6];
  auVar1308._8_8_ = 0;
  auVar1308._0_8_ = in_R8[8];
  auVar1660._8_8_ = 0;
  auVar1660._0_8_ = in_R8[9];
  auVar1918._8_8_ = 0;
  auVar1918._0_8_ = in_R8[10];
  auVar2047._8_8_ = 0;
  auVar2047._0_8_ = in_R8[0xb];
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar2 + dVar2;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = (dVar1 + dVar1) * in_R8[7];
  auVar9 = vfmadd231sd_fma(auVar358,auVar552,auVar202);
  dVar3 = in_RCX[8];
  auVar1057._8_8_ = 0;
  auVar1057._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1057,auVar1308,auVar9);
  dVar4 = in_RCX[9];
  auVar359._8_8_ = 0;
  auVar359._0_8_ = dVar4;
  auVar1504._8_8_ = 0;
  auVar1504._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1504,auVar1660,auVar9);
  dVar4 = in_RCX[10];
  auVar1058._8_8_ = 0;
  auVar1058._0_8_ = dVar4;
  auVar1817._8_8_ = 0;
  auVar1817._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1817,auVar1918,auVar9);
  dVar4 = in_RCX[0xb];
  auVar1505._8_8_ = 0;
  auVar1505._0_8_ = dVar4;
  auVar1988._8_8_ = 0;
  auVar1988._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1988,auVar2047,auVar9);
  auVar834._8_8_ = 0;
  auVar834._0_8_ = in_R8[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar834,auVar1058,auVar9);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar32,auVar1660,auVar9);
  auVar553._8_8_ = 0;
  auVar553._0_8_ = in_R8[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar553,auVar359,auVar9);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar33,auVar1918,auVar9);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar115,auVar2047,auVar9);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = in_R8[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar34,auVar1505,auVar9);
  *(long *)(ctx + 0x5c48) = auVar9._0_8_;
  dVar1 = in_RCX[6];
  dVar2 = in_RCX[7];
  dVar3 = in_RCX[8];
  dVar4 = in_RCX[9];
  auVar554._8_8_ = 0;
  auVar554._0_8_ = dVar4;
  dVar5 = in_RCX[10];
  auVar835._8_8_ = 0;
  auVar835._0_8_ = dVar5;
  dVar6 = in_RCX[0xb];
  auVar1059._8_8_ = 0;
  auVar1059._0_8_ = dVar6;
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar360,auVar1059,auVar203);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar35,auVar554,auVar9);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar116,auVar835,auVar9);
  *(long *)(ctx + 0x5da8) = auVar9._0_8_;
  dVar1 = in_RDX[7];
  dVar2 = in_RDX[6];
  auVar555._8_8_ = 0;
  auVar555._0_8_ = in_stack_00000008[6];
  auVar1309._8_8_ = 0;
  auVar1309._0_8_ = in_stack_00000008[8];
  auVar1661._8_8_ = 0;
  auVar1661._0_8_ = in_stack_00000008[9];
  auVar1919._8_8_ = 0;
  auVar1919._0_8_ = in_stack_00000008[10];
  auVar2048._8_8_ = 0;
  auVar2048._0_8_ = in_stack_00000008[0xb];
  auVar204._8_8_ = 0;
  auVar204._0_8_ = dVar2 + dVar2;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = (dVar1 + dVar1) * in_stack_00000008[7];
  auVar9 = vfmadd231sd_fma(auVar361,auVar555,auVar204);
  dVar3 = in_RDX[8];
  auVar1060._8_8_ = 0;
  auVar1060._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1060,auVar1309,auVar9);
  dVar4 = in_RDX[9];
  auVar362._8_8_ = 0;
  auVar362._0_8_ = dVar4;
  auVar1506._8_8_ = 0;
  auVar1506._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1506,auVar1661,auVar9);
  dVar4 = in_RDX[10];
  auVar1061._8_8_ = 0;
  auVar1061._0_8_ = dVar4;
  auVar1818._8_8_ = 0;
  auVar1818._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1818,auVar1919,auVar9);
  dVar4 = in_RDX[0xb];
  auVar1507._8_8_ = 0;
  auVar1507._0_8_ = dVar4;
  auVar1989._8_8_ = 0;
  auVar1989._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1989,auVar2048,auVar9);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar36,auVar1661,auVar9);
  auVar556._8_8_ = 0;
  auVar556._0_8_ = in_stack_00000008[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar556,auVar362,auVar9);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar37,auVar1919,auVar9);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = in_stack_00000008[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar117,auVar1061,auVar9);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar38,auVar2048,auVar9);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = in_stack_00000008[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar118,auVar1507,auVar9);
  *(long *)(ctx + 0x5f08) = auVar9._0_8_;
  dVar1 = in_RDX[7];
  dVar2 = in_RDX[6];
  auVar557._8_8_ = 0;
  auVar557._0_8_ = in_R9[6];
  auVar1310._8_8_ = 0;
  auVar1310._0_8_ = in_R9[8];
  auVar1662._8_8_ = 0;
  auVar1662._0_8_ = in_R9[9];
  auVar1920._8_8_ = 0;
  auVar1920._0_8_ = in_R9[10];
  auVar2049._8_8_ = 0;
  auVar2049._0_8_ = in_R9[0xb];
  auVar205._8_8_ = 0;
  auVar205._0_8_ = dVar2 + dVar2;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = (dVar1 + dVar1) * in_R9[7];
  auVar9 = vfmadd231sd_fma(auVar363,auVar557,auVar205);
  dVar3 = in_RDX[8];
  auVar1062._8_8_ = 0;
  auVar1062._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1062,auVar1310,auVar9);
  dVar4 = in_RDX[9];
  auVar364._8_8_ = 0;
  auVar364._0_8_ = dVar4;
  auVar1508._8_8_ = 0;
  auVar1508._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1508,auVar1662,auVar9);
  dVar4 = in_RDX[10];
  auVar1063._8_8_ = 0;
  auVar1063._0_8_ = dVar4;
  auVar1819._8_8_ = 0;
  auVar1819._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1819,auVar1920,auVar9);
  dVar4 = in_RDX[0xb];
  auVar1509._8_8_ = 0;
  auVar1509._0_8_ = dVar4;
  auVar1990._8_8_ = 0;
  auVar1990._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1990,auVar2049,auVar9);
  auVar836._8_8_ = 0;
  auVar836._0_8_ = in_R9[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar836,auVar1063,auVar9);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar39,auVar1662,auVar9);
  auVar558._8_8_ = 0;
  auVar558._0_8_ = in_R9[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar558,auVar364,auVar9);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar40,auVar1920,auVar9);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar119,auVar2049,auVar9);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = in_R9[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar41,auVar1509,auVar9);
  *(long *)(ctx + 0x6068) = auVar9._0_8_;
  dVar1 = in_RDX[7];
  dVar2 = in_RDX[6];
  auVar559._8_8_ = 0;
  auVar559._0_8_ = in_R8[6];
  auVar1311._8_8_ = 0;
  auVar1311._0_8_ = in_R8[8];
  auVar1663._8_8_ = 0;
  auVar1663._0_8_ = in_R8[9];
  auVar1921._8_8_ = 0;
  auVar1921._0_8_ = in_R8[10];
  auVar2050._8_8_ = 0;
  auVar2050._0_8_ = in_R8[0xb];
  auVar206._8_8_ = 0;
  auVar206._0_8_ = dVar2 + dVar2;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = (dVar1 + dVar1) * in_R8[7];
  auVar9 = vfmadd231sd_fma(auVar365,auVar559,auVar206);
  dVar3 = in_RDX[8];
  auVar1064._8_8_ = 0;
  auVar1064._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1064,auVar1311,auVar9);
  dVar4 = in_RDX[9];
  auVar366._8_8_ = 0;
  auVar366._0_8_ = dVar4;
  auVar1510._8_8_ = 0;
  auVar1510._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1510,auVar1663,auVar9);
  dVar4 = in_RDX[10];
  auVar1065._8_8_ = 0;
  auVar1065._0_8_ = dVar4;
  auVar1820._8_8_ = 0;
  auVar1820._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1820,auVar1921,auVar9);
  dVar4 = in_RDX[0xb];
  auVar1511._8_8_ = 0;
  auVar1511._0_8_ = dVar4;
  auVar1991._8_8_ = 0;
  auVar1991._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1991,auVar2050,auVar9);
  auVar837._8_8_ = 0;
  auVar837._0_8_ = in_R8[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar837,auVar1065,auVar9);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar42,auVar1663,auVar9);
  auVar560._8_8_ = 0;
  auVar560._0_8_ = in_R8[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar560,auVar366,auVar9);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar43,auVar1921,auVar9);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar120,auVar2050,auVar9);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = in_R8[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar44,auVar1511,auVar9);
  *(long *)(ctx + 0x61c8) = auVar9._0_8_;
  dVar1 = in_RDX[7];
  dVar2 = in_RDX[6];
  auVar561._8_8_ = 0;
  auVar561._0_8_ = in_RCX[6];
  auVar1312._8_8_ = 0;
  auVar1312._0_8_ = in_RCX[8];
  auVar1664._8_8_ = 0;
  auVar1664._0_8_ = in_RCX[9];
  auVar1922._8_8_ = 0;
  auVar1922._0_8_ = in_RCX[10];
  auVar2051._8_8_ = 0;
  auVar2051._0_8_ = in_RCX[0xb];
  auVar207._8_8_ = 0;
  auVar207._0_8_ = dVar2 + dVar2;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = (dVar1 + dVar1) * in_RCX[7];
  auVar9 = vfmadd231sd_fma(auVar367,auVar561,auVar207);
  dVar3 = in_RDX[8];
  auVar1066._8_8_ = 0;
  auVar1066._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1066,auVar1312,auVar9);
  dVar4 = in_RDX[9];
  auVar368._8_8_ = 0;
  auVar368._0_8_ = dVar4;
  auVar1512._8_8_ = 0;
  auVar1512._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1512,auVar1664,auVar9);
  dVar4 = in_RDX[10];
  auVar1067._8_8_ = 0;
  auVar1067._0_8_ = dVar4;
  auVar1821._8_8_ = 0;
  auVar1821._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1821,auVar1922,auVar9);
  dVar4 = in_RDX[0xb];
  auVar1513._8_8_ = 0;
  auVar1513._0_8_ = dVar4;
  auVar1992._8_8_ = 0;
  auVar1992._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1992,auVar2051,auVar9);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar45,auVar1664,auVar9);
  auVar562._8_8_ = 0;
  auVar562._0_8_ = in_RCX[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar562,auVar368,auVar9);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar46,auVar1922,auVar9);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = in_RCX[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar121,auVar1067,auVar9);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar47,auVar2051,auVar9);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = in_RCX[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar122,auVar1513,auVar9);
  *(long *)(ctx + 0x6328) = auVar9._0_8_;
  dVar1 = in_RDX[6];
  dVar2 = in_RDX[7];
  dVar3 = in_RDX[8];
  dVar4 = in_RDX[9];
  auVar563._8_8_ = 0;
  auVar563._0_8_ = dVar4;
  dVar5 = in_RDX[10];
  auVar838._8_8_ = 0;
  auVar838._0_8_ = dVar5;
  dVar6 = in_RDX[0xb];
  auVar1068._8_8_ = 0;
  auVar1068._0_8_ = dVar6;
  auVar208._8_8_ = 0;
  auVar208._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3 + dVar4 * dVar4
  ;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar369,auVar1068,auVar208);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar48,auVar563,auVar9);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar123,auVar838,auVar9);
  *(long *)(ctx + 0x6488) = auVar9._0_8_;
  dVar1 = in_RSI[7];
  dVar2 = in_RSI[6];
  auVar564._8_8_ = 0;
  auVar564._0_8_ = in_stack_00000008[6];
  auVar1313._8_8_ = 0;
  auVar1313._0_8_ = in_stack_00000008[8];
  auVar1665._8_8_ = 0;
  auVar1665._0_8_ = in_stack_00000008[9];
  auVar1923._8_8_ = 0;
  auVar1923._0_8_ = in_stack_00000008[10];
  auVar2052._8_8_ = 0;
  auVar2052._0_8_ = in_stack_00000008[0xb];
  auVar209._8_8_ = 0;
  auVar209._0_8_ = dVar2 + dVar2;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = (dVar1 + dVar1) * in_stack_00000008[7];
  auVar9 = vfmadd231sd_fma(auVar370,auVar564,auVar209);
  dVar3 = in_RSI[8];
  auVar1069._8_8_ = 0;
  auVar1069._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1069,auVar1313,auVar9);
  dVar4 = in_RSI[9];
  auVar371._8_8_ = 0;
  auVar371._0_8_ = dVar4;
  auVar1514._8_8_ = 0;
  auVar1514._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1514,auVar1665,auVar9);
  dVar4 = in_RSI[10];
  auVar1070._8_8_ = 0;
  auVar1070._0_8_ = dVar4;
  auVar1822._8_8_ = 0;
  auVar1822._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1822,auVar1923,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1515._8_8_ = 0;
  auVar1515._0_8_ = dVar4;
  auVar1993._8_8_ = 0;
  auVar1993._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1993,auVar2052,auVar9);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar210,auVar2052,auVar9);
  auVar1314._8_8_ = 0;
  auVar1314._0_8_ = in_stack_00000008[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1314,auVar1515,auVar9);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar49,auVar1665,auVar9);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = in_stack_00000008[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar211,auVar371,auVar9);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar50,auVar1923,auVar9);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = in_stack_00000008[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar124,auVar1070,auVar9);
  *(long *)(ctx + 0x65e8) = auVar9._0_8_;
  dVar1 = in_RSI[7];
  dVar2 = in_RSI[6];
  auVar565._8_8_ = 0;
  auVar565._0_8_ = in_R9[6];
  auVar1315._8_8_ = 0;
  auVar1315._0_8_ = in_R9[8];
  auVar1666._8_8_ = 0;
  auVar1666._0_8_ = in_R9[9];
  auVar1924._8_8_ = 0;
  auVar1924._0_8_ = in_R9[10];
  auVar2053._8_8_ = 0;
  auVar2053._0_8_ = in_R9[0xb];
  auVar212._8_8_ = 0;
  auVar212._0_8_ = dVar2 + dVar2;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = (dVar1 + dVar1) * in_R9[7];
  auVar9 = vfmadd231sd_fma(auVar372,auVar565,auVar212);
  dVar3 = in_RSI[8];
  auVar1071._8_8_ = 0;
  auVar1071._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1071,auVar1315,auVar9);
  dVar4 = in_RSI[9];
  auVar373._8_8_ = 0;
  auVar373._0_8_ = dVar4;
  auVar1516._8_8_ = 0;
  auVar1516._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1516,auVar1666,auVar9);
  dVar4 = in_RSI[10];
  auVar1072._8_8_ = 0;
  auVar1072._0_8_ = dVar4;
  auVar1823._8_8_ = 0;
  auVar1823._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1823,auVar1924,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1517._8_8_ = 0;
  auVar1517._0_8_ = dVar4;
  auVar1994._8_8_ = 0;
  auVar1994._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1994,auVar2053,auVar9);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar213,auVar2053,auVar9);
  auVar1316._8_8_ = 0;
  auVar1316._0_8_ = in_R9[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1316,auVar1517,auVar9);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar51,auVar1666,auVar9);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = in_R9[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar214,auVar373,auVar9);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar52,auVar1924,auVar9);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = in_R9[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar125,auVar1072,auVar9);
  *(long *)(ctx + 0x6748) = auVar9._0_8_;
  dVar1 = in_RSI[7];
  dVar2 = in_RSI[6];
  auVar566._8_8_ = 0;
  auVar566._0_8_ = in_R8[6];
  auVar1317._8_8_ = 0;
  auVar1317._0_8_ = in_R8[8];
  auVar1667._8_8_ = 0;
  auVar1667._0_8_ = in_R8[9];
  auVar1925._8_8_ = 0;
  auVar1925._0_8_ = in_R8[10];
  auVar2054._8_8_ = 0;
  auVar2054._0_8_ = in_R8[0xb];
  auVar215._8_8_ = 0;
  auVar215._0_8_ = dVar2 + dVar2;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = (dVar1 + dVar1) * in_R8[7];
  auVar9 = vfmadd231sd_fma(auVar374,auVar566,auVar215);
  dVar3 = in_RSI[8];
  auVar1073._8_8_ = 0;
  auVar1073._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1073,auVar1317,auVar9);
  dVar4 = in_RSI[9];
  auVar375._8_8_ = 0;
  auVar375._0_8_ = dVar4;
  auVar1518._8_8_ = 0;
  auVar1518._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1518,auVar1667,auVar9);
  dVar4 = in_RSI[10];
  auVar1074._8_8_ = 0;
  auVar1074._0_8_ = dVar4;
  auVar1824._8_8_ = 0;
  auVar1824._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1824,auVar1925,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1519._8_8_ = 0;
  auVar1519._0_8_ = dVar4;
  auVar1995._8_8_ = 0;
  auVar1995._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1995,auVar2054,auVar9);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar216,auVar2054,auVar9);
  auVar1318._8_8_ = 0;
  auVar1318._0_8_ = in_R8[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1318,auVar1519,auVar9);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar53,auVar1667,auVar9);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = in_R8[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar217,auVar375,auVar9);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar54,auVar1925,auVar9);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = in_R8[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar126,auVar1074,auVar9);
  *(long *)(ctx + 0x68a8) = auVar9._0_8_;
  dVar1 = in_RSI[7];
  dVar2 = in_RSI[6];
  auVar567._8_8_ = 0;
  auVar567._0_8_ = in_RCX[6];
  auVar1319._8_8_ = 0;
  auVar1319._0_8_ = in_RCX[8];
  auVar1668._8_8_ = 0;
  auVar1668._0_8_ = in_RCX[9];
  auVar1926._8_8_ = 0;
  auVar1926._0_8_ = in_RCX[10];
  auVar2055._8_8_ = 0;
  auVar2055._0_8_ = in_RCX[0xb];
  auVar218._8_8_ = 0;
  auVar218._0_8_ = dVar2 + dVar2;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = (dVar1 + dVar1) * in_RCX[7];
  auVar9 = vfmadd231sd_fma(auVar376,auVar567,auVar218);
  dVar3 = in_RSI[8];
  auVar1075._8_8_ = 0;
  auVar1075._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1075,auVar1319,auVar9);
  dVar4 = in_RSI[9];
  auVar377._8_8_ = 0;
  auVar377._0_8_ = dVar4;
  auVar1520._8_8_ = 0;
  auVar1520._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1520,auVar1668,auVar9);
  dVar4 = in_RSI[10];
  auVar1076._8_8_ = 0;
  auVar1076._0_8_ = dVar4;
  auVar1825._8_8_ = 0;
  auVar1825._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1825,auVar1926,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1521._8_8_ = 0;
  auVar1521._0_8_ = dVar4;
  auVar1996._8_8_ = 0;
  auVar1996._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1996,auVar2055,auVar9);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar219,auVar2055,auVar9);
  auVar1320._8_8_ = 0;
  auVar1320._0_8_ = in_RCX[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1320,auVar1521,auVar9);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar55,auVar1668,auVar9);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = in_RCX[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar220,auVar377,auVar9);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar56,auVar1926,auVar9);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = in_RCX[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar127,auVar1076,auVar9);
  *(long *)(ctx + 0x6a08) = auVar9._0_8_;
  dVar1 = in_RSI[7];
  dVar2 = in_RSI[6];
  auVar568._8_8_ = 0;
  auVar568._0_8_ = in_RDX[6];
  auVar1321._8_8_ = 0;
  auVar1321._0_8_ = in_RDX[8];
  auVar1669._8_8_ = 0;
  auVar1669._0_8_ = in_RDX[9];
  auVar1927._8_8_ = 0;
  auVar1927._0_8_ = in_RDX[10];
  auVar2056._8_8_ = 0;
  auVar2056._0_8_ = in_RDX[0xb];
  auVar221._8_8_ = 0;
  auVar221._0_8_ = dVar2 + dVar2;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = (dVar1 + dVar1) * in_RDX[7];
  auVar9 = vfmadd231sd_fma(auVar378,auVar568,auVar221);
  dVar3 = in_RSI[8];
  auVar1077._8_8_ = 0;
  auVar1077._0_8_ = dVar3 + dVar3;
  auVar9 = vfmadd213sd_fma(auVar1077,auVar1321,auVar9);
  dVar4 = in_RSI[9];
  auVar379._8_8_ = 0;
  auVar379._0_8_ = dVar4;
  auVar1522._8_8_ = 0;
  auVar1522._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1522,auVar1669,auVar9);
  dVar4 = in_RSI[10];
  auVar1078._8_8_ = 0;
  auVar1078._0_8_ = dVar4;
  auVar1826._8_8_ = 0;
  auVar1826._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1826,auVar1927,auVar9);
  dVar4 = in_RSI[0xb];
  auVar1523._8_8_ = 0;
  auVar1523._0_8_ = dVar4;
  auVar1997._8_8_ = 0;
  auVar1997._0_8_ = dVar4 + dVar4;
  auVar9 = vfmadd213sd_fma(auVar1997,auVar2056,auVar9);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar222,auVar2056,auVar9);
  auVar1322._8_8_ = 0;
  auVar1322._0_8_ = in_RDX[8] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar1322,auVar1523,auVar9);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar57,auVar1669,auVar9);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = in_RDX[6] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar223,auVar379,auVar9);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar58,auVar1927,auVar9);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = in_RDX[7] * -2.0;
  auVar9 = vfmadd213sd_fma(auVar128,auVar1078,auVar9);
  *(long *)(ctx + 0x6b68) = auVar9._0_8_;
  dVar1 = in_RSI[6];
  dVar2 = in_RSI[7];
  dVar3 = in_RSI[8];
  dVar4 = in_RSI[9];
  auVar1670._8_8_ = 0;
  auVar1670._0_8_ = dVar4;
  dVar5 = in_RSI[10];
  auVar1524._8_8_ = 0;
  auVar1524._0_8_ = dVar5;
  dVar6 = in_RSI[0xb];
  auVar1323._8_8_ = 0;
  auVar1323._0_8_ = dVar6;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar6 * dVar6 +
                 (dVar1 * dVar1 - auVar10._0_8_ * auVar10._0_8_) + dVar2 * dVar2 + dVar3 * dVar3 +
                 dVar4 * dVar4 + dVar5 * dVar5;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar1 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar59,auVar1670,auVar9);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar11,auVar1524,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar3 * -2.0;
  auVar9 = vfmadd213sd_fma(auVar8,auVar1323,auVar9);
  *(long *)(ctx + 0x6cc8) = auVar9._0_8_;
  return (int)in_stack_00000008;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::init(
    Eigen::Matrix<double,44,80> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Matrix<double,12,1> & m,
    Eigen::Matrix<double,12,1> & k,
    Eigen::Matrix<double,12,1> & l,
    Eigen::Matrix<double,12,1> & p,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();
  temp = c1-c2;
  double c12w = temp.norm()*temp.norm();
  temp = c1-c3;
  double c13w = temp.norm()*temp.norm();
  temp = c2-c3;
  double c23w = temp.norm()*temp.norm();

  groebnerMatrix(0,59) = ((((((((-2*p(0,0)*p(3,0)+pow(p(1,0),2))+pow(p(4,0),2))+pow(p(2,0),2))+pow(p(5,0),2))+pow(p(0,0),2))+pow(p(3,0),2))-2*p(1,0)*p(4,0))-2*p(2,0)*p(5,0));
  groebnerMatrix(0,60) = (((((((((((2*l(1,0)*p(1,0)-2*l(1,0)*p(4,0))-2*p(1,0)*l(4,0))+2*l(4,0)*p(4,0))+2*l(2,0)*p(2,0))-2*l(2,0)*p(5,0))-2*p(2,0)*l(5,0))+2*l(5,0)*p(5,0))+2*l(0,0)*p(0,0))-2*l(0,0)*p(3,0))-2*p(0,0)*l(3,0))+2*l(3,0)*p(3,0));
  groebnerMatrix(0,61) = ((((((((-2*l(0,0)*l(3,0)+pow(l(1,0),2))+pow(l(4,0),2))+pow(l(2,0),2))+pow(l(5,0),2))+pow(l(0,0),2))+pow(l(3,0),2))-2*l(1,0)*l(4,0))-2*l(2,0)*l(5,0));
  groebnerMatrix(0,62) = (((((((((((2*k(1,0)*p(1,0)-2*k(1,0)*p(4,0))-2*p(1,0)*k(4,0))+2*k(4,0)*p(4,0))+2*k(2,0)*p(2,0))-2*k(2,0)*p(5,0))-2*p(2,0)*k(5,0))+2*k(5,0)*p(5,0))+2*k(0,0)*p(0,0))-2*k(0,0)*p(3,0))-2*p(0,0)*k(3,0))+2*k(3,0)*p(3,0));
  groebnerMatrix(0,63) = (((((((((((2*k(1,0)*l(1,0)-2*k(1,0)*l(4,0))-2*l(1,0)*k(4,0))+2*k(4,0)*l(4,0))+2*k(2,0)*l(2,0))-2*k(2,0)*l(5,0))-2*l(2,0)*k(5,0))+2*k(5,0)*l(5,0))+2*k(0,0)*l(0,0))-2*k(0,0)*l(3,0))-2*l(0,0)*k(3,0))+2*k(3,0)*l(3,0));
  groebnerMatrix(0,64) = ((((((((-2*k(0,0)*k(3,0)+pow(k(1,0),2))+pow(k(4,0),2))+pow(k(2,0),2))+pow(k(5,0),2))+pow(k(0,0),2))+pow(k(3,0),2))-2*k(1,0)*k(4,0))-2*k(2,0)*k(5,0));
  groebnerMatrix(0,65) = (((((((((((2*m(1,0)*p(1,0)-2*m(1,0)*p(4,0))-2*p(1,0)*m(4,0))+2*m(4,0)*p(4,0))+2*m(2,0)*p(2,0))-2*m(2,0)*p(5,0))-2*p(2,0)*m(5,0))+2*m(5,0)*p(5,0))+2*m(0,0)*p(0,0))-2*m(0,0)*p(3,0))-2*p(0,0)*m(3,0))+2*m(3,0)*p(3,0));
  groebnerMatrix(0,66) = (((((((((((2*m(1,0)*l(1,0)-2*m(1,0)*l(4,0))-2*l(1,0)*m(4,0))+2*m(4,0)*l(4,0))+2*m(2,0)*l(2,0))-2*m(2,0)*l(5,0))-2*l(2,0)*m(5,0))+2*m(5,0)*l(5,0))+2*m(0,0)*l(0,0))-2*m(0,0)*l(3,0))-2*l(0,0)*m(3,0))+2*m(3,0)*l(3,0));
  groebnerMatrix(0,67) = (((((((((((2*m(1,0)*k(1,0)-2*m(1,0)*k(4,0))-2*k(1,0)*m(4,0))+2*m(4,0)*k(4,0))+2*m(2,0)*k(2,0))-2*m(2,0)*k(5,0))-2*k(2,0)*m(5,0))+2*m(5,0)*k(5,0))+2*m(0,0)*k(0,0))-2*m(0,0)*k(3,0))-2*k(0,0)*m(3,0))+2*m(3,0)*k(3,0));
  groebnerMatrix(0,68) = ((((((((-2*m(0,0)*m(3,0)+pow(m(1,0),2))+pow(m(4,0),2))+pow(m(2,0),2))+pow(m(5,0),2))+pow(m(0,0),2))+pow(m(3,0),2))-2*m(1,0)*m(4,0))-2*m(2,0)*m(5,0));
  groebnerMatrix(0,69) = (((((((((((-2*p(1,0)*n(4,0)+2*n(4,0)*p(4,0))+2*n(2,0)*p(2,0))-2*n(2,0)*p(5,0))-2*p(2,0)*n(5,0))+2*n(5,0)*p(5,0))+2*n(0,0)*p(0,0))-2*n(0,0)*p(3,0))-2*p(0,0)*n(3,0))+2*n(3,0)*p(3,0))+2*n(1,0)*p(1,0))-2*n(1,0)*p(4,0));
  groebnerMatrix(0,70) = (((((((((((-2*l(1,0)*n(4,0)+2*n(4,0)*l(4,0))+2*n(2,0)*l(2,0))-2*n(2,0)*l(5,0))-2*l(2,0)*n(5,0))+2*n(5,0)*l(5,0))+2*n(0,0)*l(0,0))-2*n(0,0)*l(3,0))-2*l(0,0)*n(3,0))+2*n(3,0)*l(3,0))+2*n(1,0)*l(1,0))-2*n(1,0)*l(4,0));
  groebnerMatrix(0,71) = (((((((((((-2*k(1,0)*n(4,0)+2*n(4,0)*k(4,0))+2*n(2,0)*k(2,0))-2*n(2,0)*k(5,0))-2*k(2,0)*n(5,0))+2*n(5,0)*k(5,0))+2*n(0,0)*k(0,0))-2*n(0,0)*k(3,0))-2*k(0,0)*n(3,0))+2*n(3,0)*k(3,0))+2*n(1,0)*k(1,0))-2*n(1,0)*k(4,0));
  groebnerMatrix(0,72) = (((((((((((-2*m(1,0)*n(4,0)+2*n(4,0)*m(4,0))+2*n(2,0)*m(2,0))-2*n(2,0)*m(5,0))-2*m(2,0)*n(5,0))+2*n(5,0)*m(5,0))+2*n(0,0)*m(0,0))-2*n(0,0)*m(3,0))-2*m(0,0)*n(3,0))+2*n(3,0)*m(3,0))+2*n(1,0)*m(1,0))-2*n(1,0)*m(4,0));
  groebnerMatrix(0,73) = ((((((((-2*n(0,0)*n(3,0)+pow(n(1,0),2))+pow(n(4,0),2))+pow(n(2,0),2))+pow(n(5,0),2))+pow(n(0,0),2))+pow(n(3,0),2))-2*n(1,0)*n(4,0))-2*n(2,0)*n(5,0));
  groebnerMatrix(0,74) = (((((((((((2*a(0,0)*p(0,0)-2*a(0,0)*p(3,0))-2*p(0,0)*a(3,0))+2*a(3,0)*p(3,0))+2*a(1,0)*p(1,0))-2*a(1,0)*p(4,0))-2*p(1,0)*a(4,0))+2*a(4,0)*p(4,0))+2*a(2,0)*p(2,0))-2*a(2,0)*p(5,0))-2*p(2,0)*a(5,0))+2*a(5,0)*p(5,0));
  groebnerMatrix(0,75) = (((((((((((2*a(0,0)*l(0,0)-2*a(0,0)*l(3,0))-2*l(0,0)*a(3,0))+2*a(3,0)*l(3,0))+2*a(1,0)*l(1,0))-2*a(1,0)*l(4,0))-2*l(1,0)*a(4,0))+2*a(4,0)*l(4,0))+2*a(2,0)*l(2,0))-2*a(2,0)*l(5,0))-2*l(2,0)*a(5,0))+2*a(5,0)*l(5,0));
  groebnerMatrix(0,76) = (((((((((((2*a(0,0)*k(0,0)-2*a(0,0)*k(3,0))-2*k(0,0)*a(3,0))+2*a(3,0)*k(3,0))+2*a(1,0)*k(1,0))-2*a(1,0)*k(4,0))-2*k(1,0)*a(4,0))+2*a(4,0)*k(4,0))+2*a(2,0)*k(2,0))-2*a(2,0)*k(5,0))-2*k(2,0)*a(5,0))+2*a(5,0)*k(5,0));
  groebnerMatrix(0,77) = (((((((((((2*a(0,0)*m(0,0)-2*a(0,0)*m(3,0))-2*m(0,0)*a(3,0))+2*a(3,0)*m(3,0))+2*a(1,0)*m(1,0))-2*a(1,0)*m(4,0))-2*m(1,0)*a(4,0))+2*a(4,0)*m(4,0))+2*a(2,0)*m(2,0))-2*a(2,0)*m(5,0))-2*m(2,0)*a(5,0))+2*a(5,0)*m(5,0));
  groebnerMatrix(0,78) = (((((((((((2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0))-2*n(0,0)*a(3,0))+2*a(3,0)*n(3,0))+2*a(1,0)*n(1,0))-2*a(1,0)*n(4,0))-2*n(1,0)*a(4,0))+2*a(4,0)*n(4,0))+2*a(2,0)*n(2,0))-2*a(2,0)*n(5,0))-2*n(2,0)*a(5,0))+2*a(5,0)*n(5,0));
  groebnerMatrix(0,79) = (((((((((-c01w+pow(a(4,0),2))+pow(a(2,0),2))-2*a(2,0)*a(5,0))+pow(a(5,0),2))+pow(a(0,0),2))-2*a(0,0)*a(3,0))+pow(a(3,0),2))+pow(a(1,0),2))-2*a(1,0)*a(4,0));
  groebnerMatrix(1,59) = ((((((((pow(p(1,0),2)+pow(p(2,0),2))+pow(p(6,0),2))+pow(p(7,0),2))+pow(p(8,0),2))+pow(p(0,0),2))-2*p(0,0)*p(6,0))-2*p(1,0)*p(7,0))-2*p(2,0)*p(8,0));
  groebnerMatrix(1,60) = (((((((((((2*l(1,0)*p(1,0)+2*l(2,0)*p(2,0))-2*l(0,0)*p(6,0))-2*p(0,0)*l(6,0))+2*l(6,0)*p(6,0))-2*l(1,0)*p(7,0))-2*p(1,0)*l(7,0))+2*l(7,0)*p(7,0))-2*l(2,0)*p(8,0))-2*p(2,0)*l(8,0))+2*l(8,0)*p(8,0))+2*l(0,0)*p(0,0));
  groebnerMatrix(1,61) = ((((((((pow(l(1,0),2)+pow(l(2,0),2))+pow(l(6,0),2))+pow(l(7,0),2))+pow(l(8,0),2))+pow(l(0,0),2))-2*l(0,0)*l(6,0))-2*l(1,0)*l(7,0))-2*l(2,0)*l(8,0));
  groebnerMatrix(1,62) = (((((((((((2*k(1,0)*p(1,0)+2*k(2,0)*p(2,0))-2*k(0,0)*p(6,0))-2*p(0,0)*k(6,0))+2*k(6,0)*p(6,0))-2*k(1,0)*p(7,0))-2*p(1,0)*k(7,0))+2*k(7,0)*p(7,0))-2*k(2,0)*p(8,0))-2*p(2,0)*k(8,0))+2*k(8,0)*p(8,0))+2*k(0,0)*p(0,0));
  groebnerMatrix(1,63) = (((((((((((2*k(1,0)*l(1,0)+2*k(2,0)*l(2,0))-2*k(0,0)*l(6,0))-2*l(0,0)*k(6,0))+2*k(6,0)*l(6,0))-2*k(1,0)*l(7,0))-2*l(1,0)*k(7,0))+2*k(7,0)*l(7,0))-2*k(2,0)*l(8,0))-2*l(2,0)*k(8,0))+2*k(8,0)*l(8,0))+2*k(0,0)*l(0,0));
  groebnerMatrix(1,64) = ((((((((pow(k(1,0),2)+pow(k(2,0),2))+pow(k(6,0),2))+pow(k(7,0),2))+pow(k(8,0),2))+pow(k(0,0),2))-2*k(0,0)*k(6,0))-2*k(1,0)*k(7,0))-2*k(2,0)*k(8,0));
  groebnerMatrix(1,65) = (((((((((((2*m(1,0)*p(1,0)+2*m(2,0)*p(2,0))-2*m(0,0)*p(6,0))-2*p(0,0)*m(6,0))+2*m(6,0)*p(6,0))-2*m(1,0)*p(7,0))-2*p(1,0)*m(7,0))+2*m(7,0)*p(7,0))-2*m(2,0)*p(8,0))-2*p(2,0)*m(8,0))+2*m(8,0)*p(8,0))+2*m(0,0)*p(0,0));
  groebnerMatrix(1,66) = (((((((((((2*m(1,0)*l(1,0)+2*m(2,0)*l(2,0))-2*m(0,0)*l(6,0))-2*l(0,0)*m(6,0))+2*m(6,0)*l(6,0))-2*m(1,0)*l(7,0))-2*l(1,0)*m(7,0))+2*m(7,0)*l(7,0))-2*m(2,0)*l(8,0))-2*l(2,0)*m(8,0))+2*m(8,0)*l(8,0))+2*m(0,0)*l(0,0));
  groebnerMatrix(1,67) = (((((((((((2*m(1,0)*k(1,0)+2*m(2,0)*k(2,0))-2*m(0,0)*k(6,0))-2*k(0,0)*m(6,0))+2*m(6,0)*k(6,0))-2*m(1,0)*k(7,0))-2*k(1,0)*m(7,0))+2*m(7,0)*k(7,0))-2*m(2,0)*k(8,0))-2*k(2,0)*m(8,0))+2*m(8,0)*k(8,0))+2*m(0,0)*k(0,0));
  groebnerMatrix(1,68) = ((((((((pow(m(1,0),2)+pow(m(2,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2))+pow(m(0,0),2))-2*m(0,0)*m(6,0))-2*m(1,0)*m(7,0))-2*m(2,0)*m(8,0));
  groebnerMatrix(1,69) = (((((((((((2*n(2,0)*p(2,0)-2*n(0,0)*p(6,0))-2*p(0,0)*n(6,0))+2*n(6,0)*p(6,0))-2*n(1,0)*p(7,0))-2*p(1,0)*n(7,0))+2*n(7,0)*p(7,0))-2*n(2,0)*p(8,0))-2*p(2,0)*n(8,0))+2*n(8,0)*p(8,0))+2*n(0,0)*p(0,0))+2*n(1,0)*p(1,0));
  groebnerMatrix(1,70) = (((((((((((2*n(2,0)*l(2,0)-2*n(0,0)*l(6,0))-2*l(0,0)*n(6,0))+2*n(6,0)*l(6,0))-2*n(1,0)*l(7,0))-2*l(1,0)*n(7,0))+2*n(7,0)*l(7,0))-2*n(2,0)*l(8,0))-2*l(2,0)*n(8,0))+2*n(8,0)*l(8,0))+2*n(0,0)*l(0,0))+2*n(1,0)*l(1,0));
  groebnerMatrix(1,71) = (((((((((((2*n(2,0)*k(2,0)-2*n(0,0)*k(6,0))-2*k(0,0)*n(6,0))+2*n(6,0)*k(6,0))-2*n(1,0)*k(7,0))-2*k(1,0)*n(7,0))+2*n(7,0)*k(7,0))-2*n(2,0)*k(8,0))-2*k(2,0)*n(8,0))+2*n(8,0)*k(8,0))+2*n(0,0)*k(0,0))+2*n(1,0)*k(1,0));
  groebnerMatrix(1,72) = (((((((((((2*n(2,0)*m(2,0)-2*n(0,0)*m(6,0))-2*m(0,0)*n(6,0))+2*n(6,0)*m(6,0))-2*n(1,0)*m(7,0))-2*m(1,0)*n(7,0))+2*n(7,0)*m(7,0))-2*n(2,0)*m(8,0))-2*m(2,0)*n(8,0))+2*n(8,0)*m(8,0))+2*n(0,0)*m(0,0))+2*n(1,0)*m(1,0));
  groebnerMatrix(1,73) = ((((((((pow(n(1,0),2)+pow(n(2,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2))+pow(n(0,0),2))-2*n(0,0)*n(6,0))-2*n(1,0)*n(7,0))-2*n(2,0)*n(8,0));
  groebnerMatrix(1,74) = (((((((((((-2*a(0,0)*p(6,0)+2*a(0,0)*p(0,0))+2*a(1,0)*p(1,0))+2*a(2,0)*p(2,0))-2*p(0,0)*a(6,0))+2*a(6,0)*p(6,0))-2*a(1,0)*p(7,0))-2*p(1,0)*a(7,0))+2*a(7,0)*p(7,0))-2*a(2,0)*p(8,0))-2*p(2,0)*a(8,0))+2*a(8,0)*p(8,0));
  groebnerMatrix(1,75) = (((((((((((2*a(0,0)*l(0,0)+2*a(1,0)*l(1,0))+2*a(2,0)*l(2,0))-2*l(0,0)*a(6,0))+2*a(6,0)*l(6,0))-2*a(1,0)*l(7,0))-2*l(1,0)*a(7,0))+2*a(7,0)*l(7,0))-2*a(2,0)*l(8,0))-2*l(2,0)*a(8,0))+2*a(8,0)*l(8,0))-2*a(0,0)*l(6,0));
  groebnerMatrix(1,76) = (((((((((((-2*a(0,0)*k(6,0)+2*a(0,0)*k(0,0))+2*a(1,0)*k(1,0))+2*a(2,0)*k(2,0))-2*k(0,0)*a(6,0))+2*a(6,0)*k(6,0))-2*a(1,0)*k(7,0))-2*k(1,0)*a(7,0))+2*a(7,0)*k(7,0))-2*a(2,0)*k(8,0))-2*k(2,0)*a(8,0))+2*a(8,0)*k(8,0));
  groebnerMatrix(1,77) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*m(0,0)*a(6,0))+2*a(6,0)*m(6,0))-2*a(1,0)*m(7,0))-2*m(1,0)*a(7,0))+2*a(7,0)*m(7,0))-2*a(2,0)*m(8,0))-2*m(2,0)*a(8,0))+2*a(8,0)*m(8,0))-2*a(0,0)*m(6,0));
  groebnerMatrix(1,78) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*n(0,0)*a(6,0))+2*a(6,0)*n(6,0))-2*a(1,0)*n(7,0))-2*n(1,0)*a(7,0))+2*a(7,0)*n(7,0))-2*a(2,0)*n(8,0))-2*n(2,0)*a(8,0))+2*a(8,0)*n(8,0))-2*a(0,0)*n(6,0));
  groebnerMatrix(1,79) = (((((((((-c02w+pow(a(2,0),2))-2*a(0,0)*a(6,0))+pow(a(6,0),2))-2*a(1,0)*a(7,0))+pow(a(7,0),2))-2*a(2,0)*a(8,0))+pow(a(8,0),2))+pow(a(0,0),2))+pow(a(1,0),2));
  groebnerMatrix(2,59) = ((((((((pow(p(1,0),2)+pow(p(2,0),2))+pow(p(9,0),2))+pow(p(10,0),2))+pow(p(11,0),2))+pow(p(0,0),2))-2*p(0,0)*p(9,0))-2*p(1,0)*p(10,0))-2*p(2,0)*p(11,0));
  groebnerMatrix(2,60) = (((((((((((2*l(1,0)*p(1,0)+2*l(2,0)*p(2,0))-2*l(0,0)*p(9,0))-2*p(0,0)*l(9,0))+2*l(9,0)*p(9,0))-2*l(1,0)*p(10,0))-2*p(1,0)*l(10,0))+2*l(10,0)*p(10,0))-2*l(2,0)*p(11,0))-2*p(2,0)*l(11,0))+2*l(11,0)*p(11,0))+2*l(0,0)*p(0,0));
  groebnerMatrix(2,61) = ((((((((pow(l(1,0),2)+pow(l(2,0),2))+pow(l(9,0),2))+pow(l(10,0),2))+pow(l(11,0),2))+pow(l(0,0),2))-2*l(0,0)*l(9,0))-2*l(1,0)*l(10,0))-2*l(2,0)*l(11,0));
  groebnerMatrix(2,62) = (((((((((((2*k(1,0)*p(1,0)+2*k(2,0)*p(2,0))-2*k(0,0)*p(9,0))-2*p(0,0)*k(9,0))+2*k(9,0)*p(9,0))-2*k(1,0)*p(10,0))-2*p(1,0)*k(10,0))+2*k(10,0)*p(10,0))-2*k(2,0)*p(11,0))-2*p(2,0)*k(11,0))+2*k(11,0)*p(11,0))+2*k(0,0)*p(0,0));
  groebnerMatrix(2,63) = (((((((((((2*k(1,0)*l(1,0)+2*k(2,0)*l(2,0))-2*k(0,0)*l(9,0))-2*l(0,0)*k(9,0))+2*k(9,0)*l(9,0))-2*k(1,0)*l(10,0))-2*l(1,0)*k(10,0))+2*k(10,0)*l(10,0))-2*k(2,0)*l(11,0))-2*l(2,0)*k(11,0))+2*k(11,0)*l(11,0))+2*k(0,0)*l(0,0));
  groebnerMatrix(2,64) = ((((((((-2*k(0,0)*k(9,0)+pow(k(1,0),2))+pow(k(2,0),2))+pow(k(9,0),2))+pow(k(10,0),2))+pow(k(11,0),2))+pow(k(0,0),2))-2*k(1,0)*k(10,0))-2*k(2,0)*k(11,0));
  groebnerMatrix(2,65) = (((((((((((-2*m(0,0)*p(9,0)+2*m(1,0)*p(1,0))+2*m(2,0)*p(2,0))-2*p(0,0)*m(9,0))+2*m(9,0)*p(9,0))-2*m(1,0)*p(10,0))-2*p(1,0)*m(10,0))+2*m(10,0)*p(10,0))-2*m(2,0)*p(11,0))-2*p(2,0)*m(11,0))+2*m(11,0)*p(11,0))+2*m(0,0)*p(0,0));
  groebnerMatrix(2,66) = (((((((((((-2*m(0,0)*l(9,0)+2*m(1,0)*l(1,0))+2*m(2,0)*l(2,0))-2*l(0,0)*m(9,0))+2*m(9,0)*l(9,0))-2*m(1,0)*l(10,0))-2*l(1,0)*m(10,0))+2*m(10,0)*l(10,0))-2*m(2,0)*l(11,0))-2*l(2,0)*m(11,0))+2*m(11,0)*l(11,0))+2*m(0,0)*l(0,0));
  groebnerMatrix(2,67) = (((((((((((-2*m(0,0)*k(9,0)+2*m(1,0)*k(1,0))+2*m(2,0)*k(2,0))-2*k(0,0)*m(9,0))+2*m(9,0)*k(9,0))-2*m(1,0)*k(10,0))-2*k(1,0)*m(10,0))+2*m(10,0)*k(10,0))-2*m(2,0)*k(11,0))-2*k(2,0)*m(11,0))+2*m(11,0)*k(11,0))+2*m(0,0)*k(0,0));
  groebnerMatrix(2,68) = ((((((((pow(m(1,0),2)+pow(m(2,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2))+pow(m(0,0),2))-2*m(1,0)*m(10,0))-2*m(2,0)*m(11,0))-2*m(0,0)*m(9,0));
  groebnerMatrix(2,69) = (((((((((((-2*n(0,0)*p(9,0)+2*n(2,0)*p(2,0))-2*p(0,0)*n(9,0))+2*n(9,0)*p(9,0))-2*n(1,0)*p(10,0))-2*p(1,0)*n(10,0))+2*n(10,0)*p(10,0))-2*n(2,0)*p(11,0))-2*p(2,0)*n(11,0))+2*n(11,0)*p(11,0))+2*n(0,0)*p(0,0))+2*n(1,0)*p(1,0));
  groebnerMatrix(2,70) = (((((((((((-2*n(0,0)*l(9,0)+2*n(2,0)*l(2,0))-2*l(0,0)*n(9,0))+2*n(9,0)*l(9,0))-2*n(1,0)*l(10,0))-2*l(1,0)*n(10,0))+2*n(10,0)*l(10,0))-2*n(2,0)*l(11,0))-2*l(2,0)*n(11,0))+2*n(11,0)*l(11,0))+2*n(0,0)*l(0,0))+2*n(1,0)*l(1,0));
  groebnerMatrix(2,71) = (((((((((((-2*n(0,0)*k(9,0)+2*n(2,0)*k(2,0))-2*k(0,0)*n(9,0))+2*n(9,0)*k(9,0))-2*n(1,0)*k(10,0))-2*k(1,0)*n(10,0))+2*n(10,0)*k(10,0))-2*n(2,0)*k(11,0))-2*k(2,0)*n(11,0))+2*n(11,0)*k(11,0))+2*n(0,0)*k(0,0))+2*n(1,0)*k(1,0));
  groebnerMatrix(2,72) = (((((((((((-2*n(0,0)*m(9,0)-2*m(0,0)*n(9,0))+2*n(2,0)*m(2,0))+2*n(9,0)*m(9,0))-2*n(1,0)*m(10,0))-2*m(1,0)*n(10,0))+2*n(10,0)*m(10,0))-2*n(2,0)*m(11,0))-2*m(2,0)*n(11,0))+2*n(11,0)*m(11,0))+2*n(0,0)*m(0,0))+2*n(1,0)*m(1,0));
  groebnerMatrix(2,73) = ((((((((pow(n(1,0),2)+pow(n(2,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2))+pow(n(0,0),2))-2*n(1,0)*n(10,0))-2*n(2,0)*n(11,0))-2*n(0,0)*n(9,0));
  groebnerMatrix(2,74) = (((((((((((-2*a(0,0)*p(9,0)+2*a(0,0)*p(0,0))+2*a(1,0)*p(1,0))+2*a(2,0)*p(2,0))-2*p(0,0)*a(9,0))+2*a(9,0)*p(9,0))-2*a(1,0)*p(10,0))-2*p(1,0)*a(10,0))+2*a(10,0)*p(10,0))-2*a(2,0)*p(11,0))-2*p(2,0)*a(11,0))+2*a(11,0)*p(11,0));
  groebnerMatrix(2,75) = (((((((((((-2*a(0,0)*l(9,0)+2*a(0,0)*l(0,0))+2*a(1,0)*l(1,0))+2*a(2,0)*l(2,0))-2*l(0,0)*a(9,0))+2*a(9,0)*l(9,0))-2*a(1,0)*l(10,0))-2*l(1,0)*a(10,0))+2*a(10,0)*l(10,0))-2*a(2,0)*l(11,0))-2*l(2,0)*a(11,0))+2*a(11,0)*l(11,0));
  groebnerMatrix(2,76) = (((((((((((2*a(0,0)*k(0,0)+2*a(1,0)*k(1,0))+2*a(2,0)*k(2,0))+2*a(9,0)*k(9,0))-2*a(1,0)*k(10,0))-2*k(1,0)*a(10,0))+2*a(10,0)*k(10,0))-2*a(2,0)*k(11,0))-2*k(2,0)*a(11,0))+2*a(11,0)*k(11,0))-2*k(0,0)*a(9,0))-2*a(0,0)*k(9,0));
  groebnerMatrix(2,77) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))+2*a(9,0)*m(9,0))-2*a(1,0)*m(10,0))-2*m(1,0)*a(10,0))+2*a(10,0)*m(10,0))-2*a(2,0)*m(11,0))-2*m(2,0)*a(11,0))+2*a(11,0)*m(11,0))-2*m(0,0)*a(9,0))-2*a(0,0)*m(9,0));
  groebnerMatrix(2,78) = (((((((((((-2*a(0,0)*n(9,0)+2*a(0,0)*n(0,0))+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))+2*a(9,0)*n(9,0))-2*a(1,0)*n(10,0))-2*n(1,0)*a(10,0))+2*a(10,0)*n(10,0))-2*a(2,0)*n(11,0))-2*n(2,0)*a(11,0))+2*a(11,0)*n(11,0))-2*n(0,0)*a(9,0));
  groebnerMatrix(2,79) = (((((((((-c03w+pow(a(2,0),2))-2*a(0,0)*a(9,0))+pow(a(9,0),2))-2*a(1,0)*a(10,0))+pow(a(10,0),2))-2*a(2,0)*a(11,0))+pow(a(11,0),2))+pow(a(0,0),2))+pow(a(1,0),2));
  groebnerMatrix(3,59) = ((((((((pow(p(4,0),2)+pow(p(5,0),2))+pow(p(6,0),2))+pow(p(7,0),2))+pow(p(8,0),2))+pow(p(3,0),2))-2*p(3,0)*p(6,0))-2*p(4,0)*p(7,0))-2*p(5,0)*p(8,0));
  groebnerMatrix(3,60) = (((((((((((2*l(4,0)*p(4,0)+2*l(5,0)*p(5,0))+2*l(6,0)*p(6,0))+2*l(7,0)*p(7,0))+2*l(8,0)*p(8,0))-2*l(4,0)*p(7,0))-2*p(4,0)*l(7,0))-2*l(3,0)*p(6,0))-2*p(3,0)*l(6,0))-2*l(5,0)*p(8,0))-2*p(5,0)*l(8,0))+2*l(3,0)*p(3,0));
  groebnerMatrix(3,61) = ((((((((pow(l(4,0),2)+pow(l(5,0),2))+pow(l(6,0),2))+pow(l(7,0),2))+pow(l(8,0),2))+pow(l(3,0),2))-2*l(3,0)*l(6,0))-2*l(4,0)*l(7,0))-2*l(5,0)*l(8,0));
  groebnerMatrix(3,62) = (((((((((((2*k(4,0)*p(4,0)+2*k(5,0)*p(5,0))+2*k(6,0)*p(6,0))+2*k(7,0)*p(7,0))+2*k(8,0)*p(8,0))-2*k(5,0)*p(8,0))-2*k(4,0)*p(7,0))-2*p(4,0)*k(7,0))-2*k(3,0)*p(6,0))-2*p(3,0)*k(6,0))-2*p(5,0)*k(8,0))+2*k(3,0)*p(3,0));
  groebnerMatrix(3,63) = (((((((((((2*k(4,0)*l(4,0)+2*k(5,0)*l(5,0))+2*k(6,0)*l(6,0))+2*k(7,0)*l(7,0))+2*k(8,0)*l(8,0))-2*k(5,0)*l(8,0))-2*k(4,0)*l(7,0))-2*l(4,0)*k(7,0))-2*k(3,0)*l(6,0))-2*l(3,0)*k(6,0))-2*l(5,0)*k(8,0))+2*k(3,0)*l(3,0));
  groebnerMatrix(3,64) = ((((((((pow(k(4,0),2)+pow(k(5,0),2))+pow(k(6,0),2))+pow(k(7,0),2))+pow(k(8,0),2))+pow(k(3,0),2))-2*k(5,0)*k(8,0))-2*k(3,0)*k(6,0))-2*k(4,0)*k(7,0));
  groebnerMatrix(3,65) = (((((((((((2*m(4,0)*p(4,0)+2*m(5,0)*p(5,0))+2*m(6,0)*p(6,0))+2*m(7,0)*p(7,0))+2*m(8,0)*p(8,0))-2*m(4,0)*p(7,0))-2*p(4,0)*m(7,0))-2*m(5,0)*p(8,0))-2*m(3,0)*p(6,0))-2*p(3,0)*m(6,0))-2*p(5,0)*m(8,0))+2*m(3,0)*p(3,0));
  groebnerMatrix(3,66) = (((((((((((2*m(4,0)*l(4,0)+2*m(5,0)*l(5,0))+2*m(6,0)*l(6,0))+2*m(7,0)*l(7,0))+2*m(8,0)*l(8,0))-2*m(4,0)*l(7,0))-2*l(4,0)*m(7,0))-2*m(5,0)*l(8,0))-2*m(3,0)*l(6,0))-2*l(3,0)*m(6,0))-2*l(5,0)*m(8,0))+2*m(3,0)*l(3,0));
  groebnerMatrix(3,67) = (((((((((((2*m(4,0)*k(4,0)+2*m(5,0)*k(5,0))+2*m(6,0)*k(6,0))+2*m(7,0)*k(7,0))+2*m(8,0)*k(8,0))-2*k(5,0)*m(8,0))-2*m(4,0)*k(7,0))-2*k(4,0)*m(7,0))-2*m(5,0)*k(8,0))-2*m(3,0)*k(6,0))-2*k(3,0)*m(6,0))+2*m(3,0)*k(3,0));
  groebnerMatrix(3,68) = ((((((((pow(m(4,0),2)+pow(m(5,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2))+pow(m(3,0),2))-2*m(3,0)*m(6,0))-2*m(4,0)*m(7,0))-2*m(5,0)*m(8,0));
  groebnerMatrix(3,69) = (((((((((((2*n(4,0)*p(4,0)+2*n(5,0)*p(5,0))+2*n(6,0)*p(6,0))+2*n(7,0)*p(7,0))+2*n(8,0)*p(8,0))-2*p(4,0)*n(7,0))-2*n(5,0)*p(8,0))-2*n(3,0)*p(6,0))-2*p(3,0)*n(6,0))-2*n(4,0)*p(7,0))-2*p(5,0)*n(8,0))+2*n(3,0)*p(3,0));
  groebnerMatrix(3,70) = (((((((((((2*n(4,0)*l(4,0)+2*n(5,0)*l(5,0))+2*n(6,0)*l(6,0))+2*n(7,0)*l(7,0))+2*n(8,0)*l(8,0))-2*l(4,0)*n(7,0))-2*n(5,0)*l(8,0))-2*n(3,0)*l(6,0))-2*l(3,0)*n(6,0))-2*n(4,0)*l(7,0))-2*l(5,0)*n(8,0))+2*n(3,0)*l(3,0));
  groebnerMatrix(3,71) = (((((((((((2*n(4,0)*k(4,0)+2*n(5,0)*k(5,0))+2*n(6,0)*k(6,0))+2*n(7,0)*k(7,0))+2*n(8,0)*k(8,0))-2*k(5,0)*n(8,0))-2*k(4,0)*n(7,0))-2*n(5,0)*k(8,0))-2*n(3,0)*k(6,0))-2*k(3,0)*n(6,0))-2*n(4,0)*k(7,0))+2*n(3,0)*k(3,0));
  groebnerMatrix(3,72) = (((((((((((2*n(4,0)*m(4,0)+2*n(5,0)*m(5,0))+2*n(6,0)*m(6,0))+2*n(7,0)*m(7,0))+2*n(8,0)*m(8,0))-2*m(4,0)*n(7,0))-2*n(5,0)*m(8,0))-2*m(5,0)*n(8,0))-2*n(3,0)*m(6,0))-2*m(3,0)*n(6,0))-2*n(4,0)*m(7,0))+2*n(3,0)*m(3,0));
  groebnerMatrix(3,73) = ((((((((pow(n(4,0),2)+pow(n(5,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2))+pow(n(3,0),2))-2*n(3,0)*n(6,0))-2*n(4,0)*n(7,0))-2*n(5,0)*n(8,0));
  groebnerMatrix(3,74) = (((((((((((-2*a(3,0)*p(6,0)+2*a(3,0)*p(3,0))+2*a(4,0)*p(4,0))+2*a(5,0)*p(5,0))+2*a(6,0)*p(6,0))+2*a(7,0)*p(7,0))+2*a(8,0)*p(8,0))-2*p(3,0)*a(6,0))-2*a(4,0)*p(7,0))-2*p(4,0)*a(7,0))-2*a(5,0)*p(8,0))-2*p(5,0)*a(8,0));
  groebnerMatrix(3,75) = (((((((((((2*a(3,0)*l(3,0)+2*a(4,0)*l(4,0))+2*a(5,0)*l(5,0))+2*a(6,0)*l(6,0))+2*a(7,0)*l(7,0))+2*a(8,0)*l(8,0))-2*l(3,0)*a(6,0))-2*a(4,0)*l(7,0))-2*l(4,0)*a(7,0))-2*a(5,0)*l(8,0))-2*l(5,0)*a(8,0))-2*a(3,0)*l(6,0));
  groebnerMatrix(3,76) = (((((((((((2*a(3,0)*k(3,0)-2*k(5,0)*a(8,0))+2*a(4,0)*k(4,0))+2*a(5,0)*k(5,0))+2*a(6,0)*k(6,0))+2*a(7,0)*k(7,0))+2*a(8,0)*k(8,0))-2*k(3,0)*a(6,0))-2*a(4,0)*k(7,0))-2*k(4,0)*a(7,0))-2*a(5,0)*k(8,0))-2*a(3,0)*k(6,0));
  groebnerMatrix(3,77) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(6,0)*m(6,0))+2*a(7,0)*m(7,0))+2*a(8,0)*m(8,0))-2*m(3,0)*a(6,0))-2*a(4,0)*m(7,0))-2*m(4,0)*a(7,0))-2*a(5,0)*m(8,0))-2*m(5,0)*a(8,0))-2*a(3,0)*m(6,0));
  groebnerMatrix(3,78) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(6,0)*n(6,0))+2*a(7,0)*n(7,0))+2*a(8,0)*n(8,0))-2*n(3,0)*a(6,0))-2*a(4,0)*n(7,0))-2*n(4,0)*a(7,0))-2*a(5,0)*n(8,0))-2*n(5,0)*a(8,0))-2*a(3,0)*n(6,0));
  groebnerMatrix(3,79) = (((((((((-c12w+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(6,0),2))+pow(a(7,0),2))+pow(a(8,0),2))-2*a(3,0)*a(6,0))-2*a(4,0)*a(7,0))+pow(a(3,0),2))-2*a(5,0)*a(8,0));
  groebnerMatrix(4,59) = ((((((((pow(p(4,0),2)+pow(p(5,0),2))+pow(p(9,0),2))+pow(p(10,0),2))+pow(p(11,0),2))+pow(p(3,0),2))-2*p(3,0)*p(9,0))-2*p(4,0)*p(10,0))-2*p(5,0)*p(11,0));
  groebnerMatrix(4,60) = (((((((((((2*l(4,0)*p(4,0)+2*l(5,0)*p(5,0))+2*l(9,0)*p(9,0))+2*l(10,0)*p(10,0))+2*l(11,0)*p(11,0))-2*l(3,0)*p(9,0))-2*p(3,0)*l(9,0))-2*l(4,0)*p(10,0))-2*p(4,0)*l(10,0))-2*l(5,0)*p(11,0))-2*p(5,0)*l(11,0))+2*l(3,0)*p(3,0));
  groebnerMatrix(4,61) = ((((((((pow(l(4,0),2)+pow(l(5,0),2))+pow(l(9,0),2))+pow(l(10,0),2))+pow(l(11,0),2))+pow(l(3,0),2))-2*l(3,0)*l(9,0))-2*l(4,0)*l(10,0))-2*l(5,0)*l(11,0));
  groebnerMatrix(4,62) = (((((((((((2*k(4,0)*p(4,0)+2*k(5,0)*p(5,0))+2*k(9,0)*p(9,0))+2*k(10,0)*p(10,0))+2*k(11,0)*p(11,0))-2*k(3,0)*p(9,0))-2*p(3,0)*k(9,0))-2*k(4,0)*p(10,0))-2*p(4,0)*k(10,0))-2*k(5,0)*p(11,0))-2*p(5,0)*k(11,0))+2*k(3,0)*p(3,0));
  groebnerMatrix(4,63) = (((((((((((2*k(4,0)*l(4,0)+2*k(5,0)*l(5,0))+2*k(9,0)*l(9,0))+2*k(10,0)*l(10,0))+2*k(11,0)*l(11,0))-2*k(3,0)*l(9,0))-2*l(3,0)*k(9,0))-2*k(4,0)*l(10,0))-2*l(4,0)*k(10,0))-2*k(5,0)*l(11,0))-2*l(5,0)*k(11,0))+2*k(3,0)*l(3,0));
  groebnerMatrix(4,64) = ((((((((pow(k(4,0),2)+pow(k(5,0),2))+pow(k(9,0),2))+pow(k(10,0),2))+pow(k(11,0),2))+pow(k(3,0),2))-2*k(3,0)*k(9,0))-2*k(4,0)*k(10,0))-2*k(5,0)*k(11,0));
  groebnerMatrix(4,65) = (((((((((((2*m(4,0)*p(4,0)+2*m(5,0)*p(5,0))+2*m(9,0)*p(9,0))+2*m(10,0)*p(10,0))+2*m(11,0)*p(11,0))-2*m(3,0)*p(9,0))-2*p(3,0)*m(9,0))-2*m(4,0)*p(10,0))-2*p(4,0)*m(10,0))-2*m(5,0)*p(11,0))-2*p(5,0)*m(11,0))+2*m(3,0)*p(3,0));
  groebnerMatrix(4,66) = (((((((((((2*m(4,0)*l(4,0)+2*m(5,0)*l(5,0))+2*m(9,0)*l(9,0))+2*m(10,0)*l(10,0))+2*m(11,0)*l(11,0))-2*m(3,0)*l(9,0))-2*l(3,0)*m(9,0))-2*m(4,0)*l(10,0))-2*l(4,0)*m(10,0))-2*m(5,0)*l(11,0))-2*l(5,0)*m(11,0))+2*m(3,0)*l(3,0));
  groebnerMatrix(4,67) = (((((((((((2*m(4,0)*k(4,0)+2*m(5,0)*k(5,0))+2*m(9,0)*k(9,0))+2*m(10,0)*k(10,0))+2*m(11,0)*k(11,0))-2*m(3,0)*k(9,0))-2*k(3,0)*m(9,0))-2*m(4,0)*k(10,0))-2*k(4,0)*m(10,0))-2*m(5,0)*k(11,0))-2*k(5,0)*m(11,0))+2*m(3,0)*k(3,0));
  groebnerMatrix(4,68) = ((((((((pow(m(4,0),2)+pow(m(5,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2))+pow(m(3,0),2))-2*m(3,0)*m(9,0))-2*m(4,0)*m(10,0))-2*m(5,0)*m(11,0));
  groebnerMatrix(4,69) = (((((((((((2*n(4,0)*p(4,0)+2*n(5,0)*p(5,0))+2*n(9,0)*p(9,0))+2*n(10,0)*p(10,0))+2*n(11,0)*p(11,0))-2*n(3,0)*p(9,0))-2*p(3,0)*n(9,0))-2*n(4,0)*p(10,0))-2*p(4,0)*n(10,0))-2*n(5,0)*p(11,0))-2*p(5,0)*n(11,0))+2*n(3,0)*p(3,0));
  groebnerMatrix(4,70) = (((((((((((2*n(4,0)*l(4,0)+2*n(5,0)*l(5,0))+2*n(9,0)*l(9,0))+2*n(10,0)*l(10,0))+2*n(11,0)*l(11,0))-2*n(3,0)*l(9,0))-2*l(3,0)*n(9,0))-2*n(4,0)*l(10,0))-2*l(4,0)*n(10,0))-2*n(5,0)*l(11,0))-2*l(5,0)*n(11,0))+2*n(3,0)*l(3,0));
  groebnerMatrix(4,71) = (((((((((((2*n(4,0)*k(4,0)+2*n(5,0)*k(5,0))+2*n(9,0)*k(9,0))+2*n(10,0)*k(10,0))+2*n(11,0)*k(11,0))-2*n(3,0)*k(9,0))-2*k(3,0)*n(9,0))-2*n(4,0)*k(10,0))-2*k(4,0)*n(10,0))-2*n(5,0)*k(11,0))-2*k(5,0)*n(11,0))+2*n(3,0)*k(3,0));
  groebnerMatrix(4,72) = (((((((((((2*n(4,0)*m(4,0)+2*n(5,0)*m(5,0))+2*n(9,0)*m(9,0))+2*n(10,0)*m(10,0))+2*n(11,0)*m(11,0))-2*n(3,0)*m(9,0))-2*m(3,0)*n(9,0))-2*n(4,0)*m(10,0))-2*m(4,0)*n(10,0))-2*n(5,0)*m(11,0))-2*m(5,0)*n(11,0))+2*n(3,0)*m(3,0));
  groebnerMatrix(4,73) = ((((((((pow(n(4,0),2)+pow(n(5,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2))+pow(n(3,0),2))-2*n(3,0)*n(9,0))-2*n(4,0)*n(10,0))-2*n(5,0)*n(11,0));
  groebnerMatrix(4,74) = (((((((((((2*a(3,0)*p(3,0)+2*a(4,0)*p(4,0))+2*a(5,0)*p(5,0))+2*a(9,0)*p(9,0))+2*a(10,0)*p(10,0))+2*a(11,0)*p(11,0))-2*a(3,0)*p(9,0))-2*p(3,0)*a(9,0))-2*a(4,0)*p(10,0))-2*p(4,0)*a(10,0))-2*a(5,0)*p(11,0))-2*p(5,0)*a(11,0));
  groebnerMatrix(4,75) = (((((((((((2*a(3,0)*l(3,0)+2*a(4,0)*l(4,0))+2*a(5,0)*l(5,0))+2*a(9,0)*l(9,0))+2*a(10,0)*l(10,0))+2*a(11,0)*l(11,0))-2*a(3,0)*l(9,0))-2*l(3,0)*a(9,0))-2*a(4,0)*l(10,0))-2*l(4,0)*a(10,0))-2*a(5,0)*l(11,0))-2*l(5,0)*a(11,0));
  groebnerMatrix(4,76) = (((((((((((2*a(3,0)*k(3,0)+2*a(4,0)*k(4,0))+2*a(5,0)*k(5,0))+2*a(9,0)*k(9,0))+2*a(10,0)*k(10,0))+2*a(11,0)*k(11,0))-2*a(3,0)*k(9,0))-2*k(3,0)*a(9,0))-2*a(4,0)*k(10,0))-2*k(4,0)*a(10,0))-2*a(5,0)*k(11,0))-2*k(5,0)*a(11,0));
  groebnerMatrix(4,77) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(9,0)*m(9,0))+2*a(10,0)*m(10,0))+2*a(11,0)*m(11,0))-2*a(3,0)*m(9,0))-2*m(3,0)*a(9,0))-2*a(4,0)*m(10,0))-2*m(4,0)*a(10,0))-2*a(5,0)*m(11,0))-2*m(5,0)*a(11,0));
  groebnerMatrix(4,78) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(9,0)*n(9,0))+2*a(10,0)*n(10,0))+2*a(11,0)*n(11,0))-2*a(3,0)*n(9,0))-2*n(3,0)*a(9,0))-2*a(4,0)*n(10,0))-2*n(4,0)*a(10,0))-2*a(5,0)*n(11,0))-2*n(5,0)*a(11,0));
  groebnerMatrix(4,79) = (((((((((-c13w+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(9,0),2))+pow(a(10,0),2))+pow(a(11,0),2))+pow(a(3,0),2))-2*a(3,0)*a(9,0))-2*a(4,0)*a(10,0))-2*a(5,0)*a(11,0));
  groebnerMatrix(5,59) = ((((((((pow(p(6,0),2)+pow(p(7,0),2))+pow(p(8,0),2))+pow(p(9,0),2))+pow(p(10,0),2))+pow(p(11,0),2))-2*p(8,0)*p(11,0))-2*p(6,0)*p(9,0))-2*p(7,0)*p(10,0));
  groebnerMatrix(5,60) = (((((((((((2*l(6,0)*p(6,0)+2*l(7,0)*p(7,0))+2*l(8,0)*p(8,0))+2*l(9,0)*p(9,0))+2*l(10,0)*p(10,0))+2*l(11,0)*p(11,0))-2*l(6,0)*p(9,0))-2*p(6,0)*l(9,0))-2*l(7,0)*p(10,0))-2*p(7,0)*l(10,0))-2*l(8,0)*p(11,0))-2*p(8,0)*l(11,0));
  groebnerMatrix(5,61) = ((((((((pow(l(6,0),2)+pow(l(7,0),2))+pow(l(8,0),2))+pow(l(9,0),2))+pow(l(10,0),2))+pow(l(11,0),2))-2*l(8,0)*l(11,0))-2*l(6,0)*l(9,0))-2*l(7,0)*l(10,0));
  groebnerMatrix(5,62) = (((((((((((2*k(6,0)*p(6,0)+2*k(7,0)*p(7,0))+2*k(8,0)*p(8,0))+2*k(9,0)*p(9,0))+2*k(10,0)*p(10,0))+2*k(11,0)*p(11,0))-2*k(7,0)*p(10,0))-2*k(6,0)*p(9,0))-2*p(6,0)*k(9,0))-2*p(7,0)*k(10,0))-2*k(8,0)*p(11,0))-2*p(8,0)*k(11,0));
  groebnerMatrix(5,63) = (((((((((((2*k(6,0)*l(6,0)+2*k(7,0)*l(7,0))+2*k(8,0)*l(8,0))+2*k(9,0)*l(9,0))+2*k(10,0)*l(10,0))+2*k(11,0)*l(11,0))-2*k(7,0)*l(10,0))-2*l(7,0)*k(10,0))-2*k(6,0)*l(9,0))-2*l(6,0)*k(9,0))-2*k(8,0)*l(11,0))-2*l(8,0)*k(11,0));
  groebnerMatrix(5,64) = ((((((((pow(k(6,0),2)+pow(k(7,0),2))+pow(k(8,0),2))+pow(k(9,0),2))+pow(k(10,0),2))+pow(k(11,0),2))-2*k(8,0)*k(11,0))-2*k(6,0)*k(9,0))-2*k(7,0)*k(10,0));
  groebnerMatrix(5,65) = (((((((((((2*m(6,0)*p(6,0)+2*m(7,0)*p(7,0))+2*m(8,0)*p(8,0))+2*m(9,0)*p(9,0))+2*m(10,0)*p(10,0))+2*m(11,0)*p(11,0))-2*m(6,0)*p(9,0))-2*p(6,0)*m(9,0))-2*m(7,0)*p(10,0))-2*p(7,0)*m(10,0))-2*m(8,0)*p(11,0))-2*p(8,0)*m(11,0));
  groebnerMatrix(5,66) = (((((((((((2*m(6,0)*l(6,0)+2*m(7,0)*l(7,0))+2*m(8,0)*l(8,0))+2*m(9,0)*l(9,0))+2*m(10,0)*l(10,0))+2*m(11,0)*l(11,0))-2*l(7,0)*m(10,0))-2*m(6,0)*l(9,0))-2*l(6,0)*m(9,0))-2*m(7,0)*l(10,0))-2*m(8,0)*l(11,0))-2*l(8,0)*m(11,0));
  groebnerMatrix(5,67) = (((((((((((2*m(6,0)*k(6,0)+2*m(7,0)*k(7,0))+2*m(8,0)*k(8,0))+2*m(9,0)*k(9,0))+2*m(10,0)*k(10,0))+2*m(11,0)*k(11,0))-2*k(7,0)*m(10,0))-2*m(6,0)*k(9,0))-2*k(6,0)*m(9,0))-2*m(7,0)*k(10,0))-2*m(8,0)*k(11,0))-2*k(8,0)*m(11,0));
  groebnerMatrix(5,68) = ((((((((pow(m(6,0),2)+pow(m(7,0),2))+pow(m(8,0),2))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2))-2*m(8,0)*m(11,0))-2*m(6,0)*m(9,0))-2*m(7,0)*m(10,0));
  groebnerMatrix(5,69) = (((((((((((2*n(6,0)*p(6,0)+2*n(7,0)*p(7,0))+2*n(8,0)*p(8,0))+2*n(9,0)*p(9,0))+2*n(10,0)*p(10,0))+2*n(11,0)*p(11,0))-2*n(6,0)*p(9,0))-2*p(6,0)*n(9,0))-2*n(7,0)*p(10,0))-2*p(7,0)*n(10,0))-2*n(8,0)*p(11,0))-2*p(8,0)*n(11,0));
  groebnerMatrix(5,70) = (((((((((((2*n(6,0)*l(6,0)+2*n(7,0)*l(7,0))+2*n(8,0)*l(8,0))+2*n(9,0)*l(9,0))+2*n(10,0)*l(10,0))+2*n(11,0)*l(11,0))-2*l(7,0)*n(10,0))-2*n(6,0)*l(9,0))-2*l(6,0)*n(9,0))-2*n(7,0)*l(10,0))-2*n(8,0)*l(11,0))-2*l(8,0)*n(11,0));
  groebnerMatrix(5,71) = (((((((((((2*n(6,0)*k(6,0)+2*n(7,0)*k(7,0))+2*n(8,0)*k(8,0))+2*n(9,0)*k(9,0))+2*n(10,0)*k(10,0))+2*n(11,0)*k(11,0))-2*k(7,0)*n(10,0))-2*n(6,0)*k(9,0))-2*k(6,0)*n(9,0))-2*n(7,0)*k(10,0))-2*n(8,0)*k(11,0))-2*k(8,0)*n(11,0));
  groebnerMatrix(5,72) = (((((((((((2*n(6,0)*m(6,0)+2*n(7,0)*m(7,0))+2*n(8,0)*m(8,0))+2*n(9,0)*m(9,0))+2*n(10,0)*m(10,0))+2*n(11,0)*m(11,0))-2*n(6,0)*m(9,0))-2*m(6,0)*n(9,0))-2*n(7,0)*m(10,0))-2*m(7,0)*n(10,0))-2*n(8,0)*m(11,0))-2*m(8,0)*n(11,0));
  groebnerMatrix(5,73) = ((((((((pow(n(6,0),2)+pow(n(7,0),2))+pow(n(8,0),2))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2))-2*n(8,0)*n(11,0))-2*n(6,0)*n(9,0))-2*n(7,0)*n(10,0));
  groebnerMatrix(5,74) = (((((((((((2*a(6,0)*p(6,0)+2*a(7,0)*p(7,0))+2*a(8,0)*p(8,0))+2*a(9,0)*p(9,0))+2*a(10,0)*p(10,0))+2*a(11,0)*p(11,0))-2*a(8,0)*p(11,0))-2*p(8,0)*a(11,0))-2*a(6,0)*p(9,0))-2*p(6,0)*a(9,0))-2*a(7,0)*p(10,0))-2*p(7,0)*a(10,0));
  groebnerMatrix(5,75) = (((((((((((2*a(6,0)*l(6,0)+2*a(7,0)*l(7,0))+2*a(8,0)*l(8,0))+2*a(9,0)*l(9,0))+2*a(10,0)*l(10,0))+2*a(11,0)*l(11,0))-2*a(8,0)*l(11,0))-2*l(8,0)*a(11,0))-2*a(6,0)*l(9,0))-2*l(6,0)*a(9,0))-2*a(7,0)*l(10,0))-2*l(7,0)*a(10,0));
  groebnerMatrix(5,76) = (((((((((((2*a(6,0)*k(6,0)+2*a(7,0)*k(7,0))+2*a(8,0)*k(8,0))+2*a(9,0)*k(9,0))+2*a(10,0)*k(10,0))+2*a(11,0)*k(11,0))-2*a(8,0)*k(11,0))-2*k(8,0)*a(11,0))-2*a(6,0)*k(9,0))-2*k(6,0)*a(9,0))-2*a(7,0)*k(10,0))-2*k(7,0)*a(10,0));
  groebnerMatrix(5,77) = (((((((((((2*a(6,0)*m(6,0)+2*a(7,0)*m(7,0))+2*a(8,0)*m(8,0))+2*a(9,0)*m(9,0))+2*a(10,0)*m(10,0))+2*a(11,0)*m(11,0))-2*a(8,0)*m(11,0))-2*m(8,0)*a(11,0))-2*a(6,0)*m(9,0))-2*m(6,0)*a(9,0))-2*a(7,0)*m(10,0))-2*m(7,0)*a(10,0));
  groebnerMatrix(5,78) = (((((((((((2*a(6,0)*n(6,0)+2*a(7,0)*n(7,0))+2*a(8,0)*n(8,0))+2*a(9,0)*n(9,0))+2*a(10,0)*n(10,0))+2*a(11,0)*n(11,0))-2*a(8,0)*n(11,0))-2*n(8,0)*a(11,0))-2*a(6,0)*n(9,0))-2*n(6,0)*a(9,0))-2*a(7,0)*n(10,0))-2*n(7,0)*a(10,0));
  groebnerMatrix(5,79) = (((((((((-c23w+pow(a(6,0),2))+pow(a(7,0),2))+pow(a(8,0),2))+pow(a(9,0),2))+pow(a(10,0),2))+pow(a(11,0),2))-2*a(6,0)*a(9,0))-2*a(7,0)*a(10,0))-2*a(8,0)*a(11,0));
}